

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegressionTree.cpp
# Opt level: O1

string * __thiscall
RegressionTree::genVarianceComputation_abi_cxx11_
          (string *__return_storage_ptr__,RegressionTree *this)

{
  var_bitset *this_00;
  var_bitset *this_01;
  Query *pQVar1;
  pointer ppAVar2;
  ulong *puVar3;
  Query *pQVar4;
  ulong *puVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  pointer pvVar9;
  bool bVar10;
  string *psVar11;
  char cVar12;
  bool bVar13;
  size_t sVar14;
  void *__s;
  long *plVar15;
  undefined8 *puVar16;
  Attribute *pAVar17;
  View *pVVar18;
  size_type *psVar19;
  ulong *puVar20;
  long *plVar21;
  ulong uVar22;
  ulong *puVar23;
  value_type_conflict2 *__val;
  ulong uVar24;
  char cVar25;
  undefined8 uVar26;
  pointer pQVar27;
  pointer pQVar28;
  ulong uVar29;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *pvVar30;
  ulong uVar31;
  string contVariance;
  string __str_26;
  string categVariance;
  string thresholdStruct;
  string functionIndex;
  string __str_28;
  string __str;
  string __str_4;
  string __str_5;
  string __str_6;
  string __str_1;
  string __str_2;
  string __str_3;
  string computeVariance;
  string numOfThresholds;
  string initVariance;
  string __str_22;
  string contFunctionIndex;
  string categFunctionIndex;
  string __str_8;
  string __str_12;
  string __str_10;
  string __str_13;
  string __str_16;
  string __str_15;
  string __str_17;
  string __str_9;
  string __str_11;
  string __str_14;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  variancePerView;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  functionPerView;
  vector<Query_*,_std::allocator<Query_*>_> complementQueryPerView;
  long *local_860;
  long local_858;
  long local_850;
  long lStack_848;
  ulong *local_840;
  long local_838;
  ulong local_830;
  long lStack_828;
  ulong *local_820;
  long local_818;
  ulong local_810;
  long lStack_808;
  ulong *local_800;
  long local_7f8;
  ulong local_7f0;
  long lStack_7e8;
  ulong *local_7e0;
  long local_7d8;
  ulong local_7d0;
  long lStack_7c8;
  ulong *local_7c0;
  long local_7b8;
  ulong local_7b0;
  long lStack_7a8;
  ulong *local_7a0;
  long local_798;
  ulong local_790;
  long lStack_788;
  ulong *local_780;
  long local_778;
  ulong local_770;
  long lStack_768;
  ulong *local_760;
  long local_758;
  ulong local_750;
  long lStack_748;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_740;
  ulong *local_720;
  long local_718;
  ulong local_710;
  long lStack_708;
  ulong *local_700;
  long local_6f8;
  ulong local_6f0;
  long lStack_6e8;
  ulong *local_6e0;
  long local_6d8;
  ulong local_6d0;
  long lStack_6c8;
  ulong *local_6c0;
  long local_6b8;
  ulong local_6b0;
  undefined8 uStack_6a8;
  ulong *local_6a0;
  long local_698;
  ulong local_690;
  long lStack_688;
  ulong *local_680;
  long local_678;
  ulong local_670;
  long lStack_668;
  ulong *local_660;
  long local_658;
  ulong local_650;
  long lStack_648;
  ulong *local_640;
  long local_638;
  ulong local_630;
  long lStack_628;
  ulong *local_620;
  long local_618;
  ulong local_610;
  long lStack_608;
  ulong *local_600;
  long local_5f8;
  ulong local_5f0;
  long lStack_5e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c0;
  ulong *local_5a0;
  long local_598;
  ulong local_590;
  long lStack_588;
  ulong *local_580;
  long local_578;
  ulong local_570;
  long lStack_568;
  ulong *local_560;
  long local_558;
  ulong local_550;
  long lStack_548;
  ulong *local_540;
  long local_538;
  ulong local_530;
  long lStack_528;
  ulong *local_520;
  long local_518;
  ulong local_510;
  long lStack_508;
  ulong *local_500;
  long local_4f8;
  ulong local_4f0;
  long lStack_4e8;
  ulong *local_4e0;
  long local_4d8;
  ulong local_4d0;
  long lStack_4c8;
  ulong *local_4c0;
  long local_4b8;
  ulong local_4b0;
  long lStack_4a8;
  ulong *local_4a0;
  long local_498;
  ulong local_490;
  long lStack_488;
  ulong *local_480;
  long local_478;
  ulong local_470;
  long lStack_468;
  ulong *local_460;
  long local_458;
  ulong local_450;
  long lStack_448;
  ulong *local_440;
  long local_438;
  ulong local_430;
  long lStack_428;
  ulong *local_420;
  long local_418;
  ulong local_410;
  long lStack_408;
  ulong *local_400;
  long local_3f8;
  ulong local_3f0;
  long lStack_3e8;
  ulong *local_3e0;
  long local_3d8;
  ulong local_3d0;
  long lStack_3c8;
  ulong *local_3c0;
  long local_3b8;
  ulong local_3b0;
  long lStack_3a8;
  ulong *local_3a0;
  long local_398;
  ulong local_390;
  long lStack_388;
  ulong *local_380;
  long local_378;
  ulong local_370;
  long lStack_368;
  ulong *local_360;
  long local_358;
  ulong local_350;
  undefined8 uStack_348;
  ulong *local_340;
  long local_338;
  ulong local_330;
  undefined8 uStack_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  ulong *local_300;
  long local_2f8;
  ulong local_2f0;
  long lStack_2e8;
  ulong *local_2e0;
  long local_2d8;
  ulong local_2d0;
  long lStack_2c8;
  ulong *local_2c0;
  uint local_2b8;
  undefined4 uStack_2b4;
  ulong local_2b0 [2];
  ulong *local_2a0;
  uint local_298;
  undefined4 uStack_294;
  ulong local_290 [2];
  ulong *local_280;
  ulong *local_278;
  uint local_270;
  undefined4 uStack_26c;
  ulong local_268 [2];
  ulong *local_258;
  long local_250;
  ulong local_248;
  long lStack_240;
  ulong *local_238;
  long local_230;
  ulong local_228;
  long lStack_220;
  ulong *local_218;
  uint local_210;
  undefined4 uStack_20c;
  ulong local_208 [2];
  ulong *local_1f8;
  long local_1f0;
  ulong local_1e8 [2];
  ulong *local_1d8;
  long local_1d0;
  ulong local_1c8 [2];
  ulong *local_1b8;
  long local_1b0;
  ulong local_1a8 [2];
  ulong *local_198;
  long local_190;
  ulong local_188 [2];
  ulong *local_178;
  long local_170;
  ulong local_168 [2];
  ulong *local_158;
  long local_150;
  ulong local_148 [2];
  ulong *local_138;
  long local_130;
  ulong local_128 [2];
  RegressionTree *local_118;
  ulong *local_110;
  long local_108;
  ulong local_100 [2];
  long local_f0;
  ulong *local_e8;
  pointer local_e0;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_d8;
  ulong *local_c0;
  long local_b8;
  ulong local_b0 [2];
  ulong *local_a0;
  long local_98;
  ulong local_90 [2];
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_80;
  string *local_68;
  ulong *local_60;
  long local_58;
  pointer local_50;
  vector<Query_*,_std::allocator<Query_*>_> local_48;
  
  sVar14 = QueryCompiler::numberOfViews
                     ((this->_compiler).
                      super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::vector(&local_d8,sVar14,(allocator_type *)&local_5e0);
  local_118 = this;
  sVar14 = QueryCompiler::numberOfViews
                     ((this->_compiler).
                      super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::vector(&local_80,sVar14,(allocator_type *)&local_5e0);
  __s = operator_new(800);
  memset(__s,0,800);
  sVar14 = QueryCompiler::numberOfViews
                     ((local_118->_compiler).
                      super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  local_68 = __return_storage_ptr__;
  std::vector<Query_*,_std::allocator<Query_*>_>::vector
            (&local_48,sVar14,(allocator_type *)&local_5e0);
  local_50 = queryToThreshold.
             super__Vector_base<QueryThresholdPair,_std::allocator<QueryThresholdPair>_>._M_impl.
             super__Vector_impl_data._M_finish;
  pQVar27 = queryToThreshold.
            super__Vector_base<QueryThresholdPair,_std::allocator<QueryThresholdPair>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (queryToThreshold.super__Vector_base<QueryThresholdPair,_std::allocator<QueryThresholdPair>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      queryToThreshold.super__Vector_base<QueryThresholdPair,_std::allocator<QueryThresholdPair>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      pQVar1 = pQVar27->query;
      ppAVar2 = (pQVar1->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      puVar20 = *(ulong **)
                 &((*ppAVar2)->_incoming).
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl;
      puVar23 = *(ulong **)
                 &(ppAVar2[1]->_incoming).
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl;
      puVar3 = *(ulong **)
                &(ppAVar2[2]->_incoming).
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ._M_impl;
      local_280 = puVar20;
      local_e0 = pQVar27;
      if (((local_118->_categoricalFeatures).super__Base_bitset<2UL>._M_w[pQVar27->varID >> 6] >>
           (pQVar27->varID & 0x3f) & 1) == 0) {
        puVar5 = *(ulong **)
                  &(ppAVar2[3]->_incoming).
                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   ._M_impl;
        uVar24 = *puVar20;
        if ((((uVar24 != *puVar23) || (uVar24 != *puVar3)) || (*puVar5 != uVar24)) ||
           ((**(ulong **)
               &(ppAVar2[4]->_incoming).
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl != uVar24 ||
            (**(ulong **)
               &(ppAVar2[5]->_incoming).
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl != uVar24)))) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"THERE IS AN ERROR IN genVarianceComputation",0x2b);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
          std::ostream::put(-0x10);
          std::ostream::flush();
        }
        uVar24 = *puVar20;
        cVar25 = '\x01';
        if (9 < uVar24) {
          uVar29 = uVar24;
          cVar12 = '\x04';
          do {
            cVar25 = cVar12;
            if (uVar29 < 100) {
              cVar25 = cVar25 + -2;
              goto LAB_0016cfdd;
            }
            if (uVar29 < 1000) {
              cVar25 = cVar25 + -1;
              goto LAB_0016cfdd;
            }
            if (uVar29 < 10000) goto LAB_0016cfdd;
            bVar13 = 99999 < uVar29;
            uVar29 = uVar29 / 10000;
            cVar12 = cVar25 + '\x04';
          } while (bVar13);
          cVar25 = cVar25 + '\x01';
        }
LAB_0016cfdd:
        ppAVar2 = (pQVar1->_aggregates).
                  super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_e8 = *(ulong **)
                    &((*ppAVar2)->_incoming).
                     super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     ._M_impl;
        lVar6 = *(long *)&(ppAVar2[1]->_incoming).
                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl;
        lVar7 = *(long *)&(ppAVar2[2]->_incoming).
                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl;
        local_f0 = *(long *)&(ppAVar2[3]->_incoming).
                             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                             ._M_impl;
        lVar8 = *(long *)&(ppAVar2[4]->_incoming).
                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl;
        local_58 = *(long *)&(ppAVar2[5]->_incoming).
                             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                             ._M_impl;
        local_860 = &local_850;
        local_60 = puVar5;
        std::__cxx11::string::_M_construct((ulong)&local_860,cVar25);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_860,(uint)local_858,uVar24);
        plVar15 = (long *)std::__cxx11::string::replace((ulong)&local_860,0,(char *)0x0,0x2a8219);
        psVar19 = (size_type *)(plVar15 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar15 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar19) {
          local_5c0.field_2._M_allocated_capacity = *psVar19;
          local_5c0.field_2._8_8_ = plVar15[3];
          local_5c0._M_dataplus._M_p = (pointer)&local_5c0.field_2;
        }
        else {
          local_5c0.field_2._M_allocated_capacity = *psVar19;
          local_5c0._M_dataplus._M_p = (pointer)*plVar15;
        }
        local_5c0._M_string_length = plVar15[1];
        *plVar15 = (long)psVar19;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_5c0);
        puVar20 = local_280;
        psVar19 = puVar16 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar16 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar19) {
          local_5e0.field_2._M_allocated_capacity = *psVar19;
          local_5e0.field_2._8_8_ = puVar16[3];
          local_5e0._M_dataplus._M_p = (pointer)&local_5e0.field_2;
        }
        else {
          local_5e0.field_2._M_allocated_capacity = *psVar19;
          local_5e0._M_dataplus._M_p = (pointer)*puVar16;
        }
        local_5e0._M_string_length = puVar16[1];
        *puVar16 = psVar19;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
          operator_delete(local_5c0._M_dataplus._M_p);
        }
        if (local_860 != &local_850) {
          operator_delete(local_860);
        }
        pvVar30 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                  (local_d8.
                   super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + *puVar20);
        std::operator+(&local_320,"((",&local_5e0);
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_320);
        local_640 = &local_630;
        puVar20 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar20) {
          local_630 = *puVar20;
          lStack_628 = plVar15[3];
        }
        else {
          local_630 = *puVar20;
          local_640 = (ulong *)*plVar15;
        }
        local_638 = plVar15[1];
        *plVar15 = (long)puVar20;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        uVar24 = local_e8[1];
        cVar25 = '\x01';
        if (9 < uVar24) {
          uVar29 = uVar24;
          cVar12 = '\x04';
          do {
            cVar25 = cVar12;
            if (uVar29 < 100) {
              cVar25 = cVar25 + -2;
              goto LAB_0016d257;
            }
            if (uVar29 < 1000) {
              cVar25 = cVar25 + -1;
              goto LAB_0016d257;
            }
            if (uVar29 < 10000) goto LAB_0016d257;
            bVar13 = 99999 < uVar29;
            uVar29 = uVar29 / 10000;
            cVar12 = cVar25 + '\x04';
          } while (bVar13);
          cVar25 = cVar25 + '\x01';
        }
LAB_0016d257:
        local_3c0 = &local_3b0;
        std::__cxx11::string::_M_construct((ulong)&local_3c0,cVar25);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_3c0,(uint)local_3b8,uVar24);
        uVar24 = 0xf;
        if (local_640 != &local_630) {
          uVar24 = local_630;
        }
        if (uVar24 < (ulong)(local_3b8 + local_638)) {
          uVar24 = 0xf;
          if (local_3c0 != &local_3b0) {
            uVar24 = local_3b0;
          }
          if (uVar24 < (ulong)(local_3b8 + local_638)) goto LAB_0016d2ee;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_3c0,0,(char *)0x0,(ulong)local_640);
        }
        else {
LAB_0016d2ee:
          puVar16 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_640,(ulong)local_3c0);
        }
        local_620 = &local_610;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_610 = *puVar20;
          lStack_608 = puVar16[3];
        }
        else {
          local_610 = *puVar20;
          local_620 = (ulong *)*puVar16;
        }
        local_618 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)puVar20 = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_620);
        local_4a0 = &local_490;
        puVar20 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar20) {
          local_490 = *puVar20;
          lStack_488 = plVar15[3];
        }
        else {
          local_490 = *puVar20;
          local_4a0 = (ulong *)*plVar15;
        }
        local_498 = plVar15[1];
        *plVar15 = (long)puVar20;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_4a0,(ulong)local_5e0._M_dataplus._M_p);
        local_4c0 = &local_4b0;
        puVar20 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar20) {
          local_4b0 = *puVar20;
          lStack_4a8 = plVar15[3];
        }
        else {
          local_4b0 = *puVar20;
          local_4c0 = (ulong *)*plVar15;
        }
        local_4b8 = plVar15[1];
        *plVar15 = (long)puVar20;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_4c0);
        local_500 = &local_4f0;
        puVar20 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar20) {
          local_4f0 = *puVar20;
          lStack_4e8 = plVar15[3];
        }
        else {
          local_4f0 = *puVar20;
          local_500 = (ulong *)*plVar15;
        }
        local_4f8 = plVar15[1];
        *plVar15 = (long)puVar20;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        uVar24 = *(ulong *)(local_f0 + 8);
        cVar25 = '\x01';
        if (9 < uVar24) {
          uVar29 = uVar24;
          cVar12 = '\x04';
          do {
            cVar25 = cVar12;
            if (uVar29 < 100) {
              cVar25 = cVar25 + -2;
              goto LAB_0016d517;
            }
            if (uVar29 < 1000) {
              cVar25 = cVar25 + -1;
              goto LAB_0016d517;
            }
            if (uVar29 < 10000) goto LAB_0016d517;
            bVar13 = 99999 < uVar29;
            uVar29 = uVar29 / 10000;
            cVar12 = cVar25 + '\x04';
          } while (bVar13);
          cVar25 = cVar25 + '\x01';
        }
LAB_0016d517:
        local_258 = &local_248;
        std::__cxx11::string::_M_construct((ulong)&local_258,cVar25);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_258,(uint)local_250,uVar24);
        uVar24 = 0xf;
        if (local_500 != &local_4f0) {
          uVar24 = local_4f0;
        }
        if (uVar24 < (ulong)(local_250 + local_4f8)) {
          uVar24 = 0xf;
          if (local_258 != &local_248) {
            uVar24 = local_248;
          }
          if (uVar24 < (ulong)(local_250 + local_4f8)) goto LAB_0016d5ae;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_258,0,(char *)0x0,(ulong)local_500);
        }
        else {
LAB_0016d5ae:
          puVar16 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_500,(ulong)local_258);
        }
        local_6c0 = &local_6b0;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_6b0 = *puVar20;
          uStack_6a8 = puVar16[3];
        }
        else {
          local_6b0 = *puVar20;
          local_6c0 = (ulong *)*puVar16;
        }
        local_6b8 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)puVar20 = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_6c0);
        local_360 = &local_350;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_350 = *puVar20;
          uStack_348 = puVar16[3];
        }
        else {
          local_350 = *puVar20;
          local_360 = (ulong *)*puVar16;
        }
        local_358 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_360,(ulong)local_5e0._M_dataplus._M_p);
        local_480 = &local_470;
        puVar20 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar20) {
          local_470 = *puVar20;
          lStack_468 = plVar15[3];
        }
        else {
          local_470 = *puVar20;
          local_480 = (ulong *)*plVar15;
        }
        local_478 = plVar15[1];
        *plVar15 = (long)puVar20;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_480);
        local_460 = &local_450;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_450 = *puVar20;
          lStack_448 = puVar16[3];
        }
        else {
          local_450 = *puVar20;
          local_460 = (ulong *)*puVar16;
        }
        local_458 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        uVar24 = *(ulong *)(lVar7 + 8);
        cVar25 = '\x01';
        if (9 < uVar24) {
          uVar29 = uVar24;
          cVar12 = '\x04';
          do {
            cVar25 = cVar12;
            if (uVar29 < 100) {
              cVar25 = cVar25 + -2;
              goto LAB_0016d7d7;
            }
            if (uVar29 < 1000) {
              cVar25 = cVar25 + -1;
              goto LAB_0016d7d7;
            }
            if (uVar29 < 10000) goto LAB_0016d7d7;
            bVar13 = 99999 < uVar29;
            uVar29 = uVar29 / 10000;
            cVar12 = cVar25 + '\x04';
          } while (bVar13);
          cVar25 = cVar25 + '\x01';
        }
LAB_0016d7d7:
        local_300 = &local_2f0;
        std::__cxx11::string::_M_construct((ulong)&local_300,cVar25);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_300,(uint)local_2f8,uVar24);
        uVar24 = 0xf;
        if (local_460 != &local_450) {
          uVar24 = local_450;
        }
        if (uVar24 < (ulong)(local_2f8 + local_458)) {
          uVar24 = 0xf;
          if (local_300 != &local_2f0) {
            uVar24 = local_2f0;
          }
          if (uVar24 < (ulong)(local_2f8 + local_458)) goto LAB_0016d86e;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_300,0,(char *)0x0,(ulong)local_460);
        }
        else {
LAB_0016d86e:
          puVar16 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_460,(ulong)local_300);
        }
        local_3a0 = &local_390;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_390 = *puVar20;
          lStack_388 = puVar16[3];
        }
        else {
          local_390 = *puVar20;
          local_3a0 = (ulong *)*puVar16;
        }
        local_398 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)puVar20 = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_3a0);
        local_400 = &local_3f0;
        puVar20 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar20) {
          local_3f0 = *puVar20;
          lStack_3e8 = plVar15[3];
        }
        else {
          local_3f0 = *puVar20;
          local_400 = (ulong *)*plVar15;
        }
        local_3f8 = plVar15[1];
        *plVar15 = (long)puVar20;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_400,(ulong)local_5e0._M_dataplus._M_p);
        local_3e0 = &local_3d0;
        puVar20 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar20) {
          local_3d0 = *puVar20;
          lStack_3c8 = plVar15[3];
        }
        else {
          local_3d0 = *puVar20;
          local_3e0 = (ulong *)*plVar15;
        }
        local_3d8 = plVar15[1];
        *plVar15 = (long)puVar20;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_3e0);
        local_380 = &local_370;
        puVar20 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar20) {
          local_370 = *puVar20;
          lStack_368 = plVar15[3];
        }
        else {
          local_370 = *puVar20;
          local_380 = (ulong *)*plVar15;
        }
        local_378 = plVar15[1];
        *plVar15 = (long)puVar20;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        uVar24 = *(ulong *)(lVar6 + 8);
        cVar25 = '\x01';
        if (9 < uVar24) {
          uVar29 = uVar24;
          cVar12 = '\x04';
          do {
            cVar25 = cVar12;
            if (uVar29 < 100) {
              cVar25 = cVar25 + -2;
              goto LAB_0016da8f;
            }
            if (uVar29 < 1000) {
              cVar25 = cVar25 + -1;
              goto LAB_0016da8f;
            }
            if (uVar29 < 10000) goto LAB_0016da8f;
            bVar13 = 99999 < uVar29;
            uVar29 = uVar29 / 10000;
            cVar12 = cVar25 + '\x04';
          } while (bVar13);
          cVar25 = cVar25 + '\x01';
        }
LAB_0016da8f:
        local_238 = &local_228;
        std::__cxx11::string::_M_construct((ulong)&local_238,cVar25);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_238,(uint)local_230,uVar24);
        uVar24 = 0xf;
        if (local_380 != &local_370) {
          uVar24 = local_370;
        }
        if (uVar24 < (ulong)(local_230 + local_378)) {
          uVar24 = 0xf;
          if (local_238 != &local_228) {
            uVar24 = local_228;
          }
          if (uVar24 < (ulong)(local_230 + local_378)) goto LAB_0016db26;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_238,0,(char *)0x0,(ulong)local_380);
        }
        else {
LAB_0016db26:
          puVar16 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_380,(ulong)local_238);
        }
        local_560 = &local_550;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_550 = *puVar20;
          lStack_548 = puVar16[3];
        }
        else {
          local_550 = *puVar20;
          local_560 = (ulong *)*puVar16;
        }
        local_558 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)puVar20 = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_560);
        local_4e0 = &local_4d0;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_4d0 = *puVar20;
          lStack_4c8 = puVar16[3];
        }
        else {
          local_4d0 = *puVar20;
          local_4e0 = (ulong *)*puVar16;
        }
        local_4d8 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_4e0,(ulong)local_5e0._M_dataplus._M_p);
        local_440 = &local_430;
        puVar20 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar20) {
          local_430 = *puVar20;
          lStack_428 = plVar15[3];
        }
        else {
          local_430 = *puVar20;
          local_440 = (ulong *)*plVar15;
        }
        local_438 = plVar15[1];
        *plVar15 = (long)puVar20;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_440);
        local_5a0 = &local_590;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_590 = *puVar20;
          lStack_588 = puVar16[3];
        }
        else {
          local_590 = *puVar20;
          local_5a0 = (ulong *)*puVar16;
        }
        local_598 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        uVar24 = *(ulong *)(lVar6 + 8);
        cVar25 = '\x01';
        if (9 < uVar24) {
          uVar29 = uVar24;
          cVar12 = '\x04';
          do {
            cVar25 = cVar12;
            if (uVar29 < 100) {
              cVar25 = cVar25 + -2;
              goto LAB_0016dd57;
            }
            if (uVar29 < 1000) {
              cVar25 = cVar25 + -1;
              goto LAB_0016dd57;
            }
            if (uVar29 < 10000) goto LAB_0016dd57;
            bVar13 = 99999 < uVar29;
            uVar29 = uVar29 / 10000;
            cVar12 = cVar25 + '\x04';
          } while (bVar13);
          cVar25 = cVar25 + '\x01';
        }
LAB_0016dd57:
        local_340 = &local_330;
        std::__cxx11::string::_M_construct((ulong)&local_340,cVar25);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_340,(uint)local_338,uVar24);
        uVar24 = 0xf;
        if (local_5a0 != &local_590) {
          uVar24 = local_590;
        }
        if (uVar24 < (ulong)(local_338 + local_598)) {
          uVar24 = 0xf;
          if (local_340 != &local_330) {
            uVar24 = local_330;
          }
          if (uVar24 < (ulong)(local_338 + local_598)) goto LAB_0016ddee;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_340,0,(char *)0x0,(ulong)local_5a0);
        }
        else {
LAB_0016ddee:
          puVar16 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_5a0,(ulong)local_340);
        }
        local_420 = &local_410;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_410 = *puVar20;
          lStack_408 = puVar16[3];
        }
        else {
          local_410 = *puVar20;
          local_420 = (ulong *)*puVar16;
        }
        local_418 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)puVar20 = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_420);
        local_580 = &local_570;
        puVar20 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar20) {
          local_570 = *puVar20;
          lStack_568 = plVar15[3];
        }
        else {
          local_570 = *puVar20;
          local_580 = (ulong *)*plVar15;
        }
        local_578 = plVar15[1];
        *plVar15 = (long)puVar20;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_580,(ulong)local_5e0._M_dataplus._M_p);
        local_660 = &local_650;
        puVar20 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar20) {
          local_650 = *puVar20;
          lStack_648 = plVar15[3];
        }
        else {
          local_650 = *puVar20;
          local_660 = (ulong *)*plVar15;
        }
        local_658 = plVar15[1];
        *plVar15 = (long)puVar20;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_660);
        local_680 = &local_670;
        puVar20 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar20) {
          local_670 = *puVar20;
          lStack_668 = plVar15[3];
        }
        else {
          local_670 = *puVar20;
          local_680 = (ulong *)*plVar15;
        }
        local_678 = plVar15[1];
        *plVar15 = (long)puVar20;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        uVar24 = local_e8[1];
        cVar25 = '\x01';
        if (9 < uVar24) {
          uVar29 = uVar24;
          cVar12 = '\x04';
          do {
            cVar25 = cVar12;
            if (uVar29 < 100) {
              cVar25 = cVar25 + -2;
              goto LAB_0016e017;
            }
            if (uVar29 < 1000) {
              cVar25 = cVar25 + -1;
              goto LAB_0016e017;
            }
            if (uVar29 < 10000) goto LAB_0016e017;
            bVar13 = 99999 < uVar29;
            uVar29 = uVar29 / 10000;
            cVar12 = cVar25 + '\x04';
          } while (bVar13);
          cVar25 = cVar25 + '\x01';
        }
LAB_0016e017:
        local_2e0 = &local_2d0;
        std::__cxx11::string::_M_construct((ulong)&local_2e0,cVar25);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_2e0,(uint)local_2d8,uVar24);
        uVar24 = 0xf;
        if (local_680 != &local_670) {
          uVar24 = local_670;
        }
        if (uVar24 < (ulong)(local_2d8 + local_678)) {
          uVar24 = 0xf;
          if (local_2e0 != &local_2d0) {
            uVar24 = local_2d0;
          }
          if (uVar24 < (ulong)(local_2d8 + local_678)) goto LAB_0016e0ae;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_2e0,0,(char *)0x0,(ulong)local_680);
        }
        else {
LAB_0016e0ae:
          puVar16 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_680,(ulong)local_2e0);
        }
        local_6a0 = &local_690;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_690 = *puVar20;
          lStack_688 = puVar16[3];
        }
        else {
          local_690 = *puVar20;
          local_6a0 = (ulong *)*puVar16;
        }
        local_698 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)puVar20 = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_6a0);
        local_740._M_dataplus._M_p = (pointer)&local_740.field_2;
        puVar20 = (ulong *)(plVar15 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar15 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar20) {
          local_740.field_2._M_allocated_capacity = *puVar20;
          local_740.field_2._8_8_ = plVar15[3];
        }
        else {
          local_740.field_2._M_allocated_capacity = *puVar20;
          local_740._M_dataplus._M_p = (pointer)*plVar15;
        }
        local_740._M_string_length = plVar15[1];
        *plVar15 = (long)puVar20;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_740,(ulong)local_5e0._M_dataplus._M_p);
        local_6e0 = &local_6d0;
        puVar20 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar20) {
          local_6d0 = *puVar20;
          lStack_6c8 = plVar15[3];
        }
        else {
          local_6d0 = *puVar20;
          local_6e0 = (ulong *)*plVar15;
        }
        local_6d8 = plVar15[1];
        *plVar15 = (long)puVar20;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_6e0);
        local_700 = &local_6f0;
        puVar20 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar20) {
          local_6f0 = *puVar20;
          lStack_6e8 = plVar15[3];
        }
        else {
          local_6f0 = *puVar20;
          local_700 = (ulong *)*plVar15;
        }
        local_6f8 = plVar15[1];
        *plVar15 = (long)puVar20;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        uVar24 = *(ulong *)(local_58 + 8);
        cVar25 = '\x01';
        if (9 < uVar24) {
          uVar29 = uVar24;
          cVar12 = '\x04';
          do {
            cVar25 = cVar12;
            if (uVar29 < 100) {
              cVar25 = cVar25 + -2;
              goto LAB_0016e2d7;
            }
            if (uVar29 < 1000) {
              cVar25 = cVar25 + -1;
              goto LAB_0016e2d7;
            }
            if (uVar29 < 10000) goto LAB_0016e2d7;
            bVar13 = 99999 < uVar29;
            uVar29 = uVar29 / 10000;
            cVar12 = cVar25 + '\x04';
          } while (bVar13);
          cVar25 = cVar25 + '\x01';
        }
LAB_0016e2d7:
        local_218 = local_208;
        std::__cxx11::string::_M_construct((ulong)&local_218,cVar25);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_218,local_210,uVar24);
        uVar24 = 0xf;
        if (local_700 != &local_6f0) {
          uVar24 = local_6f0;
        }
        uVar29 = CONCAT44(uStack_20c,local_210) + local_6f8;
        if (uVar24 < uVar29) {
          uVar24 = 0xf;
          if (local_218 != local_208) {
            uVar24 = local_208[0];
          }
          if (uVar24 < uVar29) goto LAB_0016e36e;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_218,0,(char *)0x0,(ulong)local_700);
        }
        else {
LAB_0016e36e:
          puVar16 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_700,(ulong)local_218);
        }
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_710 = *puVar20;
          lStack_708 = puVar16[3];
          local_720 = &local_710;
        }
        else {
          local_710 = *puVar20;
          local_720 = (ulong *)*puVar16;
        }
        local_718 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)puVar20 = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_720);
        local_760 = &local_750;
        puVar20 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar20) {
          local_750 = *puVar20;
          lStack_748 = plVar15[3];
        }
        else {
          local_750 = *puVar20;
          local_760 = (ulong *)*plVar15;
        }
        local_758 = plVar15[1];
        *plVar15 = (long)puVar20;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_760,(ulong)local_5e0._M_dataplus._M_p);
        local_800 = &local_7f0;
        puVar20 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar20) {
          local_7f0 = *puVar20;
          lStack_7e8 = plVar15[3];
        }
        else {
          local_7f0 = *puVar20;
          local_800 = (ulong *)*plVar15;
        }
        local_7f8 = plVar15[1];
        *plVar15 = (long)puVar20;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_800);
        puVar20 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar20) {
          local_7b0 = *puVar20;
          lStack_7a8 = plVar15[3];
          local_7c0 = &local_7b0;
        }
        else {
          local_7b0 = *puVar20;
          local_7c0 = (ulong *)*plVar15;
        }
        local_7b8 = plVar15[1];
        *plVar15 = (long)puVar20;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        uVar24 = *(ulong *)(lVar8 + 8);
        cVar25 = '\x01';
        if (9 < uVar24) {
          uVar29 = uVar24;
          cVar12 = '\x04';
          do {
            cVar25 = cVar12;
            if (uVar29 < 100) {
              cVar25 = cVar25 + -2;
              goto LAB_0016e56a;
            }
            if (uVar29 < 1000) {
              cVar25 = cVar25 + -1;
              goto LAB_0016e56a;
            }
            if (uVar29 < 10000) goto LAB_0016e56a;
            bVar13 = 99999 < uVar29;
            uVar29 = uVar29 / 10000;
            cVar12 = cVar25 + '\x04';
          } while (bVar13);
          cVar25 = cVar25 + '\x01';
        }
LAB_0016e56a:
        local_2a0 = local_290;
        std::__cxx11::string::_M_construct((ulong)&local_2a0,cVar25);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_2a0,local_298,uVar24);
        uVar24 = 0xf;
        if (local_7c0 != &local_7b0) {
          uVar24 = local_7b0;
        }
        uVar29 = CONCAT44(uStack_294,local_298) + local_7b8;
        if (uVar24 < uVar29) {
          uVar24 = 0xf;
          if (local_2a0 != local_290) {
            uVar24 = local_290[0];
          }
          if (uVar24 < uVar29) goto LAB_0016e5fe;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_2a0,0,(char *)0x0,(ulong)local_7c0);
        }
        else {
LAB_0016e5fe:
          puVar16 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_7c0,(ulong)local_2a0);
        }
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_810 = *puVar20;
          lStack_808 = puVar16[3];
          local_820 = &local_810;
        }
        else {
          local_810 = *puVar20;
          local_820 = (ulong *)*puVar16;
        }
        local_818 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)puVar20 = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_820);
        local_840 = &local_830;
        puVar20 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar20) {
          local_830 = *puVar20;
          lStack_828 = plVar15[3];
        }
        else {
          local_830 = *puVar20;
          local_840 = (ulong *)*plVar15;
        }
        local_838 = plVar15[1];
        *plVar15 = (long)puVar20;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_840,(ulong)local_5e0._M_dataplus._M_p);
        puVar20 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar20) {
          local_790 = *puVar20;
          lStack_788 = plVar15[3];
          local_7a0 = &local_790;
        }
        else {
          local_790 = *puVar20;
          local_7a0 = (ulong *)*plVar15;
        }
        local_798 = plVar15[1];
        *plVar15 = (long)puVar20;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_7a0);
        puVar20 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar20) {
          local_770 = *puVar20;
          lStack_768 = plVar15[3];
          local_780 = &local_770;
        }
        else {
          local_770 = *puVar20;
          local_780 = (ulong *)*plVar15;
        }
        local_778 = plVar15[1];
        *plVar15 = (long)puVar20;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        uVar24 = *(ulong *)(lVar8 + 8);
        cVar25 = '\x01';
        if (9 < uVar24) {
          uVar29 = uVar24;
          cVar12 = '\x04';
          do {
            cVar25 = cVar12;
            if (uVar29 < 100) {
              cVar25 = cVar25 + -2;
              goto LAB_0016e7f7;
            }
            if (uVar29 < 1000) {
              cVar25 = cVar25 + -1;
              goto LAB_0016e7f7;
            }
            if (uVar29 < 10000) goto LAB_0016e7f7;
            bVar13 = 99999 < uVar29;
            uVar29 = uVar29 / 10000;
            cVar12 = cVar25 + '\x04';
          } while (bVar13);
          cVar25 = cVar25 + '\x01';
        }
LAB_0016e7f7:
        local_2c0 = local_2b0;
        std::__cxx11::string::_M_construct((ulong)&local_2c0,cVar25);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_2c0,local_2b8,uVar24);
        uVar24 = 0xf;
        if (local_780 != &local_770) {
          uVar24 = local_770;
        }
        uVar29 = CONCAT44(uStack_2b4,local_2b8) + local_778;
        if (uVar24 < uVar29) {
          uVar24 = 0xf;
          if (local_2c0 != local_2b0) {
            uVar24 = local_2b0[0];
          }
          if (uVar24 < uVar29) goto LAB_0016e88e;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_2c0,0,(char *)0x0,(ulong)local_780);
        }
        else {
LAB_0016e88e:
          puVar16 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_780,(ulong)local_2c0);
        }
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_5f0 = *puVar20;
          lStack_5e8 = puVar16[3];
          local_600 = &local_5f0;
        }
        else {
          local_5f0 = *puVar20;
          local_600 = (ulong *)*puVar16;
        }
        local_5f8 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)puVar20 = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_600);
        puVar20 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar20) {
          local_510 = *puVar20;
          lStack_508 = plVar15[3];
          local_520 = &local_510;
        }
        else {
          local_510 = *puVar20;
          local_520 = (ulong *)*plVar15;
        }
        local_518 = plVar15[1];
        *plVar15 = (long)puVar20;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_520,(ulong)local_5e0._M_dataplus._M_p);
        puVar20 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar20) {
          local_530 = *puVar20;
          lStack_528 = plVar15[3];
          local_540 = &local_530;
        }
        else {
          local_530 = *puVar20;
          local_540 = (ulong *)*plVar15;
        }
        local_538 = plVar15[1];
        *plVar15 = (long)puVar20;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_540);
        puVar20 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar20) {
          local_7d0 = *puVar20;
          lStack_7c8 = plVar15[3];
          local_7e0 = &local_7d0;
        }
        else {
          local_7d0 = *puVar20;
          local_7e0 = (ulong *)*plVar15;
        }
        local_7d8 = plVar15[1];
        *plVar15 = (long)puVar20;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        uVar24 = *(ulong *)(local_f0 + 8);
        cVar25 = '\x01';
        if (9 < uVar24) {
          uVar29 = uVar24;
          cVar12 = '\x04';
          do {
            cVar25 = cVar12;
            if (uVar29 < 100) {
              cVar25 = cVar25 + -2;
              goto LAB_0016eaaf;
            }
            if (uVar29 < 1000) {
              cVar25 = cVar25 + -1;
              goto LAB_0016eaaf;
            }
            if (uVar29 < 10000) goto LAB_0016eaaf;
            bVar13 = 99999 < uVar29;
            uVar29 = uVar29 / 10000;
            cVar12 = cVar25 + '\x04';
          } while (bVar13);
          cVar25 = cVar25 + '\x01';
        }
LAB_0016eaaf:
        local_278 = local_268;
        std::__cxx11::string::_M_construct((ulong)&local_278,cVar25);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_278,local_270,uVar24);
        uVar24 = 0xf;
        if (local_7e0 != &local_7d0) {
          uVar24 = local_7d0;
        }
        uVar29 = CONCAT44(uStack_26c,local_270) + local_7d8;
        if (uVar24 < uVar29) {
          uVar24 = 0xf;
          if (local_278 != local_268) {
            uVar24 = local_268[0];
          }
          if (uVar24 < uVar29) goto LAB_0016eb4b;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_278,0,(char *)0x0,(ulong)local_7e0);
        }
        else {
LAB_0016eb4b:
          puVar16 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_7e0,(ulong)local_278);
        }
        plVar15 = puVar16 + 2;
        if ((long *)*puVar16 == plVar15) {
          local_850 = *plVar15;
          lStack_848 = puVar16[3];
          local_860 = &local_850;
        }
        else {
          local_850 = *plVar15;
          local_860 = (long *)*puVar16;
        }
        local_858 = puVar16[1];
        *puVar16 = plVar15;
        puVar16[1] = 0;
        *(undefined1 *)plVar15 = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_860);
        psVar19 = (size_type *)(plVar15 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar15 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar19) {
          local_5c0.field_2._M_allocated_capacity = *psVar19;
          local_5c0.field_2._8_8_ = plVar15[3];
          local_5c0._M_dataplus._M_p = (pointer)&local_5c0.field_2;
        }
        else {
          local_5c0.field_2._M_allocated_capacity = *psVar19;
          local_5c0._M_dataplus._M_p = (pointer)*plVar15;
        }
        local_5c0._M_string_length = plVar15[1];
        *plVar15 = (long)psVar19;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(pvVar30,&local_5c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
          operator_delete(local_5c0._M_dataplus._M_p);
        }
        if (local_860 != &local_850) {
          operator_delete(local_860);
        }
        if (local_278 != local_268) {
          operator_delete(local_278);
        }
        if (local_7e0 != &local_7d0) {
          operator_delete(local_7e0);
        }
        if (local_540 != &local_530) {
          operator_delete(local_540);
        }
        if (local_520 != &local_510) {
          operator_delete(local_520);
        }
        if (local_600 != &local_5f0) {
          operator_delete(local_600);
        }
        if (local_2c0 != local_2b0) {
          operator_delete(local_2c0);
        }
        if (local_780 != &local_770) {
          operator_delete(local_780);
        }
        if (local_7a0 != &local_790) {
          operator_delete(local_7a0);
        }
        if (local_840 != &local_830) {
          operator_delete(local_840);
        }
        if (local_820 != &local_810) {
          operator_delete(local_820);
        }
        if (local_2a0 != local_290) {
          operator_delete(local_2a0);
        }
        if (local_7c0 != &local_7b0) {
          operator_delete(local_7c0);
        }
        if (local_800 != &local_7f0) {
          operator_delete(local_800);
        }
        if (local_760 != &local_750) {
          operator_delete(local_760);
        }
        puVar20 = local_280;
        if (local_720 != &local_710) {
          operator_delete(local_720);
        }
        if (local_218 != local_208) {
          operator_delete(local_218);
        }
        if (local_700 != &local_6f0) {
          operator_delete(local_700);
        }
        if (local_6e0 != &local_6d0) {
          operator_delete(local_6e0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_740._M_dataplus._M_p != &local_740.field_2) {
          operator_delete(local_740._M_dataplus._M_p);
        }
        if (local_6a0 != &local_690) {
          operator_delete(local_6a0);
        }
        if (local_2e0 != &local_2d0) {
          operator_delete(local_2e0);
        }
        if (local_680 != &local_670) {
          operator_delete(local_680);
        }
        if (local_660 != &local_650) {
          operator_delete(local_660);
        }
        if (local_580 != &local_570) {
          operator_delete(local_580);
        }
        if (local_420 != &local_410) {
          operator_delete(local_420);
        }
        if (local_340 != &local_330) {
          operator_delete(local_340);
        }
        if (local_5a0 != &local_590) {
          operator_delete(local_5a0);
        }
        if (local_440 != &local_430) {
          operator_delete(local_440);
        }
        if (local_4e0 != &local_4d0) {
          operator_delete(local_4e0);
        }
        if (local_560 != &local_550) {
          operator_delete(local_560);
        }
        if (local_238 != &local_228) {
          operator_delete(local_238);
        }
        if (local_380 != &local_370) {
          operator_delete(local_380);
        }
        if (local_3e0 != &local_3d0) {
          operator_delete(local_3e0);
        }
        if (local_400 != &local_3f0) {
          operator_delete(local_400);
        }
        if (local_3a0 != &local_390) {
          operator_delete(local_3a0);
        }
        if (local_300 != &local_2f0) {
          operator_delete(local_300);
        }
        if (local_460 != &local_450) {
          operator_delete(local_460);
        }
        if (local_480 != &local_470) {
          operator_delete(local_480);
        }
        if (local_360 != &local_350) {
          operator_delete(local_360);
        }
        if (local_6c0 != &local_6b0) {
          operator_delete(local_6c0);
        }
        if (local_258 != &local_248) {
          operator_delete(local_258);
        }
        if (local_500 != &local_4f0) {
          operator_delete(local_500);
        }
        if (local_4c0 != &local_4b0) {
          operator_delete(local_4c0);
        }
        if (local_4a0 != &local_490) {
          operator_delete(local_4a0);
        }
        if (local_620 != &local_610) {
          operator_delete(local_620);
        }
        if (local_3c0 != &local_3b0) {
          operator_delete(local_3c0);
        }
        if (local_640 != &local_630) {
          operator_delete(local_640);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320._M_dataplus._M_p != &local_320.field_2) {
          operator_delete(local_320._M_dataplus._M_p);
        }
        pvVar30 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                  (local_80.
                   super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + *puVar20);
        uVar24 = local_e0->varID;
        cVar25 = '\x01';
        if (9 < uVar24) {
          uVar29 = uVar24;
          cVar12 = '\x04';
          do {
            cVar25 = cVar12;
            if (uVar29 < 100) {
              cVar25 = cVar25 + -2;
              goto LAB_0016f19a;
            }
            if (uVar29 < 1000) {
              cVar25 = cVar25 + -1;
              goto LAB_0016f19a;
            }
            if (uVar29 < 10000) goto LAB_0016f19a;
            bVar13 = 99999 < uVar29;
            uVar29 = uVar29 / 10000;
            cVar12 = cVar25 + '\x04';
          } while (bVar13);
          cVar25 = cVar25 + '\x01';
        }
LAB_0016f19a:
        local_6e0 = &local_6d0;
        std::__cxx11::string::_M_construct((ulong)&local_6e0,cVar25);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_6e0,(uint)local_6d8,uVar24);
        plVar15 = (long *)std::__cxx11::string::replace((ulong)&local_6e0,0,(char *)0x0,0x2a823d);
        local_700 = &local_6f0;
        puVar20 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar20) {
          local_6f0 = *puVar20;
          lStack_6e8 = plVar15[3];
        }
        else {
          local_6f0 = *puVar20;
          local_700 = (ulong *)*plVar15;
        }
        local_6f8 = plVar15[1];
        *plVar15 = (long)puVar20;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_700);
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_710 = *puVar20;
          lStack_708 = puVar16[3];
          local_720 = &local_710;
        }
        else {
          local_710 = *puVar20;
          local_720 = (ulong *)*puVar16;
        }
        local_718 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                  (&local_740,vsnprintf,0x148,"%f",SUB84(*local_e0->function->_parameter,0));
        uVar24 = 0xf;
        if (local_720 != &local_710) {
          uVar24 = local_710;
        }
        if (uVar24 < local_740._M_string_length + local_718) {
          uVar26 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_740._M_dataplus._M_p != &local_740.field_2) {
            uVar26 = local_740.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar26 < local_740._M_string_length + local_718) goto LAB_0016f33a;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_740,0,(char *)0x0,(ulong)local_720);
        }
        else {
LAB_0016f33a:
          puVar16 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_720,(ulong)local_740._M_dataplus._M_p);
        }
        local_760 = &local_750;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_750 = *puVar20;
          lStack_748 = puVar16[3];
        }
        else {
          local_750 = *puVar20;
          local_760 = (ulong *)*puVar16;
        }
        local_758 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)puVar20 = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_760);
        local_800 = &local_7f0;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_7f0 = *puVar20;
          lStack_7e8 = puVar16[3];
        }
        else {
          local_7f0 = *puVar20;
          local_800 = (ulong *)*puVar16;
        }
        local_7f8 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_800);
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_7b0 = *puVar20;
          lStack_7a8 = puVar16[3];
          local_7c0 = &local_7b0;
        }
        else {
          local_7b0 = *puVar20;
          local_7c0 = (ulong *)*puVar16;
        }
        local_7b8 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        uVar24 = *local_280;
        cVar25 = '\x01';
        if (9 < uVar24) {
          uVar29 = uVar24;
          cVar12 = '\x04';
          do {
            cVar25 = cVar12;
            if (uVar29 < 100) {
              cVar25 = cVar25 + -2;
              goto LAB_0016f4d1;
            }
            if (uVar29 < 1000) {
              cVar25 = cVar25 + -1;
              goto LAB_0016f4d1;
            }
            if (uVar29 < 10000) goto LAB_0016f4d1;
            bVar13 = 99999 < uVar29;
            uVar29 = uVar29 / 10000;
            cVar12 = cVar25 + '\x04';
          } while (bVar13);
          cVar25 = cVar25 + '\x01';
        }
LAB_0016f4d1:
        local_6a0 = &local_690;
        std::__cxx11::string::_M_construct((ulong)&local_6a0,cVar25);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_6a0,(uint)local_698,uVar24);
        uVar24 = 0xf;
        if (local_7c0 != &local_7b0) {
          uVar24 = local_7b0;
        }
        if (uVar24 < (ulong)(local_698 + local_7b8)) {
          uVar24 = 0xf;
          if (local_6a0 != &local_690) {
            uVar24 = local_690;
          }
          if (uVar24 < (ulong)(local_698 + local_7b8)) goto LAB_0016f565;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_6a0,0,(char *)0x0,(ulong)local_7c0);
        }
        else {
LAB_0016f565:
          puVar16 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_7c0,(ulong)local_6a0);
        }
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_810 = *puVar20;
          lStack_808 = puVar16[3];
          local_820 = &local_810;
        }
        else {
          local_810 = *puVar20;
          local_820 = (ulong *)*puVar16;
        }
        local_818 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)puVar20 = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_820);
        local_840 = &local_830;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_830 = *puVar20;
          lStack_828 = puVar16[3];
        }
        else {
          local_830 = *puVar20;
          local_840 = (ulong *)*puVar16;
        }
        local_838 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        uVar24 = local_e8[1];
        cVar25 = '\x01';
        if (9 < uVar24) {
          uVar29 = uVar24;
          cVar12 = '\x04';
          do {
            cVar25 = cVar12;
            if (uVar29 < 100) {
              cVar25 = cVar25 + -2;
              goto LAB_0016f695;
            }
            if (uVar29 < 1000) {
              cVar25 = cVar25 + -1;
              goto LAB_0016f695;
            }
            if (uVar29 < 10000) goto LAB_0016f695;
            bVar13 = 99999 < uVar29;
            uVar29 = uVar29 / 10000;
            cVar12 = cVar25 + '\x04';
          } while (bVar13);
          cVar25 = cVar25 + '\x01';
        }
LAB_0016f695:
        local_680 = &local_670;
        std::__cxx11::string::_M_construct((ulong)&local_680,cVar25);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_680,(uint)local_678,uVar24);
        uVar24 = 0xf;
        if (local_840 != &local_830) {
          uVar24 = local_830;
        }
        if (uVar24 < (ulong)(local_678 + local_838)) {
          uVar24 = 0xf;
          if (local_680 != &local_670) {
            uVar24 = local_670;
          }
          if (uVar24 < (ulong)(local_678 + local_838)) goto LAB_0016f710;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_680,0,(char *)0x0,(ulong)local_840);
        }
        else {
LAB_0016f710:
          puVar16 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_840,(ulong)local_680);
        }
        local_7a0 = &local_790;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_790 = *puVar20;
          lStack_788 = puVar16[3];
        }
        else {
          local_790 = *puVar20;
          local_7a0 = (ulong *)*puVar16;
        }
        local_798 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)puVar20 = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_7a0);
        local_780 = &local_770;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_770 = *puVar20;
          lStack_768 = puVar16[3];
        }
        else {
          local_770 = *puVar20;
          local_780 = (ulong *)*puVar16;
        }
        local_778 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_780);
        local_600 = &local_5f0;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_5f0 = *puVar20;
          lStack_5e8 = puVar16[3];
        }
        else {
          local_5f0 = *puVar20;
          local_600 = (ulong *)*puVar16;
        }
        local_5f8 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        uVar24 = *local_60;
        cVar25 = '\x01';
        if (9 < uVar24) {
          uVar29 = uVar24;
          cVar12 = '\x04';
          do {
            cVar25 = cVar12;
            if (uVar29 < 100) {
              cVar25 = cVar25 + -2;
              goto LAB_0016f8cb;
            }
            if (uVar29 < 1000) {
              cVar25 = cVar25 + -1;
              goto LAB_0016f8cb;
            }
            if (uVar29 < 10000) goto LAB_0016f8cb;
            bVar13 = 99999 < uVar29;
            uVar29 = uVar29 / 10000;
            cVar12 = cVar25 + '\x04';
          } while (bVar13);
          cVar25 = cVar25 + '\x01';
        }
LAB_0016f8cb:
        local_660 = &local_650;
        std::__cxx11::string::_M_construct((ulong)&local_660,cVar25);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_660,(uint)local_658,uVar24);
        uVar24 = 0xf;
        if (local_600 != &local_5f0) {
          uVar24 = local_5f0;
        }
        if (uVar24 < (ulong)(local_658 + local_5f8)) {
          uVar24 = 0xf;
          if (local_660 != &local_650) {
            uVar24 = local_650;
          }
          if (uVar24 < (ulong)(local_658 + local_5f8)) goto LAB_0016f952;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_660,0,(char *)0x0,(ulong)local_600);
        }
        else {
LAB_0016f952:
          puVar16 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_600,(ulong)local_660);
        }
        local_520 = &local_510;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_510 = *puVar20;
          lStack_508 = puVar16[3];
        }
        else {
          local_510 = *puVar20;
          local_520 = (ulong *)*puVar16;
        }
        local_518 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)puVar20 = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_520);
        local_540 = &local_530;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_530 = *puVar20;
          lStack_528 = puVar16[3];
        }
        else {
          local_530 = *puVar20;
          local_540 = (ulong *)*puVar16;
        }
        local_538 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        uVar24 = *(ulong *)(local_f0 + 8);
        cVar25 = '\x01';
        if (9 < uVar24) {
          uVar29 = uVar24;
          cVar12 = '\x04';
          do {
            cVar25 = cVar12;
            if (uVar29 < 100) {
              cVar25 = cVar25 + -2;
              goto LAB_0016faa8;
            }
            if (uVar29 < 1000) {
              cVar25 = cVar25 + -1;
              goto LAB_0016faa8;
            }
            if (uVar29 < 10000) goto LAB_0016faa8;
            bVar13 = 99999 < uVar29;
            uVar29 = uVar29 / 10000;
            cVar12 = cVar25 + '\x04';
          } while (bVar13);
          cVar25 = cVar25 + '\x01';
        }
LAB_0016faa8:
        local_580 = &local_570;
        std::__cxx11::string::_M_construct((ulong)&local_580,cVar25);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_580,(uint)local_578,uVar24);
        uVar24 = 0xf;
        if (local_540 != &local_530) {
          uVar24 = local_530;
        }
        if (uVar24 < (ulong)(local_578 + local_538)) {
          uVar24 = 0xf;
          if (local_580 != &local_570) {
            uVar24 = local_570;
          }
          if (uVar24 < (ulong)(local_578 + local_538)) goto LAB_0016fb37;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_580,0,(char *)0x0,(ulong)local_540);
        }
        else {
LAB_0016fb37:
          puVar16 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_540,(ulong)local_580);
        }
        local_7e0 = &local_7d0;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_7d0 = *puVar20;
          lStack_7c8 = puVar16[3];
        }
        else {
          local_7d0 = *puVar20;
          local_7e0 = (ulong *)*puVar16;
        }
        local_7d8 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)puVar20 = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_7e0);
        plVar15 = puVar16 + 2;
        if ((long *)*puVar16 == plVar15) {
          local_850 = *plVar15;
          lStack_848 = puVar16[3];
          local_860 = &local_850;
        }
        else {
          local_850 = *plVar15;
          local_860 = (long *)*puVar16;
        }
        local_858 = puVar16[1];
        *puVar16 = plVar15;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_860);
        psVar19 = puVar16 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar16 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar19) {
          local_5c0.field_2._M_allocated_capacity = *psVar19;
          local_5c0.field_2._8_8_ = puVar16[3];
          local_5c0._M_dataplus._M_p = (pointer)&local_5c0.field_2;
        }
        else {
          local_5c0.field_2._M_allocated_capacity = *psVar19;
          local_5c0._M_dataplus._M_p = (pointer)*puVar16;
        }
        local_5c0._M_string_length = puVar16[1];
        *puVar16 = psVar19;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(pvVar30,&local_5c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
          operator_delete(local_5c0._M_dataplus._M_p);
        }
        if (local_860 != &local_850) {
          operator_delete(local_860);
        }
        if (local_7e0 != &local_7d0) {
          operator_delete(local_7e0);
        }
        if (local_580 != &local_570) {
          operator_delete(local_580);
        }
        if (local_540 != &local_530) {
          operator_delete(local_540);
        }
        if (local_520 != &local_510) {
          operator_delete(local_520);
        }
        if (local_660 != &local_650) {
          operator_delete(local_660);
        }
        if (local_600 != &local_5f0) {
          operator_delete(local_600);
        }
        if (local_780 != &local_770) {
          operator_delete(local_780);
        }
        if (local_7a0 != &local_790) {
          operator_delete(local_7a0);
        }
        if (local_680 != &local_670) {
          operator_delete(local_680);
        }
        if (local_840 != &local_830) {
          operator_delete(local_840);
        }
        if (local_820 != &local_810) {
          operator_delete(local_820);
        }
        if (local_6a0 != &local_690) {
          operator_delete(local_6a0);
        }
        if (local_7c0 != &local_7b0) {
          operator_delete(local_7c0);
        }
        if (local_800 != &local_7f0) {
          operator_delete(local_800);
        }
        if (local_760 != &local_750) {
          operator_delete(local_760);
        }
        pQVar28 = local_e0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_740._M_dataplus._M_p != &local_740.field_2) {
          operator_delete(local_740._M_dataplus._M_p);
        }
        if (local_720 != &local_710) {
          operator_delete(local_720);
        }
        if (local_700 != &local_6f0) {
          operator_delete(local_700);
        }
        if (local_6e0 != &local_6d0) {
          operator_delete(local_6e0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) goto LAB_0016cfba;
      }
      else {
        pQVar4 = pQVar27->complementQuery;
        puVar5 = *(ulong **)
                  &((*(pQVar4->_aggregates).
                      super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                      super__Vector_impl_data._M_start)->_incoming).
                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data;
        if ((*puVar20 != *puVar23) || (*puVar20 != *puVar3)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"THERE IS AN ERROR IN genVarianceComputation",0x2b);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
          std::ostream::put(-0x10);
          std::ostream::flush();
        }
        uVar24 = *puVar20;
        cVar25 = '\x01';
        if (9 < uVar24) {
          uVar29 = uVar24;
          cVar12 = '\x04';
          do {
            cVar25 = cVar12;
            if (uVar29 < 100) {
              cVar25 = cVar25 + -2;
              goto LAB_0016b6fb;
            }
            if (uVar29 < 1000) {
              cVar25 = cVar25 + -1;
              goto LAB_0016b6fb;
            }
            if (uVar29 < 10000) goto LAB_0016b6fb;
            bVar13 = 99999 < uVar29;
            uVar29 = uVar29 / 10000;
            cVar12 = cVar25 + '\x04';
          } while (bVar13);
          cVar25 = cVar25 + '\x01';
        }
LAB_0016b6fb:
        ppAVar2 = (pQVar1->_aggregates).
                  super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar6 = *(long *)&((*ppAVar2)->_incoming).
                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl;
        lVar7 = *(long *)&(ppAVar2[1]->_incoming).
                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl;
        lVar8 = *(long *)&(ppAVar2[2]->_incoming).
                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl;
        local_f0 = *(long *)&((*(pQVar4->_aggregates).
                                super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
                                _M_impl.super__Vector_impl_data._M_start)->_incoming).
                             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                             ._M_impl.super__Vector_impl_data;
        local_860 = &local_850;
        local_e8 = puVar5;
        std::__cxx11::string::_M_construct((ulong)&local_860,cVar25);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_860,(uint)local_858,uVar24);
        plVar15 = (long *)std::__cxx11::string::replace((ulong)&local_860,0,(char *)0x0,0x2a8219);
        puVar20 = local_280;
        local_5c0._M_dataplus._M_p = (pointer)&local_5c0.field_2;
        psVar19 = (size_type *)(plVar15 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar15 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar19) {
          local_5c0.field_2._M_allocated_capacity = *psVar19;
          local_5c0.field_2._8_8_ = plVar15[3];
        }
        else {
          local_5c0.field_2._M_allocated_capacity = *psVar19;
          local_5c0._M_dataplus._M_p = (pointer)*plVar15;
        }
        local_5c0._M_string_length = plVar15[1];
        *plVar15 = (long)psVar19;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_5c0);
        local_5e0._M_dataplus._M_p = (pointer)&local_5e0.field_2;
        psVar19 = (size_type *)(plVar15 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar15 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar19) {
          local_5e0.field_2._M_allocated_capacity = *psVar19;
          local_5e0.field_2._8_8_ = plVar15[3];
        }
        else {
          local_5e0.field_2._M_allocated_capacity = *psVar19;
          local_5e0._M_dataplus._M_p = (pointer)*plVar15;
        }
        local_5e0._M_string_length = plVar15[1];
        *plVar15 = (long)psVar19;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
          operator_delete(local_5c0._M_dataplus._M_p);
        }
        if (local_860 != &local_850) {
          operator_delete(local_860);
        }
        pvVar30 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                  (local_d8.
                   super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + *puVar20);
        local_6e0 = &local_6d0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_6e0,local_5e0._M_dataplus._M_p,
                   local_5e0._M_dataplus._M_p + local_5e0._M_string_length);
        std::__cxx11::string::append((char *)&local_6e0);
        uVar24 = *(ulong *)(lVar8 + 8);
        cVar25 = '\x01';
        if (9 < uVar24) {
          uVar29 = uVar24;
          cVar12 = '\x04';
          do {
            cVar25 = cVar12;
            if (uVar29 < 100) {
              cVar25 = cVar25 + -2;
              goto LAB_0016b920;
            }
            if (uVar29 < 1000) {
              cVar25 = cVar25 + -1;
              goto LAB_0016b920;
            }
            if (uVar29 < 10000) goto LAB_0016b920;
            bVar13 = 99999 < uVar29;
            uVar29 = uVar29 / 10000;
            cVar12 = cVar25 + '\x04';
          } while (bVar13);
          cVar25 = cVar25 + '\x01';
        }
LAB_0016b920:
        local_740._M_dataplus._M_p = (pointer)&local_740.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_740,cVar25);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_740._M_dataplus._M_p,(uint)local_740._M_string_length,uVar24);
        uVar24 = 0xf;
        if (local_6e0 != &local_6d0) {
          uVar24 = local_6d0;
        }
        if (uVar24 < local_740._M_string_length + local_6d8) {
          uVar26 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_740._M_dataplus._M_p != &local_740.field_2) {
            uVar26 = local_740.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar26 < local_740._M_string_length + local_6d8) goto LAB_0016b9b7;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_740,0,(char *)0x0,(ulong)local_6e0);
        }
        else {
LAB_0016b9b7:
          puVar16 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_6e0,(ulong)local_740._M_dataplus._M_p);
        }
        local_700 = &local_6f0;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_6f0 = *puVar20;
          lStack_6e8 = puVar16[3];
        }
        else {
          local_6f0 = *puVar20;
          local_700 = (ulong *)*puVar16;
        }
        local_6f8 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)puVar20 = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_700);
        local_720 = &local_710;
        puVar20 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar20) {
          local_710 = *puVar20;
          lStack_708 = plVar15[3];
        }
        else {
          local_710 = *puVar20;
          local_720 = (ulong *)*plVar15;
        }
        local_718 = plVar15[1];
        *plVar15 = (long)puVar20;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_720,(ulong)local_5e0._M_dataplus._M_p);
        local_760 = &local_750;
        puVar20 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar20) {
          local_750 = *puVar20;
          lStack_748 = plVar15[3];
        }
        else {
          local_750 = *puVar20;
          local_760 = (ulong *)*plVar15;
        }
        local_758 = plVar15[1];
        *plVar15 = (long)puVar20;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_760);
        local_800 = &local_7f0;
        puVar20 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar20) {
          local_7f0 = *puVar20;
          lStack_7e8 = plVar15[3];
        }
        else {
          local_7f0 = *puVar20;
          local_800 = (ulong *)*plVar15;
        }
        local_7f8 = plVar15[1];
        *plVar15 = (long)puVar20;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        uVar24 = *(ulong *)(lVar7 + 8);
        cVar25 = '\x01';
        if (9 < uVar24) {
          uVar29 = uVar24;
          cVar12 = '\x04';
          do {
            cVar25 = cVar12;
            if (uVar29 < 100) {
              cVar25 = cVar25 + -2;
              goto LAB_0016bbc4;
            }
            if (uVar29 < 1000) {
              cVar25 = cVar25 + -1;
              goto LAB_0016bbc4;
            }
            if (uVar29 < 10000) goto LAB_0016bbc4;
            bVar13 = 99999 < uVar29;
            uVar29 = uVar29 / 10000;
            cVar12 = cVar25 + '\x04';
          } while (bVar13);
          cVar25 = cVar25 + '\x01';
        }
LAB_0016bbc4:
        local_6a0 = &local_690;
        std::__cxx11::string::_M_construct((ulong)&local_6a0,cVar25);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_6a0,(uint)local_698,uVar24);
        uVar24 = 0xf;
        if (local_800 != &local_7f0) {
          uVar24 = local_7f0;
        }
        if (uVar24 < (ulong)(local_698 + local_7f8)) {
          uVar24 = 0xf;
          if (local_6a0 != &local_690) {
            uVar24 = local_690;
          }
          if (uVar24 < (ulong)(local_698 + local_7f8)) goto LAB_0016bc4f;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_6a0,0,(char *)0x0,(ulong)local_800);
        }
        else {
LAB_0016bc4f:
          puVar16 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_800,(ulong)local_6a0);
        }
        local_7c0 = &local_7b0;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_7b0 = *puVar20;
          lStack_7a8 = puVar16[3];
        }
        else {
          local_7b0 = *puVar20;
          local_7c0 = (ulong *)*puVar16;
        }
        local_7b8 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)puVar20 = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_7c0);
        local_820 = &local_810;
        puVar20 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar20) {
          local_810 = *puVar20;
          lStack_808 = plVar15[3];
        }
        else {
          local_810 = *puVar20;
          local_820 = (ulong *)*plVar15;
        }
        local_818 = plVar15[1];
        *plVar15 = (long)puVar20;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_820,(ulong)local_5e0._M_dataplus._M_p);
        local_840 = &local_830;
        puVar20 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar20) {
          local_830 = *puVar20;
          lStack_828 = plVar15[3];
        }
        else {
          local_830 = *puVar20;
          local_840 = (ulong *)*plVar15;
        }
        local_838 = plVar15[1];
        *plVar15 = (long)puVar20;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_840);
        local_7a0 = &local_790;
        puVar20 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar20) {
          local_790 = *puVar20;
          lStack_788 = plVar15[3];
        }
        else {
          local_790 = *puVar20;
          local_7a0 = (ulong *)*plVar15;
        }
        local_798 = plVar15[1];
        *plVar15 = (long)puVar20;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        uVar24 = *(ulong *)(lVar7 + 8);
        cVar25 = '\x01';
        if (9 < uVar24) {
          uVar29 = uVar24;
          cVar12 = '\x04';
          do {
            cVar25 = cVar12;
            if (uVar29 < 100) {
              cVar25 = cVar25 + -2;
              goto LAB_0016be4e;
            }
            if (uVar29 < 1000) {
              cVar25 = cVar25 + -1;
              goto LAB_0016be4e;
            }
            if (uVar29 < 10000) goto LAB_0016be4e;
            bVar13 = 99999 < uVar29;
            uVar29 = uVar29 / 10000;
            cVar12 = cVar25 + '\x04';
          } while (bVar13);
          cVar25 = cVar25 + '\x01';
        }
LAB_0016be4e:
        local_680 = &local_670;
        std::__cxx11::string::_M_construct((ulong)&local_680,cVar25);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_680,(uint)local_678,uVar24);
        uVar24 = 0xf;
        if (local_7a0 != &local_790) {
          uVar24 = local_790;
        }
        if (uVar24 < (ulong)(local_678 + local_798)) {
          uVar24 = 0xf;
          if (local_680 != &local_670) {
            uVar24 = local_670;
          }
          if (uVar24 < (ulong)(local_678 + local_798)) goto LAB_0016bee5;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_680,0,(char *)0x0,(ulong)local_7a0);
        }
        else {
LAB_0016bee5:
          puVar16 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_7a0,(ulong)local_680);
        }
        local_780 = &local_770;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_770 = *puVar20;
          lStack_768 = puVar16[3];
        }
        else {
          local_770 = *puVar20;
          local_780 = (ulong *)*puVar16;
        }
        local_778 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)puVar20 = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_780);
        local_600 = &local_5f0;
        puVar20 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar20) {
          local_5f0 = *puVar20;
          lStack_5e8 = plVar15[3];
        }
        else {
          local_5f0 = *puVar20;
          local_600 = (ulong *)*plVar15;
        }
        local_5f8 = plVar15[1];
        *plVar15 = (long)puVar20;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_600,(ulong)local_5e0._M_dataplus._M_p);
        local_520 = &local_510;
        puVar20 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar20) {
          local_510 = *puVar20;
          lStack_508 = plVar15[3];
        }
        else {
          local_510 = *puVar20;
          local_520 = (ulong *)*plVar15;
        }
        local_518 = plVar15[1];
        *plVar15 = (long)puVar20;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_520);
        local_540 = &local_530;
        puVar20 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar20) {
          local_530 = *puVar20;
          lStack_528 = plVar15[3];
        }
        else {
          local_530 = *puVar20;
          local_540 = (ulong *)*plVar15;
        }
        local_538 = plVar15[1];
        *plVar15 = (long)puVar20;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        uVar24 = *(ulong *)(lVar6 + 8);
        cVar25 = '\x01';
        if (9 < uVar24) {
          uVar29 = uVar24;
          cVar12 = '\x04';
          do {
            cVar25 = cVar12;
            if (uVar29 < 100) {
              cVar25 = cVar25 + -2;
              goto LAB_0016c107;
            }
            if (uVar29 < 1000) {
              cVar25 = cVar25 + -1;
              goto LAB_0016c107;
            }
            if (uVar29 < 10000) goto LAB_0016c107;
            bVar13 = 99999 < uVar29;
            uVar29 = uVar29 / 10000;
            cVar12 = cVar25 + '\x04';
          } while (bVar13);
          cVar25 = cVar25 + '\x01';
        }
LAB_0016c107:
        local_660 = &local_650;
        std::__cxx11::string::_M_construct((ulong)&local_660,cVar25);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_660,(uint)local_658,uVar24);
        uVar24 = 0xf;
        if (local_540 != &local_530) {
          uVar24 = local_530;
        }
        if (uVar24 < (ulong)(local_658 + local_538)) {
          uVar24 = 0xf;
          if (local_660 != &local_650) {
            uVar24 = local_650;
          }
          if (uVar24 < (ulong)(local_658 + local_538)) goto LAB_0016c1a6;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_660,0,(char *)0x0,(ulong)local_540);
        }
        else {
LAB_0016c1a6:
          puVar16 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_540,(ulong)local_660);
        }
        local_7e0 = &local_7d0;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_7d0 = *puVar20;
          lStack_7c8 = puVar16[3];
        }
        else {
          local_7d0 = *puVar20;
          local_7e0 = (ulong *)*puVar16;
        }
        local_7d8 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)puVar20 = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_7e0);
        local_860 = &local_850;
        plVar21 = plVar15 + 2;
        if ((long *)*plVar15 == plVar21) {
          local_850 = *plVar21;
          lStack_848 = plVar15[3];
        }
        else {
          local_850 = *plVar21;
          local_860 = (long *)*plVar15;
        }
        local_858 = plVar15[1];
        *plVar15 = (long)plVar21;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_860);
        psVar19 = (size_type *)(plVar15 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar15 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar19) {
          local_5c0.field_2._M_allocated_capacity = *psVar19;
          local_5c0.field_2._8_8_ = plVar15[3];
          local_5c0._M_dataplus._M_p = (pointer)&local_5c0.field_2;
        }
        else {
          local_5c0.field_2._M_allocated_capacity = *psVar19;
          local_5c0._M_dataplus._M_p = (pointer)*plVar15;
        }
        local_5c0._M_string_length = plVar15[1];
        *plVar15 = (long)psVar19;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(pvVar30,&local_5c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
          operator_delete(local_5c0._M_dataplus._M_p);
        }
        if (local_860 != &local_850) {
          operator_delete(local_860);
        }
        if (local_7e0 != &local_7d0) {
          operator_delete(local_7e0);
        }
        if (local_660 != &local_650) {
          operator_delete(local_660);
        }
        if (local_540 != &local_530) {
          operator_delete(local_540);
        }
        if (local_520 != &local_510) {
          operator_delete(local_520);
        }
        if (local_600 != &local_5f0) {
          operator_delete(local_600);
        }
        if (local_780 != &local_770) {
          operator_delete(local_780);
        }
        if (local_680 != &local_670) {
          operator_delete(local_680);
        }
        if (local_7a0 != &local_790) {
          operator_delete(local_7a0);
        }
        if (local_840 != &local_830) {
          operator_delete(local_840);
        }
        if (local_820 != &local_810) {
          operator_delete(local_820);
        }
        if (local_7c0 != &local_7b0) {
          operator_delete(local_7c0);
        }
        if (local_6a0 != &local_690) {
          operator_delete(local_6a0);
        }
        if (local_800 != &local_7f0) {
          operator_delete(local_800);
        }
        if (local_760 != &local_750) {
          operator_delete(local_760);
        }
        if (local_720 != &local_710) {
          operator_delete(local_720);
        }
        if (local_700 != &local_6f0) {
          operator_delete(local_700);
        }
        pQVar27 = local_e0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_740._M_dataplus._M_p != &local_740.field_2) {
          operator_delete(local_740._M_dataplus._M_p);
        }
        if (local_6e0 != &local_6d0) {
          operator_delete(local_6e0);
        }
        local_48.super__Vector_base<Query_*,_std::allocator<Query_*>_>._M_impl.
        super__Vector_impl_data._M_start[*local_280] = pQVar4;
        pAVar17 = TreeDecomposition::getAttribute
                            ((local_118->_td).
                             super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr,pQVar27->varID);
        uVar24 = pQVar27->varID;
        cVar25 = '\x01';
        if (9 < uVar24) {
          uVar29 = uVar24;
          cVar12 = '\x04';
          do {
            cVar25 = cVar12;
            if (uVar29 < 100) {
              cVar25 = cVar25 + -2;
              goto LAB_0016c574;
            }
            if (uVar29 < 1000) {
              cVar25 = cVar25 + -1;
              goto LAB_0016c574;
            }
            if (uVar29 < 10000) goto LAB_0016c574;
            bVar13 = 99999 < uVar29;
            uVar29 = uVar29 / 10000;
            cVar12 = cVar25 + '\x04';
          } while (bVar13);
          cVar25 = cVar25 + '\x01';
        }
LAB_0016c574:
        pvVar30 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                  (local_80.
                   super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + *local_280);
        local_720 = &local_710;
        std::__cxx11::string::_M_construct((ulong)&local_720,cVar25);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_720,(uint)local_718,uVar24);
        puVar16 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_720,0,(char *)0x0,0x2a823d);
        local_760 = &local_750;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_750 = *puVar20;
          lStack_748 = puVar16[3];
        }
        else {
          local_750 = *puVar20;
          local_760 = (ulong *)*puVar16;
        }
        local_758 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_760);
        local_800 = &local_7f0;
        puVar20 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar20) {
          local_7f0 = *puVar20;
          lStack_7e8 = plVar15[3];
        }
        else {
          local_7f0 = *puVar20;
          local_800 = (ulong *)*plVar15;
        }
        local_7f8 = plVar15[1];
        *plVar15 = (long)puVar20;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        puVar16 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_800,(ulong)(pAVar17->_name)._M_dataplus._M_p);
        local_7c0 = &local_7b0;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_7b0 = *puVar20;
          lStack_7a8 = puVar16[3];
        }
        else {
          local_7b0 = *puVar20;
          local_7c0 = (ulong *)*puVar16;
        }
        local_7b8 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_7c0);
        local_820 = &local_810;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_810 = *puVar20;
          lStack_808 = puVar16[3];
        }
        else {
          local_810 = *puVar20;
          local_820 = (ulong *)*puVar16;
        }
        local_818 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_820);
        local_840 = &local_830;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_830 = *puVar20;
          lStack_828 = puVar16[3];
        }
        else {
          local_830 = *puVar20;
          local_840 = (ulong *)*puVar16;
        }
        local_838 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        uVar24 = *(ulong *)(lVar6 + 8);
        cVar25 = '\x01';
        if (9 < uVar24) {
          uVar29 = uVar24;
          cVar12 = '\x04';
          do {
            cVar25 = cVar12;
            if (uVar29 < 100) {
              cVar25 = cVar25 + -2;
              goto LAB_0016c811;
            }
            if (uVar29 < 1000) {
              cVar25 = cVar25 + -1;
              goto LAB_0016c811;
            }
            if (uVar29 < 10000) goto LAB_0016c811;
            bVar13 = 99999 < uVar29;
            uVar29 = uVar29 / 10000;
            cVar12 = cVar25 + '\x04';
          } while (bVar13);
          cVar25 = cVar25 + '\x01';
        }
LAB_0016c811:
        local_700 = &local_6f0;
        std::__cxx11::string::_M_construct((ulong)&local_700,cVar25);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_700,(uint)local_6f8,uVar24);
        uVar24 = 0xf;
        if (local_840 != &local_830) {
          uVar24 = local_830;
        }
        if (uVar24 < (ulong)(local_6f8 + local_838)) {
          uVar24 = 0xf;
          if (local_700 != &local_6f0) {
            uVar24 = local_6f0;
          }
          if (uVar24 < (ulong)(local_6f8 + local_838)) goto LAB_0016c89c;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_700,0,(char *)0x0,(ulong)local_840);
        }
        else {
LAB_0016c89c:
          puVar16 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_840,(ulong)local_700);
        }
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_790 = *puVar20;
          lStack_788 = puVar16[3];
          local_7a0 = &local_790;
        }
        else {
          local_790 = *puVar20;
          local_7a0 = (ulong *)*puVar16;
        }
        local_798 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)puVar20 = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_7a0);
        local_780 = &local_770;
        puVar20 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar20) {
          local_770 = *puVar20;
          lStack_768 = plVar15[3];
        }
        else {
          local_770 = *puVar20;
          local_780 = (ulong *)*plVar15;
        }
        local_778 = plVar15[1];
        *plVar15 = (long)puVar20;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_780);
        puVar20 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar20) {
          local_5f0 = *puVar20;
          lStack_5e8 = plVar15[3];
          local_600 = &local_5f0;
        }
        else {
          local_5f0 = *puVar20;
          local_600 = (ulong *)*plVar15;
        }
        local_5f8 = plVar15[1];
        *plVar15 = (long)puVar20;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        uVar24 = *local_e8;
        cVar25 = '\x01';
        if (9 < uVar24) {
          uVar29 = uVar24;
          cVar12 = '\x04';
          do {
            cVar25 = cVar12;
            if (uVar29 < 100) {
              cVar25 = cVar25 + -2;
              goto LAB_0016ca47;
            }
            if (uVar29 < 1000) {
              cVar25 = cVar25 + -1;
              goto LAB_0016ca47;
            }
            if (uVar29 < 10000) goto LAB_0016ca47;
            bVar13 = 99999 < uVar29;
            uVar29 = uVar29 / 10000;
            cVar12 = cVar25 + '\x04';
          } while (bVar13);
          cVar25 = cVar25 + '\x01';
        }
LAB_0016ca47:
        local_6e0 = &local_6d0;
        std::__cxx11::string::_M_construct((ulong)&local_6e0,cVar25);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_6e0,(uint)local_6d8,uVar24);
        uVar24 = 0xf;
        if (local_600 != &local_5f0) {
          uVar24 = local_5f0;
        }
        if (uVar24 < (ulong)(local_6d8 + local_5f8)) {
          uVar24 = 0xf;
          if (local_6e0 != &local_6d0) {
            uVar24 = local_6d0;
          }
          if (uVar24 < (ulong)(local_6d8 + local_5f8)) goto LAB_0016cade;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_6e0,0,(char *)0x0,(ulong)local_600);
        }
        else {
LAB_0016cade:
          puVar16 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_600,(ulong)local_6e0);
        }
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_510 = *puVar20;
          lStack_508 = puVar16[3];
          local_520 = &local_510;
        }
        else {
          local_510 = *puVar20;
          local_520 = (ulong *)*puVar16;
        }
        local_518 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)puVar20 = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_520);
        puVar20 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar20) {
          local_530 = *puVar20;
          lStack_528 = plVar15[3];
          local_540 = &local_530;
        }
        else {
          local_530 = *puVar20;
          local_540 = (ulong *)*plVar15;
        }
        local_538 = plVar15[1];
        *plVar15 = (long)puVar20;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        uVar24 = *(ulong *)(local_f0 + 8);
        cVar25 = '\x01';
        if (9 < uVar24) {
          uVar29 = uVar24;
          cVar12 = '\x04';
          do {
            cVar25 = cVar12;
            if (uVar29 < 100) {
              cVar25 = cVar25 + -2;
              goto LAB_0016cc24;
            }
            if (uVar29 < 1000) {
              cVar25 = cVar25 + -1;
              goto LAB_0016cc24;
            }
            if (uVar29 < 10000) goto LAB_0016cc24;
            bVar13 = 99999 < uVar29;
            uVar29 = uVar29 / 10000;
            cVar12 = cVar25 + '\x04';
          } while (bVar13);
          cVar25 = cVar25 + '\x01';
        }
LAB_0016cc24:
        local_740._M_dataplus._M_p = (pointer)&local_740.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_740,cVar25);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_740._M_dataplus._M_p,(uint)local_740._M_string_length,uVar24);
        uVar24 = 0xf;
        if (local_540 != &local_530) {
          uVar24 = local_530;
        }
        if (uVar24 < local_740._M_string_length + local_538) {
          uVar26 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_740._M_dataplus._M_p != &local_740.field_2) {
            uVar26 = local_740.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar26 < local_740._M_string_length + local_538) goto LAB_0016ccc3;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_740,0,(char *)0x0,(ulong)local_540);
        }
        else {
LAB_0016ccc3:
          puVar16 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_540,(ulong)local_740._M_dataplus._M_p);
        }
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_7d0 = *puVar20;
          lStack_7c8 = puVar16[3];
          local_7e0 = &local_7d0;
        }
        else {
          local_7d0 = *puVar20;
          local_7e0 = (ulong *)*puVar16;
        }
        local_7d8 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)puVar20 = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_7e0);
        plVar21 = plVar15 + 2;
        if ((long *)*plVar15 == plVar21) {
          local_850 = *plVar21;
          lStack_848 = plVar15[3];
          local_860 = &local_850;
        }
        else {
          local_850 = *plVar21;
          local_860 = (long *)*plVar15;
        }
        local_858 = plVar15[1];
        *plVar15 = (long)plVar21;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_860);
        psVar19 = (size_type *)(plVar15 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar15 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar19) {
          local_5c0.field_2._M_allocated_capacity = *psVar19;
          local_5c0.field_2._8_8_ = plVar15[3];
          local_5c0._M_dataplus._M_p = (pointer)&local_5c0.field_2;
        }
        else {
          local_5c0.field_2._M_allocated_capacity = *psVar19;
          local_5c0._M_dataplus._M_p = (pointer)*plVar15;
        }
        local_5c0._M_string_length = plVar15[1];
        *plVar15 = (long)psVar19;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(pvVar30,&local_5c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
          operator_delete(local_5c0._M_dataplus._M_p);
        }
        if (local_860 != &local_850) {
          operator_delete(local_860);
        }
        if (local_7e0 != &local_7d0) {
          operator_delete(local_7e0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_740._M_dataplus._M_p != &local_740.field_2) {
          operator_delete(local_740._M_dataplus._M_p);
        }
        if (local_540 != &local_530) {
          operator_delete(local_540);
        }
        if (local_520 != &local_510) {
          operator_delete(local_520);
        }
        if (local_6e0 != &local_6d0) {
          operator_delete(local_6e0);
        }
        if (local_600 != &local_5f0) {
          operator_delete(local_600);
        }
        if (local_780 != &local_770) {
          operator_delete(local_780);
        }
        if (local_7a0 != &local_790) {
          operator_delete(local_7a0);
        }
        if (local_700 != &local_6f0) {
          operator_delete(local_700);
        }
        if (local_840 != &local_830) {
          operator_delete(local_840);
        }
        if (local_820 != &local_810) {
          operator_delete(local_820);
        }
        if (local_7c0 != &local_7b0) {
          operator_delete(local_7c0);
        }
        if (local_800 != &local_7f0) {
          operator_delete(local_800);
        }
        if (local_760 != &local_750) {
          operator_delete(local_760);
        }
        pQVar28 = local_e0;
        if (local_720 != &local_710) {
          operator_delete(local_720);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
LAB_0016cfba:
          operator_delete(local_5e0._M_dataplus._M_p);
        }
      }
      pQVar27 = pQVar28 + 1;
    } while (pQVar28 + 1 != local_50);
  }
  local_5e0._M_dataplus._M_p = (pointer)&local_5e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5e0,"numberOfThresholds = ","");
  this_00 = &local_118->_features;
  this_01 = &local_118->_categoricalFeatures;
  local_280 = (ulong *)0x0;
  sVar14 = 0;
  do {
    bVar13 = std::bitset<100UL>::test(this_00,sVar14);
    if (bVar13) {
      bVar13 = std::bitset<100UL>::test(this_01,sVar14);
      if (bVar13) {
        uVar24 = **(ulong **)
                   &((*(local_118->_varToQueryMap[sVar14]->_aggregates).
                       super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                       super__Vector_impl_data._M_start)->_incoming).
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data;
        cVar25 = '\x01';
        if (9 < uVar24) {
          uVar29 = uVar24;
          cVar12 = '\x04';
          do {
            cVar25 = cVar12;
            if (uVar29 < 100) {
              cVar25 = cVar25 + -2;
              goto LAB_0016ffee;
            }
            if (uVar29 < 1000) {
              cVar25 = cVar25 + -1;
              goto LAB_0016ffee;
            }
            if (uVar29 < 10000) goto LAB_0016ffee;
            bVar13 = 99999 < uVar29;
            uVar29 = uVar29 / 10000;
            cVar12 = cVar25 + '\x04';
          } while (bVar13);
          cVar25 = cVar25 + '\x01';
        }
LAB_0016ffee:
        local_7e0 = &local_7d0;
        std::__cxx11::string::_M_construct((ulong)&local_7e0,cVar25);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_7e0,(uint)local_7d8,uVar24);
        puVar16 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_7e0,0,(char *)0x0,0x2a8219);
        local_860 = &local_850;
        plVar15 = puVar16 + 2;
        if ((long *)*puVar16 == plVar15) {
          local_850 = *plVar15;
          lStack_848 = puVar16[3];
        }
        else {
          local_850 = *plVar15;
          local_860 = (long *)*puVar16;
        }
        local_858 = puVar16[1];
        *puVar16 = plVar15;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_860);
        local_5c0._M_dataplus._M_p = (pointer)&local_5c0.field_2;
        psVar19 = puVar16 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar16 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar19) {
          local_5c0.field_2._M_allocated_capacity = *psVar19;
          local_5c0.field_2._8_8_ = puVar16[3];
        }
        else {
          local_5c0.field_2._M_allocated_capacity = *psVar19;
          local_5c0._M_dataplus._M_p = (pointer)*puVar16;
        }
        local_5c0._M_string_length = puVar16[1];
        *puVar16 = psVar19;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_5e0,(ulong)local_5c0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
          operator_delete(local_5c0._M_dataplus._M_p);
        }
        if (local_860 != &local_850) {
          operator_delete(local_860);
        }
        if (local_7e0 != &local_7d0) {
          operator_delete(local_7e0);
        }
      }
      else {
        *(ulong **)((long)__s + sVar14 * 8) = local_280;
        pvVar9 = (local_118->_thresholds).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_280 = (ulong *)((long)local_280 +
                             ((long)*(pointer *)
                                     ((long)&pvVar9[sVar14].
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data + 8) -
                              *(long *)&pvVar9[sVar14].
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data >> 3));
      }
    }
    puVar20 = local_280;
    sVar14 = sVar14 + 1;
  } while (sVar14 != 100);
  cVar25 = '\x01';
  if (9 < local_280) {
    puVar23 = local_280;
    cVar12 = '\x04';
    do {
      cVar25 = cVar12;
      if (puVar23 < 100) {
        cVar25 = cVar25 + -2;
        goto LAB_001701b6;
      }
      if (puVar23 < 1000) {
        cVar25 = cVar25 + -1;
        goto LAB_001701b6;
      }
      if (puVar23 < 10000) goto LAB_001701b6;
      bVar13 = 99999 < puVar23;
      puVar23 = (ulong *)((ulong)puVar23 / 10000);
      cVar12 = cVar25 + '\x04';
    } while (bVar13);
    cVar25 = cVar25 + '\x01';
  }
LAB_001701b6:
  local_860 = &local_850;
  std::__cxx11::string::_M_construct((ulong)&local_860,cVar25);
  std::__detail::__to_chars_10_impl<unsigned_long>
            ((char *)local_860,(uint)local_858,(unsigned_long)puVar20);
  plVar15 = (long *)std::__cxx11::string::append((char *)&local_860);
  local_5c0._M_dataplus._M_p = (pointer)&local_5c0.field_2;
  psVar19 = (size_type *)(plVar15 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar15 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar19) {
    local_5c0.field_2._M_allocated_capacity = *psVar19;
    local_5c0.field_2._8_8_ = plVar15[3];
  }
  else {
    local_5c0.field_2._M_allocated_capacity = *psVar19;
    local_5c0._M_dataplus._M_p = (pointer)*plVar15;
  }
  local_5c0._M_string_length = plVar15[1];
  *plVar15 = (long)psVar19;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_5e0,(ulong)local_5c0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
    operator_delete(local_5c0._M_dataplus._M_p);
  }
  if (local_860 != &local_850) {
    operator_delete(local_860);
  }
  local_540 = &local_530;
  std::__cxx11::string::_M_construct((ulong)&local_540,'\x06');
  plVar15 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_540,(ulong)local_5e0._M_dataplus._M_p);
  local_7e0 = &local_7d0;
  puVar20 = (ulong *)(plVar15 + 2);
  if ((ulong *)*plVar15 == puVar20) {
    local_7d0 = *puVar20;
    lStack_7c8 = plVar15[3];
  }
  else {
    local_7d0 = *puVar20;
    local_7e0 = (ulong *)*plVar15;
  }
  local_7d8 = plVar15[1];
  *plVar15 = (long)puVar20;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  local_520 = &local_510;
  std::__cxx11::string::_M_construct((ulong)&local_520,'\x06');
  uVar24 = 0xf;
  if (local_7e0 != &local_7d0) {
    uVar24 = local_7d0;
  }
  if (uVar24 < (ulong)(local_518 + local_7d8)) {
    uVar24 = 0xf;
    if (local_520 != &local_510) {
      uVar24 = local_510;
    }
    if (uVar24 < (ulong)(local_518 + local_7d8)) goto LAB_0017039d;
    puVar16 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_520,0,(char *)0x0,(ulong)local_7e0);
  }
  else {
LAB_0017039d:
    puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_7e0,(ulong)local_520);
  }
  local_860 = &local_850;
  plVar15 = puVar16 + 2;
  if ((long *)*puVar16 == plVar15) {
    local_850 = *plVar15;
    lStack_848 = puVar16[3];
  }
  else {
    local_850 = *plVar15;
    local_860 = (long *)*puVar16;
  }
  local_858 = puVar16[1];
  *puVar16 = plVar15;
  puVar16[1] = 0;
  *(undefined1 *)plVar15 = 0;
  plVar15 = (long *)std::__cxx11::string::append((char *)&local_860);
  local_5c0._M_dataplus._M_p = (pointer)&local_5c0.field_2;
  psVar19 = (size_type *)(plVar15 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar15 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar19) {
    local_5c0.field_2._M_allocated_capacity = *psVar19;
    local_5c0.field_2._8_8_ = plVar15[3];
  }
  else {
    local_5c0.field_2._M_allocated_capacity = *psVar19;
    local_5c0._M_dataplus._M_p = (pointer)*plVar15;
  }
  local_5c0._M_string_length = plVar15[1];
  *plVar15 = (long)psVar19;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  if (local_860 != &local_850) {
    operator_delete(local_860);
  }
  if (local_520 != &local_510) {
    operator_delete(local_520);
  }
  if (local_7e0 != &local_7d0) {
    operator_delete(local_7e0);
  }
  if (local_540 != &local_530) {
    operator_delete(local_540);
  }
  local_860 = &local_850;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_860,"");
  local_7e0 = &local_7d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7e0,"");
  local_540 = &local_530;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_540,"");
  local_520 = &local_510;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_520,"");
  uVar24 = 0;
  uVar29 = 0;
  while( true ) {
    sVar14 = QueryCompiler::numberOfViews
                       ((local_118->_compiler).
                        super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if (sVar14 <= uVar24) break;
    if (local_d8.
        super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar24].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_d8.
        super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar24].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      cVar25 = '\x01';
      if (9 < uVar24) {
        uVar31 = uVar24;
        cVar12 = '\x04';
        do {
          cVar25 = cVar12;
          if (uVar31 < 100) {
            cVar25 = cVar25 + -2;
            goto LAB_00170604;
          }
          if (uVar31 < 1000) {
            cVar25 = cVar25 + -1;
            goto LAB_00170604;
          }
          if (uVar31 < 10000) goto LAB_00170604;
          bVar13 = 99999 < uVar31;
          uVar31 = uVar31 / 10000;
          cVar12 = cVar25 + '\x04';
        } while (bVar13);
        cVar25 = cVar25 + '\x01';
      }
LAB_00170604:
      local_780 = &local_770;
      std::__cxx11::string::_M_construct((ulong)&local_780,cVar25);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_780,(uint)local_778,uVar24);
      puVar16 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_780,0,(char *)0x0,0x2a8219);
      local_600 = &local_5f0;
      puVar20 = puVar16 + 2;
      if ((ulong *)*puVar16 == puVar20) {
        local_5f0 = *puVar20;
        lStack_5e8 = puVar16[3];
      }
      else {
        local_5f0 = *puVar20;
        local_600 = (ulong *)*puVar16;
      }
      local_5f8 = puVar16[1];
      *puVar16 = puVar20;
      puVar16[1] = 0;
      *(undefined1 *)(puVar16 + 2) = 0;
      if (local_780 != &local_770) {
        operator_delete(local_780);
      }
      pVVar18 = QueryCompiler::getView
                          ((local_118->_compiler).
                           super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           uVar24);
      if ((pVVar18->_fVars).super__Base_bitset<2UL>._M_w[0] == 0) {
        bVar13 = true;
        do {
          bVar10 = bVar13;
          if (!bVar10) break;
          bVar13 = false;
        } while ((pVVar18->_fVars).super__Base_bitset<2UL>._M_w[1] == 0);
        if (bVar10) goto LAB_001706ff;
        local_760 = &local_750;
        std::__cxx11::string::_M_construct((ulong)&local_760,'\x06');
        puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_760,(ulong)local_600)
        ;
        local_800 = &local_7f0;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_7f0 = *puVar20;
          lStack_7e8 = puVar16[3];
        }
        else {
          local_7f0 = *puVar20;
          local_800 = (ulong *)*puVar16;
        }
        local_7f8 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_800);
        local_7c0 = &local_7b0;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_7b0 = *puVar20;
          lStack_7a8 = puVar16[3];
        }
        else {
          local_7b0 = *puVar20;
          local_7c0 = (ulong *)*puVar16;
        }
        local_7b8 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_7c0,(ulong)local_600)
        ;
        local_820 = &local_810;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_810 = *puVar20;
          lStack_808 = puVar16[3];
        }
        else {
          local_810 = *puVar20;
          local_820 = (ulong *)*puVar16;
        }
        local_818 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_820);
        local_840 = &local_830;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_830 = *puVar20;
          lStack_828 = puVar16[3];
        }
        else {
          local_830 = *puVar20;
          local_840 = (ulong *)*puVar16;
        }
        local_838 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_840,(ulong)local_600)
        ;
        local_7a0 = &local_790;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_790 = *puVar20;
          lStack_788 = puVar16[3];
        }
        else {
          local_790 = *puVar20;
          local_7a0 = (ulong *)*puVar16;
        }
        local_798 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_7a0);
        local_780 = &local_770;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_770 = *puVar20;
          lStack_768 = puVar16[3];
        }
        else {
          local_770 = *puVar20;
          local_780 = (ulong *)*puVar16;
        }
        local_778 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_860,(ulong)local_780);
        if (local_780 != &local_770) {
          operator_delete(local_780);
        }
        if (local_7a0 != &local_790) {
          operator_delete(local_7a0);
        }
        if (local_840 != &local_830) {
          operator_delete(local_840);
        }
        if (local_820 != &local_810) {
          operator_delete(local_820);
        }
        if (local_7c0 != &local_7b0) {
          operator_delete(local_7c0);
        }
        if (local_800 != &local_7f0) {
          operator_delete(local_800);
        }
        if (local_760 != &local_750) {
          operator_delete(local_760);
        }
        if (local_d8.
            super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar24].
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_d8.
            super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar24].
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          uVar31 = 0;
          do {
            local_7c0 = &local_7b0;
            std::__cxx11::string::_M_construct((ulong)&local_7c0,'\x06');
            plVar15 = (long *)std::__cxx11::string::append((char *)&local_7c0);
            local_820 = &local_810;
            puVar20 = (ulong *)(plVar15 + 2);
            if ((ulong *)*plVar15 == puVar20) {
              local_810 = *puVar20;
              lStack_808 = plVar15[3];
            }
            else {
              local_810 = *puVar20;
              local_820 = (ulong *)*plVar15;
            }
            local_818 = plVar15[1];
            *plVar15 = (long)puVar20;
            plVar15[1] = 0;
            *(undefined1 *)(plVar15 + 2) = 0;
            cVar25 = '\x01';
            if (9 < uVar29) {
              uVar22 = uVar29;
              cVar12 = '\x04';
              do {
                cVar25 = cVar12;
                if (uVar22 < 100) {
                  cVar25 = cVar25 + -2;
                  goto LAB_001731c7;
                }
                if (uVar22 < 1000) {
                  cVar25 = cVar25 + -1;
                  goto LAB_001731c7;
                }
                if (uVar22 < 10000) goto LAB_001731c7;
                bVar13 = 99999 < uVar22;
                uVar22 = uVar22 / 10000;
                cVar12 = cVar25 + '\x04';
              } while (bVar13);
              cVar25 = cVar25 + '\x01';
            }
LAB_001731c7:
            local_800 = &local_7f0;
            std::__cxx11::string::_M_construct((ulong)&local_800,cVar25);
            std::__detail::__to_chars_10_impl<unsigned_long>
                      ((char *)local_800,(uint)local_7f8,uVar29);
            uVar22 = 0xf;
            if (local_820 != &local_810) {
              uVar22 = local_810;
            }
            if (uVar22 < (ulong)(local_7f8 + local_818)) {
              uVar22 = 0xf;
              if (local_800 != &local_7f0) {
                uVar22 = local_7f0;
              }
              if (uVar22 < (ulong)(local_7f8 + local_818)) goto LAB_00173237;
              puVar16 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_800,0,(char *)0x0,(ulong)local_820);
            }
            else {
LAB_00173237:
              puVar16 = (undefined8 *)
                        std::__cxx11::string::_M_append((char *)&local_820,(ulong)local_800);
            }
            local_840 = &local_830;
            puVar20 = puVar16 + 2;
            if ((ulong *)*puVar16 == puVar20) {
              local_830 = *puVar20;
              lStack_828 = puVar16[3];
            }
            else {
              local_830 = *puVar20;
              local_840 = (ulong *)*puVar16;
            }
            local_838 = puVar16[1];
            *puVar16 = puVar20;
            puVar16[1] = 0;
            *(undefined1 *)puVar20 = 0;
            plVar15 = (long *)std::__cxx11::string::append((char *)&local_840);
            puVar20 = (ulong *)(plVar15 + 2);
            if ((ulong *)*plVar15 == puVar20) {
              local_790 = *puVar20;
              lStack_788 = plVar15[3];
              local_7a0 = &local_790;
            }
            else {
              local_790 = *puVar20;
              local_7a0 = (ulong *)*plVar15;
            }
            local_798 = plVar15[1];
            *plVar15 = (long)puVar20;
            plVar15[1] = 0;
            *(undefined1 *)(plVar15 + 2) = 0;
            plVar15 = (long *)std::__cxx11::string::_M_append
                                        ((char *)&local_7a0,
                                         (ulong)local_d8.
                                                super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start[uVar24].
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start[uVar31].
                                                _M_dataplus._M_p);
            local_780 = &local_770;
            puVar20 = (ulong *)(plVar15 + 2);
            if ((ulong *)*plVar15 == puVar20) {
              local_770 = *puVar20;
              lStack_768 = plVar15[3];
            }
            else {
              local_770 = *puVar20;
              local_780 = (ulong *)*plVar15;
            }
            local_778 = plVar15[1];
            *plVar15 = (long)puVar20;
            plVar15[1] = 0;
            *(undefined1 *)(plVar15 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&local_860,(ulong)local_780);
            if (local_780 != &local_770) {
              operator_delete(local_780);
            }
            if (local_7a0 != &local_790) {
              operator_delete(local_7a0);
            }
            if (local_840 != &local_830) {
              operator_delete(local_840);
            }
            if (local_800 != &local_7f0) {
              operator_delete(local_800);
            }
            if (local_820 != &local_810) {
              operator_delete(local_820);
            }
            if (local_7c0 != &local_7b0) {
              operator_delete(local_7c0);
            }
            local_7c0 = &local_7b0;
            std::__cxx11::string::_M_construct((ulong)&local_7c0,'\x06');
            puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_7c0);
            local_820 = &local_810;
            puVar20 = puVar16 + 2;
            if ((ulong *)*puVar16 == puVar20) {
              local_810 = *puVar20;
              lStack_808 = puVar16[3];
            }
            else {
              local_810 = *puVar20;
              local_820 = (ulong *)*puVar16;
            }
            local_818 = puVar16[1];
            *puVar16 = puVar20;
            puVar16[1] = 0;
            *(undefined1 *)(puVar16 + 2) = 0;
            cVar25 = '\x01';
            if (9 < uVar29) {
              uVar22 = uVar29;
              cVar12 = '\x04';
              do {
                cVar25 = cVar12;
                if (uVar22 < 100) {
                  cVar25 = cVar25 + -2;
                  goto LAB_001734f8;
                }
                if (uVar22 < 1000) {
                  cVar25 = cVar25 + -1;
                  goto LAB_001734f8;
                }
                if (uVar22 < 10000) goto LAB_001734f8;
                bVar13 = 99999 < uVar22;
                uVar22 = uVar22 / 10000;
                cVar12 = cVar25 + '\x04';
              } while (bVar13);
              cVar25 = cVar25 + '\x01';
            }
LAB_001734f8:
            local_800 = &local_7f0;
            std::__cxx11::string::_M_construct((ulong)&local_800,cVar25);
            std::__detail::__to_chars_10_impl<unsigned_long>
                      ((char *)local_800,(uint)local_7f8,uVar29);
            uVar22 = 0xf;
            if (local_820 != &local_810) {
              uVar22 = local_810;
            }
            if (uVar22 < (ulong)(local_7f8 + local_818)) {
              uVar22 = 0xf;
              if (local_800 != &local_7f0) {
                uVar22 = local_7f0;
              }
              if (uVar22 < (ulong)(local_7f8 + local_818)) goto LAB_00173568;
              puVar16 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_800,0,(char *)0x0,(ulong)local_820);
            }
            else {
LAB_00173568:
              puVar16 = (undefined8 *)
                        std::__cxx11::string::_M_append((char *)&local_820,(ulong)local_800);
            }
            local_840 = &local_830;
            puVar20 = puVar16 + 2;
            if ((ulong *)*puVar16 == puVar20) {
              local_830 = *puVar20;
              lStack_828 = puVar16[3];
            }
            else {
              local_830 = *puVar20;
              local_840 = (ulong *)*puVar16;
            }
            local_838 = puVar16[1];
            *puVar16 = puVar20;
            puVar16[1] = 0;
            *(undefined1 *)puVar20 = 0;
            puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_840);
            local_7a0 = &local_790;
            puVar20 = puVar16 + 2;
            if ((ulong *)*puVar16 == puVar20) {
              local_790 = *puVar20;
              lStack_788 = puVar16[3];
            }
            else {
              local_790 = *puVar20;
              local_7a0 = (ulong *)*puVar16;
            }
            local_798 = puVar16[1];
            *puVar16 = puVar20;
            puVar16[1] = 0;
            *(undefined1 *)(puVar16 + 2) = 0;
            puVar16 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_7a0,
                                 (ulong)local_80.
                                        super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[uVar24].
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[uVar31].
                                        _M_dataplus._M_p);
            local_780 = &local_770;
            puVar20 = puVar16 + 2;
            if ((ulong *)*puVar16 == puVar20) {
              local_770 = *puVar20;
              lStack_768 = puVar16[3];
            }
            else {
              local_770 = *puVar20;
              local_780 = (ulong *)*puVar16;
            }
            local_778 = puVar16[1];
            *puVar16 = puVar20;
            puVar16[1] = 0;
            *(undefined1 *)(puVar16 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&local_540,(ulong)local_780);
            if (local_780 != &local_770) {
              operator_delete(local_780);
            }
            if (local_7a0 != &local_790) {
              operator_delete(local_7a0);
            }
            if (local_840 != &local_830) {
              operator_delete(local_840);
            }
            if (local_800 != &local_7f0) {
              operator_delete(local_800);
            }
            if (local_820 != &local_810) {
              operator_delete(local_820);
            }
            if (local_7c0 != &local_7b0) {
              operator_delete(local_7c0);
            }
            uVar29 = uVar29 + 1;
            uVar31 = uVar31 + 1;
          } while (uVar31 < (ulong)((long)local_d8.
                                          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[uVar24].
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_d8.
                                          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[uVar24].
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 5));
        }
      }
      else {
LAB_001706ff:
        if (0x20 < (ulong)((long)local_d8.
                                 super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar24].
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_d8.
                                super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar24].
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)) {
          std::operator<<((ostream *)&std::cerr,"THIS IS ODD, EXCEPCTED SIZE IS 1;\n");
LAB_00178ae3:
          exit(1);
        }
        ppAVar2 = (local_48.super__Vector_base<Query_*,_std::allocator<Query_*>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar24]->_aggregates).
                  super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        puVar20 = *(ulong **)
                   &((*ppAVar2)->_incoming).
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data;
        lVar6 = *(long *)(*(long *)&(ppAVar2[1]->_incoming).
                                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                    ._M_impl.super__Vector_impl_data + 8);
        if (((puVar20[1] != lVar6 - 1U) ||
            (lVar7 = *(long *)(*(long *)&(ppAVar2[2]->_incoming).
                                         super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                         ._M_impl.super__Vector_impl_data + 8),
            puVar20[1] != lVar7 - 2U)) || (lVar6 != lVar7 + -1)) {
          std::operator<<((ostream *)&std::cerr,
                          "We should have expected the aggregates to be contiguous!\n");
          goto LAB_00178ae3;
        }
        local_218 = local_208;
        std::__cxx11::string::_M_construct((ulong)&local_218,'\x06');
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_218);
        puVar23 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar23) {
          local_2d0 = *puVar23;
          lStack_2c8 = plVar15[3];
          local_2e0 = &local_2d0;
        }
        else {
          local_2d0 = *puVar23;
          local_2e0 = (ulong *)*plVar15;
        }
        local_2d8 = plVar15[1];
        *plVar15 = (long)puVar23;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        uVar31 = *puVar20;
        cVar25 = '\x01';
        if (9 < uVar31) {
          uVar22 = uVar31;
          cVar12 = '\x04';
          do {
            cVar25 = cVar12;
            if (uVar22 < 100) {
              cVar25 = cVar25 + -2;
              goto LAB_001708d0;
            }
            if (uVar22 < 1000) {
              cVar25 = cVar25 + -1;
              goto LAB_001708d0;
            }
            if (uVar22 < 10000) goto LAB_001708d0;
            bVar13 = 99999 < uVar22;
            uVar22 = uVar22 / 10000;
            cVar12 = cVar25 + '\x04';
          } while (bVar13);
          cVar25 = cVar25 + '\x01';
        }
LAB_001708d0:
        local_2a0 = local_290;
        std::__cxx11::string::_M_construct((ulong)&local_2a0,cVar25);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_2a0,local_298,uVar31);
        uVar31 = 0xf;
        if (local_2e0 != &local_2d0) {
          uVar31 = local_2d0;
        }
        uVar22 = CONCAT44(uStack_294,local_298) + local_2d8;
        if (uVar31 < uVar22) {
          uVar31 = 0xf;
          if (local_2a0 != local_290) {
            uVar31 = local_290[0];
          }
          if (uVar31 < uVar22) goto LAB_0017096f;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_2a0,0,(char *)0x0,(ulong)local_2e0);
        }
        else {
LAB_0017096f:
          puVar16 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_2e0,(ulong)local_2a0);
        }
        puVar23 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar23) {
          local_330 = *puVar23;
          uStack_328 = puVar16[3];
          local_340 = &local_330;
        }
        else {
          local_330 = *puVar23;
          local_340 = (ulong *)*puVar16;
        }
        local_338 = puVar16[1];
        *puVar16 = puVar23;
        puVar16[1] = 0;
        *(undefined1 *)puVar23 = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_340);
        local_238 = &local_228;
        puVar23 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar23) {
          local_228 = *puVar23;
          lStack_220 = plVar15[3];
        }
        else {
          local_228 = *puVar23;
          local_238 = (ulong *)*plVar15;
        }
        local_230 = plVar15[1];
        *plVar15 = (long)puVar23;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        uVar31 = puVar20[1];
        cVar25 = '\x01';
        if (9 < uVar31) {
          uVar22 = uVar31;
          cVar12 = '\x04';
          do {
            cVar25 = cVar12;
            if (uVar22 < 100) {
              cVar25 = cVar25 + -2;
              goto LAB_00170ab6;
            }
            if (uVar22 < 1000) {
              cVar25 = cVar25 + -1;
              goto LAB_00170ab6;
            }
            if (uVar22 < 10000) goto LAB_00170ab6;
            bVar13 = 99999 < uVar22;
            uVar22 = uVar22 / 10000;
            cVar12 = cVar25 + '\x04';
          } while (bVar13);
          cVar25 = cVar25 + '\x01';
        }
LAB_00170ab6:
        local_2c0 = local_2b0;
        std::__cxx11::string::_M_construct((ulong)&local_2c0,cVar25);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_2c0,local_2b8,uVar31);
        uVar31 = 0xf;
        if (local_238 != &local_228) {
          uVar31 = local_228;
        }
        uVar22 = CONCAT44(uStack_2b4,local_2b8) + local_230;
        if (uVar31 < uVar22) {
          uVar31 = 0xf;
          if (local_2c0 != local_2b0) {
            uVar31 = local_2b0[0];
          }
          if (uVar31 < uVar22) goto LAB_00170b55;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_2c0,0,(char *)0x0,(ulong)local_238);
        }
        else {
LAB_00170b55:
          puVar16 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_238,(ulong)local_2c0);
        }
        local_300 = &local_2f0;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_2f0 = *puVar20;
          lStack_2e8 = puVar16[3];
        }
        else {
          local_2f0 = *puVar20;
          local_300 = (ulong *)*puVar16;
        }
        local_2f8 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)puVar20 = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_300);
        local_258 = &local_248;
        puVar20 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar20) {
          local_248 = *puVar20;
          lStack_240 = plVar15[3];
        }
        else {
          local_248 = *puVar20;
          local_258 = (ulong *)*plVar15;
        }
        local_250 = plVar15[1];
        *plVar15 = (long)puVar20;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        local_278 = local_268;
        std::__cxx11::string::_M_construct((ulong)&local_278,'\x06');
        uVar31 = 0xf;
        if (local_258 != &local_248) {
          uVar31 = local_248;
        }
        uVar22 = CONCAT44(uStack_26c,local_270) + local_250;
        if (uVar31 < uVar22) {
          uVar31 = 0xf;
          if (local_278 != local_268) {
            uVar31 = local_268[0];
          }
          if (uVar31 < uVar22) goto LAB_00170cc3;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_278,0,(char *)0x0,(ulong)local_258);
        }
        else {
LAB_00170cc3:
          puVar16 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_278);
        }
        local_3c0 = &local_3b0;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_3b0 = *puVar20;
          lStack_3a8 = puVar16[3];
        }
        else {
          local_3b0 = *puVar20;
          local_3c0 = (ulong *)*puVar16;
        }
        local_3b8 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)puVar20 = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_3c0);
        local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
        psVar19 = (size_type *)(plVar15 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar15 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar19) {
          local_320.field_2._M_allocated_capacity = *psVar19;
          local_320.field_2._8_8_ = plVar15[3];
        }
        else {
          local_320.field_2._M_allocated_capacity = *psVar19;
          local_320._M_dataplus._M_p = (pointer)*plVar15;
        }
        local_320._M_string_length = plVar15[1];
        *plVar15 = (long)psVar19;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_320,(ulong)local_600)
        ;
        local_640 = &local_630;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_630 = *puVar20;
          lStack_628 = puVar16[3];
        }
        else {
          local_630 = *puVar20;
          local_640 = (ulong *)*puVar16;
        }
        local_638 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_640);
        local_620 = &local_610;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_610 = *puVar20;
          lStack_608 = puVar16[3];
        }
        else {
          local_610 = *puVar20;
          local_620 = (ulong *)*puVar16;
        }
        local_618 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_620,(ulong)local_600)
        ;
        local_4a0 = &local_490;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_490 = *puVar20;
          lStack_488 = puVar16[3];
        }
        else {
          local_490 = *puVar20;
          local_4a0 = (ulong *)*puVar16;
        }
        local_498 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_4a0);
        local_4c0 = &local_4b0;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_4b0 = *puVar20;
          lStack_4a8 = puVar16[3];
        }
        else {
          local_4b0 = *puVar20;
          local_4c0 = (ulong *)*puVar16;
        }
        local_4b8 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_4c0,(ulong)local_600)
        ;
        local_500 = &local_4f0;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_4f0 = *puVar20;
          lStack_4e8 = puVar16[3];
        }
        else {
          local_4f0 = *puVar20;
          local_500 = (ulong *)*puVar16;
        }
        local_4f8 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_500);
        local_6c0 = &local_6b0;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_6b0 = *puVar20;
          uStack_6a8 = puVar16[3];
        }
        else {
          local_6b0 = *puVar20;
          local_6c0 = (ulong *)*puVar16;
        }
        local_6b8 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        local_138 = local_128;
        std::__cxx11::string::_M_construct((ulong)&local_138,'\x06');
        uVar31 = 0xf;
        if (local_6c0 != &local_6b0) {
          uVar31 = local_6b0;
        }
        if (uVar31 < (ulong)(local_130 + local_6b8)) {
          uVar31 = 0xf;
          if (local_138 != local_128) {
            uVar31 = local_128[0];
          }
          if (uVar31 < (ulong)(local_130 + local_6b8)) goto LAB_001710c2;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,(ulong)local_6c0);
        }
        else {
LAB_001710c2:
          puVar16 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_6c0,(ulong)local_138);
        }
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_350 = *puVar20;
          uStack_348 = puVar16[3];
          local_360 = &local_350;
        }
        else {
          local_350 = *puVar20;
          local_360 = (ulong *)*puVar16;
        }
        local_358 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)puVar20 = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_360);
        local_480 = &local_470;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_470 = *puVar20;
          lStack_468 = puVar16[3];
        }
        else {
          local_470 = *puVar20;
          local_480 = (ulong *)*puVar16;
        }
        local_478 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        local_158 = local_148;
        std::__cxx11::string::_M_construct((ulong)&local_158,'\t');
        uVar31 = 0xf;
        if (local_480 != &local_470) {
          uVar31 = local_470;
        }
        if (uVar31 < (ulong)(local_150 + local_478)) {
          uVar31 = 0xf;
          if (local_158 != local_148) {
            uVar31 = local_148[0];
          }
          if (uVar31 < (ulong)(local_150 + local_478)) goto LAB_00171229;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_158,0,(char *)0x0,(ulong)local_480);
        }
        else {
LAB_00171229:
          puVar16 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_480,(ulong)local_158);
        }
        local_460 = &local_450;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_450 = *puVar20;
          lStack_448 = puVar16[3];
        }
        else {
          local_450 = *puVar20;
          local_460 = (ulong *)*puVar16;
        }
        local_458 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)puVar20 = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_460);
        local_3a0 = &local_390;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_390 = *puVar20;
          lStack_388 = puVar16[3];
        }
        else {
          local_390 = *puVar20;
          local_3a0 = (ulong *)*puVar16;
        }
        local_398 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_3a0,(ulong)local_600)
        ;
        local_400 = &local_3f0;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_3f0 = *puVar20;
          lStack_3e8 = puVar16[3];
        }
        else {
          local_3f0 = *puVar20;
          local_400 = (ulong *)*puVar16;
        }
        local_3f8 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_400);
        local_3e0 = &local_3d0;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_3d0 = *puVar20;
          lStack_3c8 = puVar16[3];
        }
        else {
          local_3d0 = *puVar20;
          local_3e0 = (ulong *)*puVar16;
        }
        local_3d8 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_3e0,(ulong)local_600)
        ;
        local_380 = &local_370;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_370 = *puVar20;
          lStack_368 = puVar16[3];
        }
        else {
          local_370 = *puVar20;
          local_380 = (ulong *)*puVar16;
        }
        local_378 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_380);
        local_560 = &local_550;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_550 = *puVar20;
          lStack_548 = puVar16[3];
        }
        else {
          local_550 = *puVar20;
          local_560 = (ulong *)*puVar16;
        }
        local_558 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        local_178 = local_168;
        std::__cxx11::string::_M_construct((ulong)&local_178,'\t');
        uVar31 = 0xf;
        if (local_560 != &local_550) {
          uVar31 = local_550;
        }
        if (uVar31 < (ulong)(local_170 + local_558)) {
          uVar31 = 0xf;
          if (local_178 != local_168) {
            uVar31 = local_168[0];
          }
          if (uVar31 < (ulong)(local_170 + local_558)) goto LAB_0017154d;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_178,0,(char *)0x0,(ulong)local_560);
        }
        else {
LAB_0017154d:
          puVar16 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_560,(ulong)local_178);
        }
        local_4e0 = &local_4d0;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_4d0 = *puVar20;
          lStack_4c8 = puVar16[3];
        }
        else {
          local_4d0 = *puVar20;
          local_4e0 = (ulong *)*puVar16;
        }
        local_4d8 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)puVar20 = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_4e0);
        local_440 = &local_430;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_430 = *puVar20;
          lStack_428 = puVar16[3];
        }
        else {
          local_430 = *puVar20;
          local_440 = (ulong *)*puVar16;
        }
        local_438 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        local_198 = local_188;
        std::__cxx11::string::_M_construct((ulong)&local_198,'\f');
        uVar31 = 0xf;
        if (local_440 != &local_430) {
          uVar31 = local_430;
        }
        if (uVar31 < (ulong)(local_190 + local_438)) {
          uVar31 = 0xf;
          if (local_198 != local_188) {
            uVar31 = local_188[0];
          }
          if (uVar31 < (ulong)(local_190 + local_438)) goto LAB_001716bb;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_198,0,(char *)0x0,(ulong)local_440);
        }
        else {
LAB_001716bb:
          puVar16 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_440,(ulong)local_198);
        }
        local_5a0 = &local_590;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_590 = *puVar20;
          lStack_588 = puVar16[3];
        }
        else {
          local_590 = *puVar20;
          local_5a0 = (ulong *)*puVar16;
        }
        local_598 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)puVar20 = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_5a0);
        local_420 = &local_410;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_410 = *puVar20;
          lStack_408 = puVar16[3];
        }
        else {
          local_410 = *puVar20;
          local_420 = (ulong *)*puVar16;
        }
        local_418 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        local_1b8 = local_1a8;
        std::__cxx11::string::_M_construct((ulong)&local_1b8,'\f');
        uVar31 = 0xf;
        if (local_420 != &local_410) {
          uVar31 = local_410;
        }
        if (uVar31 < (ulong)(local_1b0 + local_418)) {
          uVar31 = 0xf;
          if (local_1b8 != local_1a8) {
            uVar31 = local_1a8[0];
          }
          if (uVar31 < (ulong)(local_1b0 + local_418)) goto LAB_00171829;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_1b8,0,(char *)0x0,(ulong)local_420);
        }
        else {
LAB_00171829:
          puVar16 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_420,(ulong)local_1b8);
        }
        local_580 = &local_570;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_570 = *puVar20;
          lStack_568 = puVar16[3];
        }
        else {
          local_570 = *puVar20;
          local_580 = (ulong *)*puVar16;
        }
        local_578 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)puVar20 = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_580);
        local_660 = &local_650;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_650 = *puVar20;
          lStack_648 = puVar16[3];
        }
        else {
          local_650 = *puVar20;
          local_660 = (ulong *)*puVar16;
        }
        local_658 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        local_1d8 = local_1c8;
        std::__cxx11::string::_M_construct((ulong)&local_1d8,'\t');
        uVar31 = 0xf;
        if (local_660 != &local_650) {
          uVar31 = local_650;
        }
        if (uVar31 < (ulong)(local_1d0 + local_658)) {
          uVar31 = 0xf;
          if (local_1d8 != local_1c8) {
            uVar31 = local_1c8[0];
          }
          if (uVar31 < (ulong)(local_1d0 + local_658)) goto LAB_00171997;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,(ulong)local_660);
        }
        else {
LAB_00171997:
          puVar16 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_660,(ulong)local_1d8);
        }
        local_680 = &local_670;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_670 = *puVar20;
          lStack_668 = puVar16[3];
        }
        else {
          local_670 = *puVar20;
          local_680 = (ulong *)*puVar16;
        }
        local_678 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)puVar20 = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_680);
        local_6a0 = &local_690;
        puVar20 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar20) {
          local_690 = *puVar20;
          lStack_688 = plVar15[3];
        }
        else {
          local_690 = *puVar20;
          local_6a0 = (ulong *)*plVar15;
        }
        local_698 = plVar15[1];
        *plVar15 = (long)puVar20;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        local_1f8 = local_1e8;
        std::__cxx11::string::_M_construct((ulong)&local_1f8,'\t');
        uVar31 = 0xf;
        if (local_6a0 != &local_690) {
          uVar31 = local_690;
        }
        if (uVar31 < (ulong)(local_1f0 + local_698)) {
          uVar31 = 0xf;
          if (local_1f8 != local_1e8) {
            uVar31 = local_1e8[0];
          }
          if (uVar31 < (ulong)(local_1f0 + local_698)) goto LAB_00171b05;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_1f8,0,(char *)0x0,(ulong)local_6a0);
        }
        else {
LAB_00171b05:
          puVar16 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_6a0,(ulong)local_1f8);
        }
        local_740._M_dataplus._M_p = (pointer)&local_740.field_2;
        puVar20 = puVar16 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar16 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar20) {
          local_740.field_2._M_allocated_capacity = *puVar20;
          local_740.field_2._8_8_ = puVar16[3];
        }
        else {
          local_740.field_2._M_allocated_capacity = *puVar20;
          local_740._M_dataplus._M_p = (pointer)*puVar16;
        }
        local_740._M_string_length = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)puVar20 = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_740);
        local_6e0 = &local_6d0;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_6d0 = *puVar20;
          lStack_6c8 = puVar16[3];
        }
        else {
          local_6d0 = *puVar20;
          local_6e0 = (ulong *)*puVar16;
        }
        local_6d8 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        local_110 = local_100;
        std::__cxx11::string::_M_construct((ulong)&local_110,'\f');
        uVar31 = 0xf;
        if (local_6e0 != &local_6d0) {
          uVar31 = local_6d0;
        }
        if (uVar31 < (ulong)(local_108 + local_6d8)) {
          uVar31 = 0xf;
          if (local_110 != local_100) {
            uVar31 = local_100[0];
          }
          if (uVar31 < (ulong)(local_108 + local_6d8)) goto LAB_00171c73;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,(ulong)local_6e0);
        }
        else {
LAB_00171c73:
          puVar16 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_6e0,(ulong)local_110);
        }
        local_700 = &local_6f0;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_6f0 = *puVar20;
          lStack_6e8 = puVar16[3];
        }
        else {
          local_6f0 = *puVar20;
          local_700 = (ulong *)*puVar16;
        }
        local_6f8 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)puVar20 = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_700);
        local_720 = &local_710;
        puVar20 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar20) {
          local_710 = *puVar20;
          lStack_708 = plVar15[3];
        }
        else {
          local_710 = *puVar20;
          local_720 = (ulong *)*plVar15;
        }
        local_718 = plVar15[1];
        *plVar15 = (long)puVar20;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::_M_append((char *)&local_720,(ulong)local_600);
        local_760 = &local_750;
        puVar20 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar20) {
          local_750 = *puVar20;
          lStack_748 = plVar15[3];
        }
        else {
          local_750 = *puVar20;
          local_760 = (ulong *)*plVar15;
        }
        local_758 = plVar15[1];
        *plVar15 = (long)puVar20;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_760);
        local_800 = &local_7f0;
        puVar20 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar20) {
          local_7f0 = *puVar20;
          lStack_7e8 = plVar15[3];
        }
        else {
          local_7f0 = *puVar20;
          local_800 = (ulong *)*plVar15;
        }
        local_7f8 = plVar15[1];
        *plVar15 = (long)puVar20;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        local_a0 = local_90;
        std::__cxx11::string::_M_construct((ulong)&local_a0,'\t');
        uVar31 = 0xf;
        if (local_800 != &local_7f0) {
          uVar31 = local_7f0;
        }
        if (uVar31 < (ulong)(local_98 + local_7f8)) {
          uVar31 = 0xf;
          if (local_a0 != local_90) {
            uVar31 = local_90[0];
          }
          if (uVar31 < (ulong)(local_98 + local_7f8)) goto LAB_00171e9c;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,(ulong)local_800);
        }
        else {
LAB_00171e9c:
          puVar16 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_800,(ulong)local_a0);
        }
        local_7c0 = &local_7b0;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_7b0 = *puVar20;
          lStack_7a8 = puVar16[3];
        }
        else {
          local_7b0 = *puVar20;
          local_7c0 = (ulong *)*puVar16;
        }
        local_7b8 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)puVar20 = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_7c0);
        local_820 = &local_810;
        puVar20 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar20) {
          local_810 = *puVar20;
          lStack_808 = plVar15[3];
        }
        else {
          local_810 = *puVar20;
          local_820 = (ulong *)*plVar15;
        }
        local_818 = plVar15[1];
        *plVar15 = (long)puVar20;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_820,
                                     (ulong)((local_d8.
                                              super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start[uVar24].
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            _M_dataplus)._M_p);
        local_840 = &local_830;
        puVar20 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar20) {
          local_830 = *puVar20;
          lStack_828 = plVar15[3];
        }
        else {
          local_830 = *puVar20;
          local_840 = (ulong *)*plVar15;
        }
        local_838 = plVar15[1];
        *plVar15 = (long)puVar20;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        local_c0 = local_b0;
        std::__cxx11::string::_M_construct((ulong)&local_c0,'\x06');
        uVar31 = 0xf;
        if (local_840 != &local_830) {
          uVar31 = local_830;
        }
        if (uVar31 < (ulong)(local_b8 + local_838)) {
          uVar31 = 0xf;
          if (local_c0 != local_b0) {
            uVar31 = local_b0[0];
          }
          if (uVar31 < (ulong)(local_b8 + local_838)) goto LAB_0017204f;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_c0,0,(char *)0x0,(ulong)local_840);
        }
        else {
LAB_0017204f:
          puVar16 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_840,(ulong)local_c0);
        }
        local_7a0 = &local_790;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_790 = *puVar20;
          lStack_788 = puVar16[3];
        }
        else {
          local_790 = *puVar20;
          local_7a0 = (ulong *)*puVar16;
        }
        local_798 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)puVar20 = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_7a0);
        local_780 = &local_770;
        puVar20 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar20) {
          local_770 = *puVar20;
          lStack_768 = plVar15[3];
        }
        else {
          local_770 = *puVar20;
          local_780 = (ulong *)*plVar15;
        }
        local_778 = plVar15[1];
        *plVar15 = (long)puVar20;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_7e0,(ulong)local_780);
        if (local_780 != &local_770) {
          operator_delete(local_780);
        }
        if (local_7a0 != &local_790) {
          operator_delete(local_7a0);
        }
        if (local_c0 != local_b0) {
          operator_delete(local_c0);
        }
        if (local_840 != &local_830) {
          operator_delete(local_840);
        }
        if (local_820 != &local_810) {
          operator_delete(local_820);
        }
        if (local_7c0 != &local_7b0) {
          operator_delete(local_7c0);
        }
        if (local_a0 != local_90) {
          operator_delete(local_a0);
        }
        if (local_800 != &local_7f0) {
          operator_delete(local_800);
        }
        if (local_760 != &local_750) {
          operator_delete(local_760);
        }
        if (local_720 != &local_710) {
          operator_delete(local_720);
        }
        if (local_700 != &local_6f0) {
          operator_delete(local_700);
        }
        if (local_110 != local_100) {
          operator_delete(local_110);
        }
        if (local_6e0 != &local_6d0) {
          operator_delete(local_6e0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_740._M_dataplus._M_p != &local_740.field_2) {
          operator_delete(local_740._M_dataplus._M_p);
        }
        if (local_1f8 != local_1e8) {
          operator_delete(local_1f8);
        }
        if (local_6a0 != &local_690) {
          operator_delete(local_6a0);
        }
        if (local_680 != &local_670) {
          operator_delete(local_680);
        }
        if (local_1d8 != local_1c8) {
          operator_delete(local_1d8);
        }
        if (local_660 != &local_650) {
          operator_delete(local_660);
        }
        if (local_580 != &local_570) {
          operator_delete(local_580);
        }
        if (local_1b8 != local_1a8) {
          operator_delete(local_1b8);
        }
        if (local_420 != &local_410) {
          operator_delete(local_420);
        }
        if (local_5a0 != &local_590) {
          operator_delete(local_5a0);
        }
        if (local_198 != local_188) {
          operator_delete(local_198);
        }
        if (local_440 != &local_430) {
          operator_delete(local_440);
        }
        if (local_4e0 != &local_4d0) {
          operator_delete(local_4e0);
        }
        if (local_178 != local_168) {
          operator_delete(local_178);
        }
        if (local_560 != &local_550) {
          operator_delete(local_560);
        }
        if (local_380 != &local_370) {
          operator_delete(local_380);
        }
        if (local_3e0 != &local_3d0) {
          operator_delete(local_3e0);
        }
        if (local_400 != &local_3f0) {
          operator_delete(local_400);
        }
        if (local_3a0 != &local_390) {
          operator_delete(local_3a0);
        }
        if (local_460 != &local_450) {
          operator_delete(local_460);
        }
        if (local_158 != local_148) {
          operator_delete(local_158);
        }
        if (local_480 != &local_470) {
          operator_delete(local_480);
        }
        if (local_360 != &local_350) {
          operator_delete(local_360);
        }
        if (local_138 != local_128) {
          operator_delete(local_138);
        }
        if (local_6c0 != &local_6b0) {
          operator_delete(local_6c0);
        }
        if (local_500 != &local_4f0) {
          operator_delete(local_500);
        }
        if (local_4c0 != &local_4b0) {
          operator_delete(local_4c0);
        }
        if (local_4a0 != &local_490) {
          operator_delete(local_4a0);
        }
        if (local_620 != &local_610) {
          operator_delete(local_620);
        }
        if (local_640 != &local_630) {
          operator_delete(local_640);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320._M_dataplus._M_p != &local_320.field_2) {
          operator_delete(local_320._M_dataplus._M_p);
        }
        if (local_3c0 != &local_3b0) {
          operator_delete(local_3c0);
        }
        if (local_278 != local_268) {
          operator_delete(local_278);
        }
        if (local_258 != &local_248) {
          operator_delete(local_258);
        }
        if (local_300 != &local_2f0) {
          operator_delete(local_300);
        }
        if (local_2c0 != local_2b0) {
          operator_delete(local_2c0);
        }
        if (local_238 != &local_228) {
          operator_delete(local_238);
        }
        if (local_340 != &local_330) {
          operator_delete(local_340);
        }
        if (local_2a0 != local_290) {
          operator_delete(local_2a0);
        }
        if (local_2e0 != &local_2d0) {
          operator_delete(local_2e0);
        }
        if (local_218 != local_208) {
          operator_delete(local_218);
        }
        local_700 = &local_6f0;
        std::__cxx11::string::_M_construct((ulong)&local_700,'\x06');
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_700);
        local_720 = &local_710;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_710 = *puVar20;
          lStack_708 = puVar16[3];
        }
        else {
          local_710 = *puVar20;
          local_720 = (ulong *)*puVar16;
        }
        local_718 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        cVar25 = '\x01';
        if (9 < uVar24) {
          uVar31 = uVar24;
          cVar12 = '\x04';
          do {
            cVar25 = cVar12;
            if (uVar31 < 100) {
              cVar25 = cVar25 + -2;
              goto LAB_0017279b;
            }
            if (uVar31 < 1000) {
              cVar25 = cVar25 + -1;
              goto LAB_0017279b;
            }
            if (uVar31 < 10000) goto LAB_0017279b;
            bVar13 = 99999 < uVar31;
            uVar31 = uVar31 / 10000;
            cVar12 = cVar25 + '\x04';
          } while (bVar13);
          cVar25 = cVar25 + '\x01';
        }
LAB_0017279b:
        local_6e0 = &local_6d0;
        std::__cxx11::string::_M_construct((ulong)&local_6e0,cVar25);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_6e0,(uint)local_6d8,uVar24);
        uVar31 = 0xf;
        if (local_720 != &local_710) {
          uVar31 = local_710;
        }
        if (uVar31 < (ulong)(local_6d8 + local_718)) {
          uVar31 = 0xf;
          if (local_6e0 != &local_6d0) {
            uVar31 = local_6d0;
          }
          if (uVar31 < (ulong)(local_6d8 + local_718)) goto LAB_00172832;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_6e0,0,(char *)0x0,(ulong)local_720);
        }
        else {
LAB_00172832:
          puVar16 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_720,(ulong)local_6e0);
        }
        local_760 = &local_750;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_750 = *puVar20;
          lStack_748 = puVar16[3];
        }
        else {
          local_750 = *puVar20;
          local_760 = (ulong *)*puVar16;
        }
        local_758 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)puVar20 = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_760);
        local_800 = &local_7f0;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_7f0 = *puVar20;
          lStack_7e8 = puVar16[3];
        }
        else {
          local_7f0 = *puVar20;
          local_800 = (ulong *)*puVar16;
        }
        local_7f8 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        cVar25 = '\x01';
        if (9 < uVar24) {
          uVar31 = uVar24;
          cVar12 = '\x04';
          do {
            cVar25 = cVar12;
            if (uVar31 < 100) {
              cVar25 = cVar25 + -2;
              goto LAB_00172960;
            }
            if (uVar31 < 1000) {
              cVar25 = cVar25 + -1;
              goto LAB_00172960;
            }
            if (uVar31 < 10000) goto LAB_00172960;
            bVar13 = 99999 < uVar31;
            uVar31 = uVar31 / 10000;
            cVar12 = cVar25 + '\x04';
          } while (bVar13);
          cVar25 = cVar25 + '\x01';
        }
LAB_00172960:
        local_740._M_dataplus._M_p = (pointer)&local_740.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_740,cVar25);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_740._M_dataplus._M_p,(uint)local_740._M_string_length,uVar24);
        uVar31 = 0xf;
        if (local_800 != &local_7f0) {
          uVar31 = local_7f0;
        }
        if (uVar31 < local_740._M_string_length + local_7f8) {
          uVar26 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_740._M_dataplus._M_p != &local_740.field_2) {
            uVar26 = local_740.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar26 < local_740._M_string_length + local_7f8) goto LAB_001729eb;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_740,0,(char *)0x0,(ulong)local_800);
        }
        else {
LAB_001729eb:
          puVar16 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_800,(ulong)local_740._M_dataplus._M_p);
        }
        local_7c0 = &local_7b0;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_7b0 = *puVar20;
          lStack_7a8 = puVar16[3];
        }
        else {
          local_7b0 = *puVar20;
          local_7c0 = (ulong *)*puVar16;
        }
        local_7b8 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)puVar20 = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_7c0);
        local_820 = &local_810;
        puVar20 = puVar16 + 2;
        local_6a0 = &local_690;
        if ((ulong *)*puVar16 == puVar20) {
          local_810 = *puVar20;
          lStack_808 = puVar16[3];
        }
        else {
          local_810 = *puVar20;
          local_820 = (ulong *)*puVar16;
        }
        local_818 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        std::__cxx11::string::_M_construct((ulong)&local_6a0,'\t');
        uVar31 = 0xf;
        if (local_820 != &local_810) {
          uVar31 = local_810;
        }
        if (uVar31 < (ulong)(local_698 + local_818)) {
          uVar31 = 0xf;
          if (local_6a0 != &local_690) {
            uVar31 = local_690;
          }
          if (uVar31 < (ulong)(local_698 + local_818)) goto LAB_00172b3b;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_6a0,0,(char *)0x0,(ulong)local_820);
        }
        else {
LAB_00172b3b:
          puVar16 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_820,(ulong)local_6a0);
        }
        local_840 = &local_830;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_830 = *puVar20;
          lStack_828 = puVar16[3];
        }
        else {
          local_830 = *puVar20;
          local_840 = (ulong *)*puVar16;
        }
        local_838 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)puVar20 = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_840);
        local_7a0 = &local_790;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_790 = *puVar20;
          lStack_788 = puVar16[3];
        }
        else {
          local_790 = *puVar20;
          local_7a0 = (ulong *)*puVar16;
        }
        local_798 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        puVar16 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_7a0,
                             (ulong)((local_80.
                                      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[uVar24].
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p)
        ;
        local_780 = &local_770;
        puVar20 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar20) {
          local_770 = *puVar20;
          lStack_768 = puVar16[3];
        }
        else {
          local_770 = *puVar20;
          local_780 = (ulong *)*puVar16;
        }
        local_778 = puVar16[1];
        *puVar16 = puVar20;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_520,(ulong)local_780);
        if (local_780 != &local_770) {
          operator_delete(local_780);
        }
        if (local_7a0 != &local_790) {
          operator_delete(local_7a0);
        }
        if (local_840 != &local_830) {
          operator_delete(local_840);
        }
        if (local_6a0 != &local_690) {
          operator_delete(local_6a0);
        }
        if (local_820 != &local_810) {
          operator_delete(local_820);
        }
        if (local_7c0 != &local_7b0) {
          operator_delete(local_7c0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_740._M_dataplus._M_p != &local_740.field_2) {
          operator_delete(local_740._M_dataplus._M_p);
        }
        if (local_800 != &local_7f0) {
          operator_delete(local_800);
        }
        if (local_760 != &local_750) {
          operator_delete(local_760);
        }
        if (local_6e0 != &local_6d0) {
          operator_delete(local_6e0);
        }
        if (local_720 != &local_710) {
          operator_delete(local_720);
        }
        if (local_700 != &local_6f0) {
          operator_delete(local_700);
        }
      }
      if (local_600 != &local_5f0) {
        operator_delete(local_600);
      }
    }
    uVar24 = uVar24 + 1;
  }
  local_600 = &local_5f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_600,local_860,local_858 + (long)local_860);
  puVar20 = local_280;
  if (local_7d8 != 0) {
    local_760 = &local_750;
    std::__cxx11::string::_M_construct((ulong)&local_760,'\x06');
    puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_760);
    local_800 = &local_7f0;
    puVar23 = puVar16 + 2;
    if ((ulong *)*puVar16 == puVar23) {
      local_7f0 = *puVar23;
      lStack_7e8 = puVar16[3];
    }
    else {
      local_7f0 = *puVar23;
      local_800 = (ulong *)*puVar16;
    }
    local_7f8 = puVar16[1];
    *puVar16 = puVar23;
    puVar16[1] = 0;
    *(undefined1 *)(puVar16 + 2) = 0;
    cVar25 = '\x01';
    if (9 < puVar20) {
      puVar23 = puVar20;
      cVar12 = '\x04';
      do {
        cVar25 = cVar12;
        if (puVar23 < 100) {
          cVar25 = cVar25 + -2;
          goto LAB_00173896;
        }
        if (puVar23 < 1000) {
          cVar25 = cVar25 + -1;
          goto LAB_00173896;
        }
        if (puVar23 < 10000) goto LAB_00173896;
        bVar13 = 99999 < puVar23;
        puVar23 = (ulong *)((ulong)puVar23 / 10000);
        cVar12 = cVar25 + '\x04';
      } while (bVar13);
      cVar25 = cVar25 + '\x01';
    }
LAB_00173896:
    local_720 = &local_710;
    std::__cxx11::string::_M_construct((ulong)&local_720,cVar25);
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)local_720,(uint)local_718,(unsigned_long)puVar20);
    uVar24 = 0xf;
    if (local_800 != &local_7f0) {
      uVar24 = local_7f0;
    }
    if (uVar24 < (ulong)(local_718 + local_7f8)) {
      uVar24 = 0xf;
      if (local_720 != &local_710) {
        uVar24 = local_710;
      }
      if (uVar24 < (ulong)(local_718 + local_7f8)) goto LAB_0017391c;
      puVar16 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_720,0,(char *)0x0,(ulong)local_800);
    }
    else {
LAB_0017391c:
      puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_800,(ulong)local_720);
    }
    local_7c0 = &local_7b0;
    puVar23 = puVar16 + 2;
    if ((ulong *)*puVar16 == puVar23) {
      local_7b0 = *puVar23;
      lStack_7a8 = puVar16[3];
    }
    else {
      local_7b0 = *puVar23;
      local_7c0 = (ulong *)*puVar16;
    }
    local_7b8 = puVar16[1];
    *puVar16 = puVar23;
    puVar16[1] = 0;
    *(undefined1 *)puVar23 = 0;
    puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_7c0);
    local_820 = &local_810;
    puVar23 = puVar16 + 2;
    if ((ulong *)*puVar16 == puVar23) {
      local_810 = *puVar23;
      lStack_808 = puVar16[3];
    }
    else {
      local_810 = *puVar23;
      local_820 = (ulong *)*puVar16;
    }
    local_818 = puVar16[1];
    *puVar16 = puVar23;
    puVar16[1] = 0;
    *(undefined1 *)(puVar16 + 2) = 0;
    local_700 = &local_6f0;
    std::__cxx11::string::_M_construct((ulong)&local_700,'\x06');
    uVar24 = 0xf;
    if (local_820 != &local_810) {
      uVar24 = local_810;
    }
    if (uVar24 < (ulong)(local_6f8 + local_818)) {
      uVar24 = 0xf;
      if (local_700 != &local_6f0) {
        uVar24 = local_6f0;
      }
      if (uVar24 < (ulong)(local_6f8 + local_818)) goto LAB_00173a67;
      puVar16 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_700,0,(char *)0x0,(ulong)local_820);
    }
    else {
LAB_00173a67:
      puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_820,(ulong)local_700);
    }
    local_840 = &local_830;
    puVar23 = puVar16 + 2;
    if ((ulong *)*puVar16 == puVar23) {
      local_830 = *puVar23;
      lStack_828 = puVar16[3];
    }
    else {
      local_830 = *puVar23;
      local_840 = (ulong *)*puVar16;
    }
    local_838 = puVar16[1];
    *puVar16 = puVar23;
    puVar16[1] = 0;
    *(undefined1 *)puVar23 = 0;
    puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_840);
    local_7a0 = &local_790;
    puVar23 = puVar16 + 2;
    if ((ulong *)*puVar16 == puVar23) {
      local_790 = *puVar23;
      lStack_788 = puVar16[3];
    }
    else {
      local_790 = *puVar23;
      local_7a0 = (ulong *)*puVar16;
    }
    local_798 = puVar16[1];
    *puVar16 = puVar23;
    puVar16[1] = 0;
    *(undefined1 *)(puVar16 + 2) = 0;
    puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_7a0,(ulong)local_7e0);
    local_780 = &local_770;
    puVar23 = puVar16 + 2;
    if ((ulong *)*puVar16 == puVar23) {
      local_770 = *puVar23;
      lStack_768 = puVar16[3];
    }
    else {
      local_770 = *puVar23;
      local_780 = (ulong *)*puVar16;
    }
    local_778 = puVar16[1];
    *puVar16 = puVar23;
    puVar16[1] = 0;
    *(undefined1 *)(puVar16 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_600,(ulong)local_780);
    if (local_780 != &local_770) {
      operator_delete(local_780);
    }
    if (local_7a0 != &local_790) {
      operator_delete(local_7a0);
    }
    if (local_840 != &local_830) {
      operator_delete(local_840);
    }
    if (local_700 != &local_6f0) {
      operator_delete(local_700);
    }
    if (local_820 != &local_810) {
      operator_delete(local_820);
    }
    if (local_7c0 != &local_7b0) {
      operator_delete(local_7c0);
    }
    if (local_720 != &local_710) {
      operator_delete(local_720);
    }
    if (local_800 != &local_7f0) {
      operator_delete(local_800);
    }
    if (local_760 != &local_750) {
      operator_delete(local_760);
    }
  }
  local_238 = &local_228;
  std::__cxx11::string::_M_construct((ulong)&local_238,'\x06');
  plVar15 = (long *)std::__cxx11::string::replace((ulong)&local_238,0,(char *)0x0,0x2b2de1);
  local_300 = &local_2f0;
  puVar23 = (ulong *)(plVar15 + 2);
  if ((ulong *)*plVar15 == puVar23) {
    local_2f0 = *puVar23;
    lStack_2e8 = plVar15[3];
  }
  else {
    local_2f0 = *puVar23;
    local_300 = (ulong *)*plVar15;
  }
  local_2f8 = plVar15[1];
  *plVar15 = (long)puVar23;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  plVar15 = (long *)std::__cxx11::string::append((char *)&local_300);
  local_258 = &local_248;
  puVar23 = (ulong *)(plVar15 + 2);
  if ((ulong *)*plVar15 == puVar23) {
    local_248 = *puVar23;
    lStack_240 = plVar15[3];
  }
  else {
    local_248 = *puVar23;
    local_258 = (ulong *)*plVar15;
  }
  local_250 = plVar15[1];
  *plVar15 = (long)puVar23;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  local_340 = &local_330;
  std::__cxx11::string::_M_construct((ulong)&local_340,'\x06');
  uVar24 = 0xf;
  if (local_258 != &local_248) {
    uVar24 = local_248;
  }
  if (uVar24 < (ulong)(local_338 + local_250)) {
    uVar24 = 0xf;
    if (local_340 != &local_330) {
      uVar24 = local_330;
    }
    if (uVar24 < (ulong)(local_338 + local_250)) goto LAB_00173e18;
    puVar16 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_340,0,(char *)0x0,(ulong)local_258);
  }
  else {
LAB_00173e18:
    puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_340);
  }
  local_3c0 = &local_3b0;
  puVar23 = puVar16 + 2;
  if ((ulong *)*puVar16 == puVar23) {
    local_3b0 = *puVar23;
    lStack_3a8 = puVar16[3];
  }
  else {
    local_3b0 = *puVar23;
    local_3c0 = (ulong *)*puVar16;
  }
  local_3b8 = puVar16[1];
  *puVar16 = puVar23;
  puVar16[1] = 0;
  *(undefined1 *)puVar23 = 0;
  plVar15 = (long *)std::__cxx11::string::append((char *)&local_3c0);
  local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
  puVar23 = (ulong *)(plVar15 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar15 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar23) {
    local_320.field_2._M_allocated_capacity = *puVar23;
    local_320.field_2._8_8_ = plVar15[3];
  }
  else {
    local_320.field_2._M_allocated_capacity = *puVar23;
    local_320._M_dataplus._M_p = (pointer)*plVar15;
  }
  local_320._M_string_length = plVar15[1];
  *plVar15 = (long)puVar23;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  local_2e0 = &local_2d0;
  std::__cxx11::string::_M_construct((ulong)&local_2e0,'\x06');
  uVar26 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    uVar26 = local_320.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar26 < local_2d8 + local_320._M_string_length) {
    uVar24 = 0xf;
    if (local_2e0 != &local_2d0) {
      uVar24 = local_2d0;
    }
    if (uVar24 < local_2d8 + local_320._M_string_length) goto LAB_00173f81;
    puVar16 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_2e0,0,(char *)0x0,(ulong)local_320._M_dataplus._M_p);
  }
  else {
LAB_00173f81:
    puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_320,(ulong)local_2e0);
  }
  local_640 = &local_630;
  puVar23 = puVar16 + 2;
  if ((ulong *)*puVar16 == puVar23) {
    local_630 = *puVar23;
    lStack_628 = puVar16[3];
  }
  else {
    local_630 = *puVar23;
    local_640 = (ulong *)*puVar16;
  }
  local_638 = puVar16[1];
  *puVar16 = puVar23;
  puVar16[1] = 0;
  *(undefined1 *)puVar23 = 0;
  plVar15 = (long *)std::__cxx11::string::append((char *)&local_640);
  local_620 = &local_610;
  puVar23 = (ulong *)(plVar15 + 2);
  if ((ulong *)*plVar15 == puVar23) {
    local_610 = *puVar23;
    lStack_608 = plVar15[3];
  }
  else {
    local_610 = *puVar23;
    local_620 = (ulong *)*plVar15;
  }
  local_618 = plVar15[1];
  *plVar15 = (long)puVar23;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  local_218 = local_208;
  std::__cxx11::string::_M_construct((ulong)&local_218,'\x06');
  uVar24 = CONCAT44(uStack_20c,local_210) + local_618;
  uVar29 = 0xf;
  if (local_620 != &local_610) {
    uVar29 = local_610;
  }
  if (uVar29 < uVar24) {
    uVar29 = 0xf;
    if (local_218 != local_208) {
      uVar29 = local_208[0];
    }
    if (uVar29 < uVar24) goto LAB_001740ea;
    puVar16 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_218,0,(char *)0x0,(ulong)local_620);
  }
  else {
LAB_001740ea:
    puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_620,(ulong)local_218);
  }
  local_4a0 = &local_490;
  puVar23 = puVar16 + 2;
  if ((ulong *)*puVar16 == puVar23) {
    local_490 = *puVar23;
    lStack_488 = puVar16[3];
  }
  else {
    local_490 = *puVar23;
    local_4a0 = (ulong *)*puVar16;
  }
  local_498 = puVar16[1];
  *puVar16 = puVar23;
  puVar16[1] = 0;
  *(undefined1 *)puVar23 = 0;
  plVar15 = (long *)std::__cxx11::string::append((char *)&local_4a0);
  local_4c0 = &local_4b0;
  puVar23 = (ulong *)(plVar15 + 2);
  if ((ulong *)*plVar15 == puVar23) {
    local_4b0 = *puVar23;
    lStack_4a8 = plVar15[3];
  }
  else {
    local_4b0 = *puVar23;
    local_4c0 = (ulong *)*plVar15;
  }
  local_4b8 = plVar15[1];
  *plVar15 = (long)puVar23;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  local_2a0 = local_290;
  std::__cxx11::string::_M_construct((ulong)&local_2a0,'\t');
  uVar24 = CONCAT44(uStack_294,local_298) + local_4b8;
  uVar29 = 0xf;
  if (local_4c0 != &local_4b0) {
    uVar29 = local_4b0;
  }
  if (uVar29 < uVar24) {
    uVar29 = 0xf;
    if (local_2a0 != local_290) {
      uVar29 = local_290[0];
    }
    if (uVar29 < uVar24) goto LAB_00174253;
    puVar16 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_2a0,0,(char *)0x0,(ulong)local_4c0);
  }
  else {
LAB_00174253:
    puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_4c0,(ulong)local_2a0);
  }
  local_500 = &local_4f0;
  puVar23 = puVar16 + 2;
  if ((ulong *)*puVar16 == puVar23) {
    local_4f0 = *puVar23;
    lStack_4e8 = puVar16[3];
  }
  else {
    local_4f0 = *puVar23;
    local_500 = (ulong *)*puVar16;
  }
  local_4f8 = puVar16[1];
  *puVar16 = puVar23;
  puVar16[1] = 0;
  *(undefined1 *)puVar23 = 0;
  puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_500);
  puVar23 = puVar16 + 2;
  if ((ulong *)*puVar16 == puVar23) {
    local_6b0 = *puVar23;
    uStack_6a8 = puVar16[3];
    local_6c0 = &local_6b0;
  }
  else {
    local_6b0 = *puVar23;
    local_6c0 = (ulong *)*puVar16;
  }
  local_6b8 = puVar16[1];
  *puVar16 = puVar23;
  puVar16[1] = 0;
  *(undefined1 *)(puVar16 + 2) = 0;
  local_2c0 = local_2b0;
  std::__cxx11::string::_M_construct((ulong)&local_2c0,'\t');
  uVar24 = CONCAT44(uStack_2b4,local_2b8) + local_6b8;
  uVar29 = 0xf;
  if (local_6c0 != &local_6b0) {
    uVar29 = local_6b0;
  }
  if (uVar29 < uVar24) {
    uVar29 = 0xf;
    if (local_2c0 != local_2b0) {
      uVar29 = local_2b0[0];
    }
    if (uVar29 < uVar24) goto LAB_001743ae;
    puVar16 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_2c0,0,(char *)0x0,(ulong)local_6c0);
  }
  else {
LAB_001743ae:
    puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_6c0,(ulong)local_2c0);
  }
  puVar23 = puVar16 + 2;
  if ((ulong *)*puVar16 == puVar23) {
    local_350 = *puVar23;
    uStack_348 = puVar16[3];
    local_360 = &local_350;
  }
  else {
    local_350 = *puVar23;
    local_360 = (ulong *)*puVar16;
  }
  local_358 = puVar16[1];
  *puVar16 = puVar23;
  puVar16[1] = 0;
  *(undefined1 *)puVar23 = 0;
  plVar15 = (long *)std::__cxx11::string::append((char *)&local_360);
  local_480 = &local_470;
  puVar23 = (ulong *)(plVar15 + 2);
  if ((ulong *)*plVar15 == puVar23) {
    local_470 = *puVar23;
    lStack_468 = plVar15[3];
  }
  else {
    local_470 = *puVar23;
    local_480 = (ulong *)*plVar15;
  }
  local_478 = plVar15[1];
  *plVar15 = (long)puVar23;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  local_278 = local_268;
  std::__cxx11::string::_M_construct((ulong)&local_278,'\f');
  uVar24 = CONCAT44(uStack_26c,local_270) + local_478;
  uVar29 = 0xf;
  if (local_480 != &local_470) {
    uVar29 = local_470;
  }
  if (uVar29 < uVar24) {
    uVar29 = 0xf;
    if (local_278 != local_268) {
      uVar29 = local_268[0];
    }
    if (uVar29 < uVar24) goto LAB_00174510;
    puVar16 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_278,0,(char *)0x0,(ulong)local_480);
  }
  else {
LAB_00174510:
    puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_480,(ulong)local_278);
  }
  local_460 = &local_450;
  puVar23 = puVar16 + 2;
  if ((ulong *)*puVar16 == puVar23) {
    local_450 = *puVar23;
    lStack_448 = puVar16[3];
  }
  else {
    local_450 = *puVar23;
    local_460 = (ulong *)*puVar16;
  }
  local_458 = puVar16[1];
  *puVar16 = puVar23;
  puVar16[1] = 0;
  *(undefined1 *)puVar23 = 0;
  plVar15 = (long *)std::__cxx11::string::append((char *)&local_460);
  local_3a0 = &local_390;
  puVar23 = (ulong *)(plVar15 + 2);
  if ((ulong *)*plVar15 == puVar23) {
    local_390 = *puVar23;
    lStack_388 = plVar15[3];
  }
  else {
    local_390 = *puVar23;
    local_3a0 = (ulong *)*plVar15;
  }
  local_398 = plVar15[1];
  *plVar15 = (long)puVar23;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  local_138 = local_128;
  std::__cxx11::string::_M_construct((ulong)&local_138,'\f');
  uVar24 = 0xf;
  if (local_3a0 != &local_390) {
    uVar24 = local_390;
  }
  if (uVar24 < (ulong)(local_130 + local_398)) {
    uVar24 = 0xf;
    if (local_138 != local_128) {
      uVar24 = local_128[0];
    }
    if (uVar24 < (ulong)(local_130 + local_398)) goto LAB_00174679;
    puVar16 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,(ulong)local_3a0);
  }
  else {
LAB_00174679:
    puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_3a0,(ulong)local_138);
  }
  local_400 = &local_3f0;
  puVar23 = puVar16 + 2;
  if ((ulong *)*puVar16 == puVar23) {
    local_3f0 = *puVar23;
    lStack_3e8 = puVar16[3];
  }
  else {
    local_3f0 = *puVar23;
    local_400 = (ulong *)*puVar16;
  }
  local_3f8 = puVar16[1];
  *puVar16 = puVar23;
  puVar16[1] = 0;
  *(undefined1 *)puVar23 = 0;
  plVar15 = (long *)std::__cxx11::string::append((char *)&local_400);
  local_3e0 = &local_3d0;
  puVar23 = (ulong *)(plVar15 + 2);
  if ((ulong *)*plVar15 == puVar23) {
    local_3d0 = *puVar23;
    lStack_3c8 = plVar15[3];
  }
  else {
    local_3d0 = *puVar23;
    local_3e0 = (ulong *)*plVar15;
  }
  local_3d8 = plVar15[1];
  *plVar15 = (long)puVar23;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  local_158 = local_148;
  std::__cxx11::string::_M_construct((ulong)&local_158,'\t');
  uVar24 = 0xf;
  if (local_3e0 != &local_3d0) {
    uVar24 = local_3d0;
  }
  if (uVar24 < (ulong)(local_150 + local_3d8)) {
    uVar24 = 0xf;
    if (local_158 != local_148) {
      uVar24 = local_148[0];
    }
    if (uVar24 < (ulong)(local_150 + local_3d8)) goto LAB_001747e2;
    puVar16 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_158,0,(char *)0x0,(ulong)local_3e0);
  }
  else {
LAB_001747e2:
    puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_3e0,(ulong)local_158);
  }
  local_380 = &local_370;
  puVar23 = puVar16 + 2;
  if ((ulong *)*puVar16 == puVar23) {
    local_370 = *puVar23;
    lStack_368 = puVar16[3];
  }
  else {
    local_370 = *puVar23;
    local_380 = (ulong *)*puVar16;
  }
  local_378 = puVar16[1];
  *puVar16 = puVar23;
  puVar16[1] = 0;
  *(undefined1 *)puVar23 = 0;
  plVar15 = (long *)std::__cxx11::string::append((char *)&local_380);
  local_560 = &local_550;
  puVar23 = (ulong *)(plVar15 + 2);
  if ((ulong *)*plVar15 == puVar23) {
    local_550 = *puVar23;
    lStack_548 = plVar15[3];
  }
  else {
    local_550 = *puVar23;
    local_560 = (ulong *)*plVar15;
  }
  local_558 = plVar15[1];
  *plVar15 = (long)puVar23;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  local_178 = local_168;
  std::__cxx11::string::_M_construct((ulong)&local_178,'\x06');
  uVar24 = 0xf;
  if (local_560 != &local_550) {
    uVar24 = local_550;
  }
  if (uVar24 < (ulong)(local_170 + local_558)) {
    uVar24 = 0xf;
    if (local_178 != local_168) {
      uVar24 = local_168[0];
    }
    if (uVar24 < (ulong)(local_170 + local_558)) goto LAB_0017494b;
    puVar16 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_178,0,(char *)0x0,(ulong)local_560);
  }
  else {
LAB_0017494b:
    puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_560,(ulong)local_178);
  }
  local_4e0 = &local_4d0;
  puVar23 = puVar16 + 2;
  if ((ulong *)*puVar16 == puVar23) {
    local_4d0 = *puVar23;
    lStack_4c8 = puVar16[3];
  }
  else {
    local_4d0 = *puVar23;
    local_4e0 = (ulong *)*puVar16;
  }
  local_4d8 = puVar16[1];
  *puVar16 = puVar23;
  puVar16[1] = 0;
  *(undefined1 *)puVar23 = 0;
  plVar15 = (long *)std::__cxx11::string::append((char *)&local_4e0);
  local_440 = &local_430;
  puVar23 = (ulong *)(plVar15 + 2);
  if ((ulong *)*plVar15 == puVar23) {
    local_430 = *puVar23;
    lStack_428 = plVar15[3];
  }
  else {
    local_430 = *puVar23;
    local_440 = (ulong *)*plVar15;
  }
  local_438 = plVar15[1];
  *plVar15 = (long)puVar23;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  local_198 = local_188;
  std::__cxx11::string::_M_construct((ulong)&local_198,'\x06');
  uVar24 = 0xf;
  if (local_440 != &local_430) {
    uVar24 = local_430;
  }
  if (uVar24 < (ulong)(local_190 + local_438)) {
    uVar24 = 0xf;
    if (local_198 != local_188) {
      uVar24 = local_188[0];
    }
    if (uVar24 < (ulong)(local_190 + local_438)) goto LAB_00174ab4;
    puVar16 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_198,0,(char *)0x0,(ulong)local_440);
  }
  else {
LAB_00174ab4:
    puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_440,(ulong)local_198);
  }
  local_5a0 = &local_590;
  puVar23 = puVar16 + 2;
  if ((ulong *)*puVar16 == puVar23) {
    local_590 = *puVar23;
    lStack_588 = puVar16[3];
  }
  else {
    local_590 = *puVar23;
    local_5a0 = (ulong *)*puVar16;
  }
  local_598 = puVar16[1];
  *puVar16 = puVar23;
  puVar16[1] = 0;
  *(undefined1 *)puVar23 = 0;
  plVar15 = (long *)std::__cxx11::string::append((char *)&local_5a0);
  local_420 = &local_410;
  puVar23 = (ulong *)(plVar15 + 2);
  if ((ulong *)*plVar15 == puVar23) {
    local_410 = *puVar23;
    lStack_408 = plVar15[3];
  }
  else {
    local_410 = *puVar23;
    local_420 = (ulong *)*plVar15;
  }
  local_418 = plVar15[1];
  *plVar15 = (long)puVar23;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  plVar15 = (long *)std::__cxx11::string::append((char *)&local_420);
  local_580 = &local_570;
  puVar23 = (ulong *)(plVar15 + 2);
  if ((ulong *)*plVar15 == puVar23) {
    local_570 = *puVar23;
    lStack_568 = plVar15[3];
  }
  else {
    local_570 = *puVar23;
    local_580 = (ulong *)*plVar15;
  }
  local_578 = plVar15[1];
  *plVar15 = (long)puVar23;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  plVar15 = (long *)std::__cxx11::string::append((char *)&local_580);
  local_660 = &local_650;
  puVar23 = (ulong *)(plVar15 + 2);
  if ((ulong *)*plVar15 == puVar23) {
    local_650 = *puVar23;
    lStack_648 = plVar15[3];
  }
  else {
    local_650 = *puVar23;
    local_660 = (ulong *)*plVar15;
  }
  local_658 = plVar15[1];
  *plVar15 = (long)puVar23;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  local_1b8 = local_1a8;
  std::__cxx11::string::_M_construct((ulong)&local_1b8,'\x06');
  uVar24 = 0xf;
  if (local_660 != &local_650) {
    uVar24 = local_650;
  }
  if (uVar24 < (ulong)(local_1b0 + local_658)) {
    uVar24 = 0xf;
    if (local_1b8 != local_1a8) {
      uVar24 = local_1a8[0];
    }
    if (uVar24 < (ulong)(local_1b0 + local_658)) goto LAB_00174ce7;
    puVar16 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_1b8,0,(char *)0x0,(ulong)local_660);
  }
  else {
LAB_00174ce7:
    puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_660,(ulong)local_1b8);
  }
  local_680 = &local_670;
  puVar23 = puVar16 + 2;
  if ((ulong *)*puVar16 == puVar23) {
    local_670 = *puVar23;
    lStack_668 = puVar16[3];
  }
  else {
    local_670 = *puVar23;
    local_680 = (ulong *)*puVar16;
  }
  local_678 = puVar16[1];
  *puVar16 = puVar23;
  puVar16[1] = 0;
  *(undefined1 *)puVar23 = 0;
  plVar15 = (long *)std::__cxx11::string::append((char *)&local_680);
  local_6a0 = &local_690;
  puVar23 = (ulong *)(plVar15 + 2);
  if ((ulong *)*plVar15 == puVar23) {
    local_690 = *puVar23;
    lStack_688 = plVar15[3];
  }
  else {
    local_690 = *puVar23;
    local_6a0 = (ulong *)*plVar15;
  }
  local_698 = plVar15[1];
  *plVar15 = (long)puVar23;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  local_1d8 = local_1c8;
  std::__cxx11::string::_M_construct((ulong)&local_1d8,'\x06');
  uVar24 = 0xf;
  if (local_6a0 != &local_690) {
    uVar24 = local_690;
  }
  if (uVar24 < (ulong)(local_1d0 + local_698)) {
    uVar24 = 0xf;
    if (local_1d8 != local_1c8) {
      uVar24 = local_1c8[0];
    }
    if (uVar24 < (ulong)(local_1d0 + local_698)) goto LAB_00174e50;
    puVar16 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,(ulong)local_6a0);
  }
  else {
LAB_00174e50:
    puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_6a0,(ulong)local_1d8);
  }
  local_740._M_dataplus._M_p = (pointer)&local_740.field_2;
  psVar19 = puVar16 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar16 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar19) {
    local_740.field_2._M_allocated_capacity = *psVar19;
    local_740.field_2._8_8_ = puVar16[3];
  }
  else {
    local_740.field_2._M_allocated_capacity = *psVar19;
    local_740._M_dataplus._M_p = (pointer)*puVar16;
  }
  local_740._M_string_length = puVar16[1];
  *puVar16 = psVar19;
  puVar16[1] = 0;
  *(undefined1 *)psVar19 = 0;
  plVar15 = (long *)std::__cxx11::string::append((char *)&local_740);
  local_6e0 = &local_6d0;
  puVar23 = (ulong *)(plVar15 + 2);
  if ((ulong *)*plVar15 == puVar23) {
    local_6d0 = *puVar23;
    lStack_6c8 = plVar15[3];
  }
  else {
    local_6d0 = *puVar23;
    local_6e0 = (ulong *)*plVar15;
  }
  local_6d8 = plVar15[1];
  *plVar15 = (long)puVar23;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  plVar15 = (long *)std::__cxx11::string::append((char *)&local_6e0);
  local_700 = &local_6f0;
  puVar23 = (ulong *)(plVar15 + 2);
  if ((ulong *)*plVar15 == puVar23) {
    local_6f0 = *puVar23;
    lStack_6e8 = plVar15[3];
  }
  else {
    local_6f0 = *puVar23;
    local_700 = (ulong *)*plVar15;
  }
  local_6f8 = plVar15[1];
  *plVar15 = (long)puVar23;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  plVar15 = (long *)std::__cxx11::string::append((char *)&local_700);
  local_720 = &local_710;
  puVar23 = (ulong *)(plVar15 + 2);
  if ((ulong *)*plVar15 == puVar23) {
    local_710 = *puVar23;
    lStack_708 = plVar15[3];
  }
  else {
    local_710 = *puVar23;
    local_720 = (ulong *)*plVar15;
  }
  local_718 = plVar15[1];
  *plVar15 = (long)puVar23;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  plVar15 = (long *)std::__cxx11::string::append((char *)&local_720);
  local_760 = &local_750;
  puVar23 = (ulong *)(plVar15 + 2);
  if ((ulong *)*plVar15 == puVar23) {
    local_750 = *puVar23;
    lStack_748 = plVar15[3];
  }
  else {
    local_750 = *puVar23;
    local_760 = (ulong *)*plVar15;
  }
  local_758 = plVar15[1];
  *plVar15 = (long)puVar23;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  plVar15 = (long *)std::__cxx11::string::append((char *)&local_760);
  local_800 = &local_7f0;
  puVar23 = (ulong *)(plVar15 + 2);
  if ((ulong *)*plVar15 == puVar23) {
    local_7f0 = *puVar23;
    lStack_7e8 = plVar15[3];
  }
  else {
    local_7f0 = *puVar23;
    local_800 = (ulong *)*plVar15;
  }
  local_7f8 = plVar15[1];
  *plVar15 = (long)puVar23;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  plVar15 = (long *)std::__cxx11::string::append((char *)&local_800);
  local_7c0 = &local_7b0;
  puVar23 = (ulong *)(plVar15 + 2);
  if ((ulong *)*plVar15 == puVar23) {
    local_7b0 = *puVar23;
    lStack_7a8 = plVar15[3];
  }
  else {
    local_7b0 = *puVar23;
    local_7c0 = (ulong *)*plVar15;
  }
  local_7b8 = plVar15[1];
  *plVar15 = (long)puVar23;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_7c0);
  local_820 = &local_810;
  puVar23 = puVar16 + 2;
  if ((ulong *)*puVar16 == puVar23) {
    local_810 = *puVar23;
    lStack_808 = puVar16[3];
  }
  else {
    local_810 = *puVar23;
    local_820 = (ulong *)*puVar16;
  }
  local_818 = puVar16[1];
  *puVar16 = puVar23;
  puVar16[1] = 0;
  *(undefined1 *)(puVar16 + 2) = 0;
  plVar15 = (long *)std::__cxx11::string::append((char *)&local_820);
  local_840 = &local_830;
  puVar23 = (ulong *)(plVar15 + 2);
  if ((ulong *)*plVar15 == puVar23) {
    local_830 = *puVar23;
    lStack_828 = plVar15[3];
  }
  else {
    local_830 = *puVar23;
    local_840 = (ulong *)*plVar15;
  }
  local_838 = plVar15[1];
  *plVar15 = (long)puVar23;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  local_1f8 = local_1e8;
  std::__cxx11::string::_M_construct((ulong)&local_1f8,'\x06');
  uVar24 = 0xf;
  if (local_840 != &local_830) {
    uVar24 = local_830;
  }
  if (uVar24 < (ulong)(local_1f0 + local_838)) {
    uVar24 = 0xf;
    if (local_1f8 != local_1e8) {
      uVar24 = local_1e8[0];
    }
    if (uVar24 < (ulong)(local_1f0 + local_838)) goto LAB_00175243;
    puVar16 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_1f8,0,(char *)0x0,(ulong)local_840);
  }
  else {
LAB_00175243:
    puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_840,(ulong)local_1f8);
  }
  local_7a0 = &local_790;
  puVar23 = puVar16 + 2;
  if ((ulong *)*puVar16 == puVar23) {
    local_790 = *puVar23;
    lStack_788 = puVar16[3];
  }
  else {
    local_790 = *puVar23;
    local_7a0 = (ulong *)*puVar16;
  }
  local_798 = puVar16[1];
  *puVar16 = puVar23;
  puVar16[1] = 0;
  *(undefined1 *)puVar23 = 0;
  plVar15 = (long *)std::__cxx11::string::append((char *)&local_7a0);
  local_780 = &local_770;
  puVar23 = (ulong *)(plVar15 + 2);
  if ((ulong *)*plVar15 == puVar23) {
    local_770 = *puVar23;
    lStack_768 = plVar15[3];
  }
  else {
    local_770 = *puVar23;
    local_780 = (ulong *)*plVar15;
  }
  local_778 = plVar15[1];
  *plVar15 = (long)puVar23;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_600,(ulong)local_780);
  if (local_780 != &local_770) {
    operator_delete(local_780);
  }
  if (local_7a0 != &local_790) {
    operator_delete(local_7a0);
  }
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8);
  }
  if (local_840 != &local_830) {
    operator_delete(local_840);
  }
  if (local_820 != &local_810) {
    operator_delete(local_820);
  }
  if (local_7c0 != &local_7b0) {
    operator_delete(local_7c0);
  }
  if (local_800 != &local_7f0) {
    operator_delete(local_800);
  }
  if (local_760 != &local_750) {
    operator_delete(local_760);
  }
  if (local_720 != &local_710) {
    operator_delete(local_720);
  }
  if (local_700 != &local_6f0) {
    operator_delete(local_700);
  }
  if (local_6e0 != &local_6d0) {
    operator_delete(local_6e0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_740._M_dataplus._M_p != &local_740.field_2) {
    operator_delete(local_740._M_dataplus._M_p);
  }
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8);
  }
  if (local_6a0 != &local_690) {
    operator_delete(local_6a0);
  }
  if (local_680 != &local_670) {
    operator_delete(local_680);
  }
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8);
  }
  if (local_660 != &local_650) {
    operator_delete(local_660);
  }
  if (local_580 != &local_570) {
    operator_delete(local_580);
  }
  if (local_420 != &local_410) {
    operator_delete(local_420);
  }
  if (local_5a0 != &local_590) {
    operator_delete(local_5a0);
  }
  if (local_198 != local_188) {
    operator_delete(local_198);
  }
  if (local_440 != &local_430) {
    operator_delete(local_440);
  }
  if (local_4e0 != &local_4d0) {
    operator_delete(local_4e0);
  }
  if (local_178 != local_168) {
    operator_delete(local_178);
  }
  if (local_560 != &local_550) {
    operator_delete(local_560);
  }
  if (local_380 != &local_370) {
    operator_delete(local_380);
  }
  if (local_158 != local_148) {
    operator_delete(local_158);
  }
  if (local_3e0 != &local_3d0) {
    operator_delete(local_3e0);
  }
  if (local_400 != &local_3f0) {
    operator_delete(local_400);
  }
  if (local_138 != local_128) {
    operator_delete(local_138);
  }
  if (local_3a0 != &local_390) {
    operator_delete(local_3a0);
  }
  if (local_460 != &local_450) {
    operator_delete(local_460);
  }
  if (local_278 != local_268) {
    operator_delete(local_278);
  }
  if (local_480 != &local_470) {
    operator_delete(local_480);
  }
  if (local_360 != &local_350) {
    operator_delete(local_360);
  }
  if (local_2c0 != local_2b0) {
    operator_delete(local_2c0);
  }
  if (local_6c0 != &local_6b0) {
    operator_delete(local_6c0);
  }
  if (local_500 != &local_4f0) {
    operator_delete(local_500);
  }
  if (local_2a0 != local_290) {
    operator_delete(local_2a0);
  }
  if (local_4c0 != &local_4b0) {
    operator_delete(local_4c0);
  }
  if (local_4a0 != &local_490) {
    operator_delete(local_4a0);
  }
  if (local_218 != local_208) {
    operator_delete(local_218);
  }
  if (local_620 != &local_610) {
    operator_delete(local_620);
  }
  if (local_640 != &local_630) {
    operator_delete(local_640);
  }
  if (local_2e0 != &local_2d0) {
    operator_delete(local_2e0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    operator_delete(local_320._M_dataplus._M_p);
  }
  if (local_3c0 != &local_3b0) {
    operator_delete(local_3c0);
  }
  if (local_340 != &local_330) {
    operator_delete(local_340);
  }
  if (local_258 != &local_248) {
    operator_delete(local_258);
  }
  if (local_300 != &local_2f0) {
    operator_delete(local_300);
  }
  if (local_238 != &local_228) {
    operator_delete(local_238);
  }
  local_780 = &local_770;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_780,local_540,local_538 + (long)local_540);
  if (local_518 != 0) {
    local_800 = &local_7f0;
    std::__cxx11::string::_M_construct((ulong)&local_800,'\x06');
    puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_800);
    local_7c0 = &local_7b0;
    puVar23 = puVar16 + 2;
    if ((ulong *)*puVar16 == puVar23) {
      local_7b0 = *puVar23;
      lStack_7a8 = puVar16[3];
    }
    else {
      local_7b0 = *puVar23;
      local_7c0 = (ulong *)*puVar16;
    }
    local_7b8 = puVar16[1];
    *puVar16 = puVar23;
    puVar16[1] = 0;
    *(undefined1 *)(puVar16 + 2) = 0;
    cVar25 = '\x01';
    if (9 < puVar20) {
      puVar23 = puVar20;
      cVar12 = '\x04';
      do {
        cVar25 = cVar12;
        if (puVar23 < 100) {
          cVar25 = cVar25 + -2;
          goto LAB_00175967;
        }
        if (puVar23 < 1000) {
          cVar25 = cVar25 + -1;
          goto LAB_00175967;
        }
        if (puVar23 < 10000) goto LAB_00175967;
        bVar13 = 99999 < puVar23;
        puVar23 = (ulong *)((ulong)puVar23 / 10000);
        cVar12 = cVar25 + '\x04';
      } while (bVar13);
      cVar25 = cVar25 + '\x01';
    }
LAB_00175967:
    local_760 = &local_750;
    std::__cxx11::string::_M_construct((ulong)&local_760,cVar25);
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)local_760,(uint)local_758,(unsigned_long)puVar20);
    uVar24 = 0xf;
    if (local_7c0 != &local_7b0) {
      uVar24 = local_7b0;
    }
    if (uVar24 < (ulong)(local_758 + local_7b8)) {
      uVar24 = 0xf;
      if (local_760 != &local_750) {
        uVar24 = local_750;
      }
      if (uVar24 < (ulong)(local_758 + local_7b8)) goto LAB_001759f9;
      puVar16 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_760,0,(char *)0x0,(ulong)local_7c0);
    }
    else {
LAB_001759f9:
      puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_7c0,(ulong)local_760);
    }
    local_820 = &local_810;
    puVar20 = puVar16 + 2;
    if ((ulong *)*puVar16 == puVar20) {
      local_810 = *puVar20;
      lStack_808 = puVar16[3];
    }
    else {
      local_810 = *puVar20;
      local_820 = (ulong *)*puVar16;
    }
    local_818 = puVar16[1];
    *puVar16 = puVar20;
    puVar16[1] = 0;
    *(undefined1 *)puVar20 = 0;
    puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_820);
    local_840 = &local_830;
    puVar20 = puVar16 + 2;
    if ((ulong *)*puVar16 == puVar20) {
      local_830 = *puVar20;
      lStack_828 = puVar16[3];
    }
    else {
      local_830 = *puVar20;
      local_840 = (ulong *)*puVar16;
    }
    local_838 = puVar16[1];
    *puVar16 = puVar20;
    puVar16[1] = 0;
    *(undefined1 *)(puVar16 + 2) = 0;
    puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_840,(ulong)local_520);
    local_7a0 = &local_790;
    puVar20 = puVar16 + 2;
    if ((ulong *)*puVar16 == puVar20) {
      local_790 = *puVar20;
      lStack_788 = puVar16[3];
    }
    else {
      local_790 = *puVar20;
      local_7a0 = (ulong *)*puVar16;
    }
    local_798 = puVar16[1];
    *puVar16 = puVar20;
    puVar16[1] = 0;
    *(undefined1 *)(puVar16 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_780,(ulong)local_7a0);
    if (local_7a0 != &local_790) {
      operator_delete(local_7a0);
    }
    if (local_840 != &local_830) {
      operator_delete(local_840);
    }
    if (local_820 != &local_810) {
      operator_delete(local_820);
    }
    if (local_760 != &local_750) {
      operator_delete(local_760);
    }
    if (local_7c0 != &local_7b0) {
      operator_delete(local_7c0);
    }
    if (local_800 != &local_7f0) {
      operator_delete(local_800);
    }
  }
  local_258 = &local_248;
  std::__cxx11::string::_M_construct((ulong)&local_258,'\x03');
  plVar15 = (long *)std::__cxx11::string::append((char *)&local_258);
  psVar11 = local_68;
  local_3c0 = &local_3b0;
  puVar20 = (ulong *)(plVar15 + 2);
  if ((ulong *)*plVar15 == puVar20) {
    local_3b0 = *puVar20;
    lStack_3a8 = plVar15[3];
  }
  else {
    local_3b0 = *puVar20;
    local_3c0 = (ulong *)*plVar15;
  }
  local_3b8 = plVar15[1];
  *plVar15 = (long)puVar20;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  local_300 = &local_2f0;
  std::__cxx11::string::_M_construct((ulong)&local_300,'\x03');
  uVar24 = 0xf;
  if (local_3c0 != &local_3b0) {
    uVar24 = local_3b0;
  }
  if (uVar24 < (ulong)(local_2f8 + local_3b8)) {
    uVar24 = 0xf;
    if (local_300 != &local_2f0) {
      uVar24 = local_2f0;
    }
    if (uVar24 < (ulong)(local_2f8 + local_3b8)) goto LAB_00175cfa;
    puVar16 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_300,0,(char *)0x0,(ulong)local_3c0);
  }
  else {
LAB_00175cfa:
    puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_3c0,(ulong)local_300);
  }
  local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
  puVar20 = puVar16 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar16 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar20) {
    local_320.field_2._M_allocated_capacity = *puVar20;
    local_320.field_2._8_8_ = puVar16[3];
  }
  else {
    local_320.field_2._M_allocated_capacity = *puVar20;
    local_320._M_dataplus._M_p = (pointer)*puVar16;
  }
  local_320._M_string_length = puVar16[1];
  *puVar16 = puVar20;
  puVar16[1] = 0;
  *(undefined1 *)puVar20 = 0;
  plVar15 = (long *)std::__cxx11::string::append((char *)&local_320);
  local_640 = &local_630;
  puVar20 = (ulong *)(plVar15 + 2);
  local_238 = &local_228;
  if ((ulong *)*plVar15 == puVar20) {
    local_630 = *puVar20;
    lStack_628 = plVar15[3];
  }
  else {
    local_630 = *puVar20;
    local_640 = (ulong *)*plVar15;
  }
  local_638 = plVar15[1];
  *plVar15 = (long)puVar20;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  std::__cxx11::string::_M_construct((ulong)&local_238,'\x06');
  uVar24 = 0xf;
  if (local_640 != &local_630) {
    uVar24 = local_630;
  }
  if (uVar24 < (ulong)(local_230 + local_638)) {
    uVar24 = 0xf;
    if (local_238 != &local_228) {
      uVar24 = local_228;
    }
    if (uVar24 < (ulong)(local_230 + local_638)) goto LAB_00175e63;
    puVar16 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_238,0,(char *)0x0,(ulong)local_640);
  }
  else {
LAB_00175e63:
    puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_640,(ulong)local_238);
  }
  local_620 = &local_610;
  puVar20 = puVar16 + 2;
  if ((ulong *)*puVar16 == puVar20) {
    local_610 = *puVar20;
    lStack_608 = puVar16[3];
  }
  else {
    local_610 = *puVar20;
    local_620 = (ulong *)*puVar16;
  }
  local_618 = puVar16[1];
  *puVar16 = puVar20;
  puVar16[1] = 0;
  *(undefined1 *)puVar20 = 0;
  plVar15 = (long *)std::__cxx11::string::append((char *)&local_620);
  local_4a0 = &local_490;
  puVar20 = (ulong *)(plVar15 + 2);
  if ((ulong *)*plVar15 == puVar20) {
    local_490 = *puVar20;
    lStack_488 = plVar15[3];
  }
  else {
    local_490 = *puVar20;
    local_4a0 = (ulong *)*plVar15;
  }
  local_498 = plVar15[1];
  *plVar15 = (long)puVar20;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  local_340 = &local_330;
  std::__cxx11::string::_M_construct((ulong)&local_340,'\x06');
  uVar24 = 0xf;
  if (local_4a0 != &local_490) {
    uVar24 = local_490;
  }
  if (uVar24 < (ulong)(local_338 + local_498)) {
    uVar24 = 0xf;
    if (local_340 != &local_330) {
      uVar24 = local_330;
    }
    if (uVar24 < (ulong)(local_338 + local_498)) goto LAB_00175fcc;
    puVar16 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_340,0,(char *)0x0,(ulong)local_4a0);
  }
  else {
LAB_00175fcc:
    puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_4a0,(ulong)local_340);
  }
  local_4c0 = &local_4b0;
  puVar20 = puVar16 + 2;
  if ((ulong *)*puVar16 == puVar20) {
    local_4b0 = *puVar20;
    lStack_4a8 = puVar16[3];
  }
  else {
    local_4b0 = *puVar20;
    local_4c0 = (ulong *)*puVar16;
  }
  local_4b8 = puVar16[1];
  *puVar16 = puVar20;
  puVar16[1] = 0;
  *(undefined1 *)puVar20 = 0;
  plVar15 = (long *)std::__cxx11::string::append((char *)&local_4c0);
  local_500 = &local_4f0;
  puVar20 = (ulong *)(plVar15 + 2);
  if ((ulong *)*plVar15 == puVar20) {
    local_4f0 = *puVar20;
    lStack_4e8 = plVar15[3];
  }
  else {
    local_4f0 = *puVar20;
    local_500 = (ulong *)*plVar15;
  }
  local_4f8 = plVar15[1];
  *plVar15 = (long)puVar20;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  local_2e0 = &local_2d0;
  std::__cxx11::string::_M_construct((ulong)&local_2e0,'\x06');
  uVar24 = 0xf;
  if (local_500 != &local_4f0) {
    uVar24 = local_4f0;
  }
  if (uVar24 < (ulong)(local_2d8 + local_4f8)) {
    uVar24 = 0xf;
    if (local_2e0 != &local_2d0) {
      uVar24 = local_2d0;
    }
    if (uVar24 < (ulong)(local_2d8 + local_4f8)) goto LAB_00176135;
    puVar16 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_2e0,0,(char *)0x0,(ulong)local_500);
  }
  else {
LAB_00176135:
    puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_500,(ulong)local_2e0);
  }
  puVar20 = puVar16 + 2;
  if ((ulong *)*puVar16 == puVar20) {
    local_6b0 = *puVar20;
    uStack_6a8 = puVar16[3];
    local_6c0 = &local_6b0;
  }
  else {
    local_6b0 = *puVar20;
    local_6c0 = (ulong *)*puVar16;
  }
  local_6b8 = puVar16[1];
  *puVar16 = puVar20;
  puVar16[1] = 0;
  *(undefined1 *)puVar20 = 0;
  puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_6c0);
  puVar20 = puVar16 + 2;
  if ((ulong *)*puVar16 == puVar20) {
    local_350 = *puVar20;
    uStack_348 = puVar16[3];
    local_360 = &local_350;
  }
  else {
    local_350 = *puVar20;
    local_360 = (ulong *)*puVar16;
  }
  local_358 = puVar16[1];
  *puVar16 = puVar20;
  puVar16[1] = 0;
  *(undefined1 *)(puVar16 + 2) = 0;
  local_218 = local_208;
  std::__cxx11::string::_M_construct((ulong)&local_218,'\x06');
  uVar24 = CONCAT44(uStack_20c,local_210) + local_358;
  uVar29 = 0xf;
  if (local_360 != &local_350) {
    uVar29 = local_350;
  }
  if (uVar29 < uVar24) {
    uVar29 = 0xf;
    if (local_218 != local_208) {
      uVar29 = local_208[0];
    }
    if (uVar29 < uVar24) goto LAB_00176289;
    puVar16 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_218,0,(char *)0x0,(ulong)local_360);
  }
  else {
LAB_00176289:
    puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_360,(ulong)local_218);
  }
  local_480 = &local_470;
  puVar20 = puVar16 + 2;
  if ((ulong *)*puVar16 == puVar20) {
    local_470 = *puVar20;
    lStack_468 = puVar16[3];
  }
  else {
    local_470 = *puVar20;
    local_480 = (ulong *)*puVar16;
  }
  local_478 = puVar16[1];
  *puVar16 = puVar20;
  puVar16[1] = 0;
  *(undefined1 *)puVar20 = 0;
  plVar15 = (long *)std::__cxx11::string::append((char *)&local_480);
  local_460 = &local_450;
  puVar20 = (ulong *)(plVar15 + 2);
  if ((ulong *)*plVar15 == puVar20) {
    local_450 = *puVar20;
    lStack_448 = plVar15[3];
  }
  else {
    local_450 = *puVar20;
    local_460 = (ulong *)*plVar15;
  }
  local_458 = plVar15[1];
  *plVar15 = (long)puVar20;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  local_2a0 = local_290;
  std::__cxx11::string::_M_construct((ulong)&local_2a0,'\x06');
  uVar24 = CONCAT44(uStack_294,local_298) + local_458;
  uVar29 = 0xf;
  if (local_460 != &local_450) {
    uVar29 = local_450;
  }
  if (uVar29 < uVar24) {
    uVar29 = 0xf;
    if (local_2a0 != local_290) {
      uVar29 = local_290[0];
    }
    if (uVar29 < uVar24) goto LAB_001763f2;
    puVar16 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_2a0,0,(char *)0x0,(ulong)local_460);
  }
  else {
LAB_001763f2:
    puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_460,(ulong)local_2a0);
  }
  local_3a0 = &local_390;
  puVar20 = puVar16 + 2;
  if ((ulong *)*puVar16 == puVar20) {
    local_390 = *puVar20;
    lStack_388 = puVar16[3];
  }
  else {
    local_390 = *puVar20;
    local_3a0 = (ulong *)*puVar16;
  }
  local_398 = puVar16[1];
  *puVar16 = puVar20;
  puVar16[1] = 0;
  *(undefined1 *)puVar20 = 0;
  plVar15 = (long *)std::__cxx11::string::append((char *)&local_3a0);
  local_400 = &local_3f0;
  puVar20 = (ulong *)(plVar15 + 2);
  if ((ulong *)*plVar15 == puVar20) {
    local_3f0 = *puVar20;
    lStack_3e8 = plVar15[3];
  }
  else {
    local_3f0 = *puVar20;
    local_400 = (ulong *)*plVar15;
  }
  local_3f8 = plVar15[1];
  *plVar15 = (long)puVar20;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  local_2c0 = local_2b0;
  std::__cxx11::string::_M_construct((ulong)&local_2c0,'\x06');
  uVar24 = CONCAT44(uStack_2b4,local_2b8) + local_3f8;
  uVar29 = 0xf;
  if (local_400 != &local_3f0) {
    uVar29 = local_3f0;
  }
  if (uVar29 < uVar24) {
    uVar29 = 0xf;
    if (local_2c0 != local_2b0) {
      uVar29 = local_2b0[0];
    }
    if (uVar29 < uVar24) goto LAB_0017655b;
    puVar16 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_2c0,0,(char *)0x0,(ulong)local_400);
  }
  else {
LAB_0017655b:
    puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_400,(ulong)local_2c0);
  }
  local_3e0 = &local_3d0;
  puVar20 = puVar16 + 2;
  if ((ulong *)*puVar16 == puVar20) {
    local_3d0 = *puVar20;
    lStack_3c8 = puVar16[3];
  }
  else {
    local_3d0 = *puVar20;
    local_3e0 = (ulong *)*puVar16;
  }
  local_3d8 = puVar16[1];
  *puVar16 = puVar20;
  puVar16[1] = 0;
  *(undefined1 *)puVar20 = 0;
  plVar15 = (long *)std::__cxx11::string::append((char *)&local_3e0);
  local_380 = &local_370;
  puVar20 = (ulong *)(plVar15 + 2);
  if ((ulong *)*plVar15 == puVar20) {
    local_370 = *puVar20;
    lStack_368 = plVar15[3];
  }
  else {
    local_370 = *puVar20;
    local_380 = (ulong *)*plVar15;
  }
  local_378 = plVar15[1];
  *plVar15 = (long)puVar20;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  plVar15 = (long *)std::__cxx11::string::append((char *)&local_380);
  local_560 = &local_550;
  puVar20 = (ulong *)(plVar15 + 2);
  if ((ulong *)*plVar15 == puVar20) {
    local_550 = *puVar20;
    lStack_548 = plVar15[3];
  }
  else {
    local_550 = *puVar20;
    local_560 = (ulong *)*plVar15;
  }
  local_558 = plVar15[1];
  *plVar15 = (long)puVar20;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  local_278 = local_268;
  std::__cxx11::string::_M_construct((ulong)&local_278,'\x06');
  uVar24 = CONCAT44(uStack_26c,local_270) + local_558;
  uVar29 = 0xf;
  if (local_560 != &local_550) {
    uVar29 = local_550;
  }
  if (uVar29 < uVar24) {
    uVar29 = 0xf;
    if (local_278 != local_268) {
      uVar29 = local_268[0];
    }
    if (uVar29 < uVar24) goto LAB_00176729;
    puVar16 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_278,0,(char *)0x0,(ulong)local_560);
  }
  else {
LAB_00176729:
    puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_560,(ulong)local_278);
  }
  local_4e0 = &local_4d0;
  puVar20 = puVar16 + 2;
  if ((ulong *)*puVar16 == puVar20) {
    local_4d0 = *puVar20;
    lStack_4c8 = puVar16[3];
  }
  else {
    local_4d0 = *puVar20;
    local_4e0 = (ulong *)*puVar16;
  }
  local_4d8 = puVar16[1];
  *puVar16 = puVar20;
  puVar16[1] = 0;
  *(undefined1 *)puVar20 = 0;
  plVar15 = (long *)std::__cxx11::string::append((char *)&local_4e0);
  local_440 = &local_430;
  puVar20 = (ulong *)(plVar15 + 2);
  if ((ulong *)*plVar15 == puVar20) {
    local_430 = *puVar20;
    lStack_428 = plVar15[3];
  }
  else {
    local_430 = *puVar20;
    local_440 = (ulong *)*plVar15;
  }
  local_438 = plVar15[1];
  *plVar15 = (long)puVar20;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  local_138 = local_128;
  std::__cxx11::string::_M_construct((ulong)&local_138,'\x06');
  uVar24 = 0xf;
  if (local_440 != &local_430) {
    uVar24 = local_430;
  }
  if (uVar24 < (ulong)(local_130 + local_438)) {
    uVar24 = 0xf;
    if (local_138 != local_128) {
      uVar24 = local_128[0];
    }
    if (uVar24 < (ulong)(local_130 + local_438)) goto LAB_00176892;
    puVar16 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,(ulong)local_440);
  }
  else {
LAB_00176892:
    puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_440,(ulong)local_138);
  }
  local_5a0 = &local_590;
  puVar20 = puVar16 + 2;
  if ((ulong *)*puVar16 == puVar20) {
    local_590 = *puVar20;
    lStack_588 = puVar16[3];
  }
  else {
    local_590 = *puVar20;
    local_5a0 = (ulong *)*puVar16;
  }
  local_598 = puVar16[1];
  *puVar16 = puVar20;
  puVar16[1] = 0;
  *(undefined1 *)puVar20 = 0;
  plVar15 = (long *)std::__cxx11::string::append((char *)&local_5a0);
  local_420 = &local_410;
  puVar20 = (ulong *)(plVar15 + 2);
  if ((ulong *)*plVar15 == puVar20) {
    local_410 = *puVar20;
    lStack_408 = plVar15[3];
  }
  else {
    local_410 = *puVar20;
    local_420 = (ulong *)*plVar15;
  }
  local_418 = plVar15[1];
  *plVar15 = (long)puVar20;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  local_158 = local_148;
  std::__cxx11::string::_M_construct((ulong)&local_158,'\t');
  uVar24 = 0xf;
  if (local_420 != &local_410) {
    uVar24 = local_410;
  }
  if (uVar24 < (ulong)(local_150 + local_418)) {
    uVar24 = 0xf;
    if (local_158 != local_148) {
      uVar24 = local_148[0];
    }
    if (uVar24 < (ulong)(local_150 + local_418)) goto LAB_001769fb;
    puVar16 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_158,0,(char *)0x0,(ulong)local_420);
  }
  else {
LAB_001769fb:
    puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_420,(ulong)local_158);
  }
  local_580 = &local_570;
  puVar20 = puVar16 + 2;
  if ((ulong *)*puVar16 == puVar20) {
    local_570 = *puVar20;
    lStack_568 = puVar16[3];
  }
  else {
    local_570 = *puVar20;
    local_580 = (ulong *)*puVar16;
  }
  local_578 = puVar16[1];
  *puVar16 = puVar20;
  puVar16[1] = 0;
  *(undefined1 *)puVar20 = 0;
  plVar15 = (long *)std::__cxx11::string::append((char *)&local_580);
  local_660 = &local_650;
  puVar20 = (ulong *)(plVar15 + 2);
  if ((ulong *)*plVar15 == puVar20) {
    local_650 = *puVar20;
    lStack_648 = plVar15[3];
  }
  else {
    local_650 = *puVar20;
    local_660 = (ulong *)*plVar15;
  }
  local_658 = plVar15[1];
  *plVar15 = (long)puVar20;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  local_178 = local_168;
  std::__cxx11::string::_M_construct((ulong)&local_178,'\t');
  uVar24 = 0xf;
  if (local_660 != &local_650) {
    uVar24 = local_650;
  }
  if (uVar24 < (ulong)(local_170 + local_658)) {
    uVar24 = 0xf;
    if (local_178 != local_168) {
      uVar24 = local_168[0];
    }
    if (uVar24 < (ulong)(local_170 + local_658)) goto LAB_00176b64;
    puVar16 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_178,0,(char *)0x0,(ulong)local_660);
  }
  else {
LAB_00176b64:
    puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_660,(ulong)local_178);
  }
  local_680 = &local_670;
  puVar20 = puVar16 + 2;
  if ((ulong *)*puVar16 == puVar20) {
    local_670 = *puVar20;
    lStack_668 = puVar16[3];
  }
  else {
    local_670 = *puVar20;
    local_680 = (ulong *)*puVar16;
  }
  local_678 = puVar16[1];
  *puVar16 = puVar20;
  puVar16[1] = 0;
  *(undefined1 *)puVar20 = 0;
  plVar15 = (long *)std::__cxx11::string::append((char *)&local_680);
  local_6a0 = &local_690;
  puVar20 = (ulong *)(plVar15 + 2);
  if ((ulong *)*plVar15 == puVar20) {
    local_690 = *puVar20;
    lStack_688 = plVar15[3];
  }
  else {
    local_690 = *puVar20;
    local_6a0 = (ulong *)*plVar15;
  }
  local_698 = plVar15[1];
  *plVar15 = (long)puVar20;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  local_198 = local_188;
  std::__cxx11::string::_M_construct((ulong)&local_198,'\t');
  uVar24 = 0xf;
  if (local_6a0 != &local_690) {
    uVar24 = local_690;
  }
  if (uVar24 < (ulong)(local_190 + local_698)) {
    uVar24 = 0xf;
    if (local_198 != local_188) {
      uVar24 = local_188[0];
    }
    if (uVar24 < (ulong)(local_190 + local_698)) goto LAB_00176ccd;
    puVar16 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_198,0,(char *)0x0,(ulong)local_6a0);
  }
  else {
LAB_00176ccd:
    puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_6a0,(ulong)local_198);
  }
  local_740._M_dataplus._M_p = (pointer)&local_740.field_2;
  psVar19 = puVar16 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar16 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar19) {
    local_740.field_2._M_allocated_capacity = *psVar19;
    local_740.field_2._8_8_ = puVar16[3];
  }
  else {
    local_740.field_2._M_allocated_capacity = *psVar19;
    local_740._M_dataplus._M_p = (pointer)*puVar16;
  }
  local_740._M_string_length = puVar16[1];
  *puVar16 = psVar19;
  puVar16[1] = 0;
  *(undefined1 *)psVar19 = 0;
  plVar15 = (long *)std::__cxx11::string::append((char *)&local_740);
  local_6e0 = &local_6d0;
  puVar20 = (ulong *)(plVar15 + 2);
  if ((ulong *)*plVar15 == puVar20) {
    local_6d0 = *puVar20;
    lStack_6c8 = plVar15[3];
  }
  else {
    local_6d0 = *puVar20;
    local_6e0 = (ulong *)*plVar15;
  }
  local_6d8 = plVar15[1];
  *plVar15 = (long)puVar20;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  local_1b8 = local_1a8;
  std::__cxx11::string::_M_construct((ulong)&local_1b8,'\t');
  uVar24 = 0xf;
  if (local_6e0 != &local_6d0) {
    uVar24 = local_6d0;
  }
  if (uVar24 < (ulong)(local_1b0 + local_6d8)) {
    uVar24 = 0xf;
    if (local_1b8 != local_1a8) {
      uVar24 = local_1a8[0];
    }
    if (uVar24 < (ulong)(local_1b0 + local_6d8)) goto LAB_00176e36;
    puVar16 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_1b8,0,(char *)0x0,(ulong)local_6e0);
  }
  else {
LAB_00176e36:
    puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_6e0,(ulong)local_1b8);
  }
  local_700 = &local_6f0;
  puVar20 = puVar16 + 2;
  if ((ulong *)*puVar16 == puVar20) {
    local_6f0 = *puVar20;
    lStack_6e8 = puVar16[3];
  }
  else {
    local_6f0 = *puVar20;
    local_700 = (ulong *)*puVar16;
  }
  local_6f8 = puVar16[1];
  *puVar16 = puVar20;
  puVar16[1] = 0;
  *(undefined1 *)puVar20 = 0;
  plVar15 = (long *)std::__cxx11::string::append((char *)&local_700);
  local_720 = &local_710;
  puVar20 = (ulong *)(plVar15 + 2);
  if ((ulong *)*plVar15 == puVar20) {
    local_710 = *puVar20;
    lStack_708 = plVar15[3];
  }
  else {
    local_710 = *puVar20;
    local_720 = (ulong *)*plVar15;
  }
  local_718 = plVar15[1];
  *plVar15 = (long)puVar20;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  local_1d8 = local_1c8;
  std::__cxx11::string::_M_construct((ulong)&local_1d8,'\t');
  uVar24 = 0xf;
  if (local_720 != &local_710) {
    uVar24 = local_710;
  }
  if (uVar24 < (ulong)(local_1d0 + local_718)) {
    uVar24 = 0xf;
    if (local_1d8 != local_1c8) {
      uVar24 = local_1c8[0];
    }
    if (uVar24 < (ulong)(local_1d0 + local_718)) goto LAB_00176f9f;
    puVar16 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,(ulong)local_720);
  }
  else {
LAB_00176f9f:
    puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_720,(ulong)local_1d8);
  }
  local_760 = &local_750;
  puVar20 = puVar16 + 2;
  if ((ulong *)*puVar16 == puVar20) {
    local_750 = *puVar20;
    lStack_748 = puVar16[3];
  }
  else {
    local_750 = *puVar20;
    local_760 = (ulong *)*puVar16;
  }
  local_758 = puVar16[1];
  *puVar16 = puVar20;
  puVar16[1] = 0;
  *(undefined1 *)puVar20 = 0;
  plVar15 = (long *)std::__cxx11::string::append((char *)&local_760);
  local_800 = &local_7f0;
  puVar20 = (ulong *)(plVar15 + 2);
  if ((ulong *)*plVar15 == puVar20) {
    local_7f0 = *puVar20;
    lStack_7e8 = plVar15[3];
  }
  else {
    local_7f0 = *puVar20;
    local_800 = (ulong *)*plVar15;
  }
  local_7f8 = plVar15[1];
  *plVar15 = (long)puVar20;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  local_1f8 = local_1e8;
  std::__cxx11::string::_M_construct((ulong)&local_1f8,'\x06');
  uVar24 = 0xf;
  if (local_800 != &local_7f0) {
    uVar24 = local_7f0;
  }
  if (uVar24 < (ulong)(local_1f0 + local_7f8)) {
    uVar24 = 0xf;
    if (local_1f8 != local_1e8) {
      uVar24 = local_1e8[0];
    }
    if (uVar24 < (ulong)(local_1f0 + local_7f8)) goto LAB_001770ed;
    puVar16 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_1f8,0,(char *)0x0,(ulong)local_800);
  }
  else {
LAB_001770ed:
    puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_800,(ulong)local_1f8);
  }
  local_7c0 = &local_7b0;
  puVar20 = puVar16 + 2;
  if ((ulong *)*puVar16 == puVar20) {
    local_7b0 = *puVar20;
    lStack_7a8 = puVar16[3];
  }
  else {
    local_7b0 = *puVar20;
    local_7c0 = (ulong *)*puVar16;
  }
  local_7b8 = puVar16[1];
  *puVar16 = puVar20;
  puVar16[1] = 0;
  *(undefined1 *)puVar20 = 0;
  plVar15 = (long *)std::__cxx11::string::append((char *)&local_7c0);
  local_820 = &local_810;
  puVar20 = (ulong *)(plVar15 + 2);
  if ((ulong *)*plVar15 == puVar20) {
    local_810 = *puVar20;
    lStack_808 = plVar15[3];
  }
  else {
    local_810 = *puVar20;
    local_820 = (ulong *)*plVar15;
  }
  local_818 = plVar15[1];
  *plVar15 = (long)puVar20;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  local_110 = local_100;
  std::__cxx11::string::_M_construct((ulong)&local_110,'\x03');
  uVar24 = 0xf;
  if (local_820 != &local_810) {
    uVar24 = local_810;
  }
  if (uVar24 < (ulong)(local_108 + local_818)) {
    uVar24 = 0xf;
    if (local_110 != local_100) {
      uVar24 = local_100[0];
    }
    if (uVar24 < (ulong)(local_108 + local_818)) goto LAB_00177238;
    puVar16 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,(ulong)local_820);
  }
  else {
LAB_00177238:
    puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_820,(ulong)local_110);
  }
  local_840 = &local_830;
  puVar20 = puVar16 + 2;
  if ((ulong *)*puVar16 == puVar20) {
    local_830 = *puVar20;
    lStack_828 = puVar16[3];
  }
  else {
    local_830 = *puVar20;
    local_840 = (ulong *)*puVar16;
  }
  local_838 = puVar16[1];
  *puVar16 = puVar20;
  puVar16[1] = 0;
  *(undefined1 *)puVar20 = 0;
  plVar15 = (long *)std::__cxx11::string::append((char *)&local_840);
  local_7a0 = &local_790;
  puVar20 = (ulong *)(plVar15 + 2);
  if ((ulong *)*plVar15 == puVar20) {
    local_790 = *puVar20;
    lStack_788 = plVar15[3];
  }
  else {
    local_790 = *puVar20;
    local_7a0 = (ulong *)*plVar15;
  }
  local_798 = plVar15[1];
  *plVar15 = (long)puVar20;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  if (local_840 != &local_830) {
    operator_delete(local_840);
  }
  if (local_110 != local_100) {
    operator_delete(local_110);
  }
  if (local_820 != &local_810) {
    operator_delete(local_820);
  }
  if (local_7c0 != &local_7b0) {
    operator_delete(local_7c0);
  }
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8);
  }
  if (local_800 != &local_7f0) {
    operator_delete(local_800);
  }
  if (local_760 != &local_750) {
    operator_delete(local_760);
  }
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8);
  }
  if (local_720 != &local_710) {
    operator_delete(local_720);
  }
  if (local_700 != &local_6f0) {
    operator_delete(local_700);
  }
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8);
  }
  if (local_6e0 != &local_6d0) {
    operator_delete(local_6e0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_740._M_dataplus._M_p != &local_740.field_2) {
    operator_delete(local_740._M_dataplus._M_p);
  }
  if (local_198 != local_188) {
    operator_delete(local_198);
  }
  if (local_6a0 != &local_690) {
    operator_delete(local_6a0);
  }
  if (local_680 != &local_670) {
    operator_delete(local_680);
  }
  if (local_178 != local_168) {
    operator_delete(local_178);
  }
  if (local_660 != &local_650) {
    operator_delete(local_660);
  }
  if (local_580 != &local_570) {
    operator_delete(local_580);
  }
  if (local_158 != local_148) {
    operator_delete(local_158);
  }
  if (local_420 != &local_410) {
    operator_delete(local_420);
  }
  if (local_5a0 != &local_590) {
    operator_delete(local_5a0);
  }
  if (local_138 != local_128) {
    operator_delete(local_138);
  }
  if (local_440 != &local_430) {
    operator_delete(local_440);
  }
  if (local_4e0 != &local_4d0) {
    operator_delete(local_4e0);
  }
  if (local_278 != local_268) {
    operator_delete(local_278);
  }
  if (local_560 != &local_550) {
    operator_delete(local_560);
  }
  if (local_380 != &local_370) {
    operator_delete(local_380);
  }
  if (local_3e0 != &local_3d0) {
    operator_delete(local_3e0);
  }
  if (local_2c0 != local_2b0) {
    operator_delete(local_2c0);
  }
  if (local_400 != &local_3f0) {
    operator_delete(local_400);
  }
  if (local_3a0 != &local_390) {
    operator_delete(local_3a0);
  }
  if (local_2a0 != local_290) {
    operator_delete(local_2a0);
  }
  if (local_460 != &local_450) {
    operator_delete(local_460);
  }
  if (local_480 != &local_470) {
    operator_delete(local_480);
  }
  if (local_218 != local_208) {
    operator_delete(local_218);
  }
  if (local_360 != &local_350) {
    operator_delete(local_360);
  }
  if (local_6c0 != &local_6b0) {
    operator_delete(local_6c0);
  }
  if (local_2e0 != &local_2d0) {
    operator_delete(local_2e0);
  }
  if (local_500 != &local_4f0) {
    operator_delete(local_500);
  }
  if (local_4c0 != &local_4b0) {
    operator_delete(local_4c0);
  }
  if (local_340 != &local_330) {
    operator_delete(local_340);
  }
  if (local_4a0 != &local_490) {
    operator_delete(local_4a0);
  }
  if (local_620 != &local_610) {
    operator_delete(local_620);
  }
  if (local_238 != &local_228) {
    operator_delete(local_238);
  }
  if (local_640 != &local_630) {
    operator_delete(local_640);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    operator_delete(local_320._M_dataplus._M_p);
  }
  if (local_300 != &local_2f0) {
    operator_delete(local_300);
  }
  if (local_3c0 != &local_3b0) {
    operator_delete(local_3c0);
  }
  if (local_258 != &local_248) {
    operator_delete(local_258);
  }
  local_460 = &local_450;
  std::__cxx11::string::_M_construct((ulong)&local_460,'\x03');
  plVar15 = (long *)std::__cxx11::string::replace((ulong)&local_460,0,(char *)0x0,(ulong)local_7a0);
  local_3a0 = &local_390;
  puVar20 = (ulong *)(plVar15 + 2);
  if ((ulong *)*plVar15 == puVar20) {
    local_390 = *puVar20;
    lStack_388 = plVar15[3];
  }
  else {
    local_390 = *puVar20;
    local_3a0 = (ulong *)*plVar15;
  }
  local_398 = plVar15[1];
  *plVar15 = (long)puVar20;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  plVar15 = (long *)std::__cxx11::string::append((char *)&local_3a0);
  local_400 = &local_3f0;
  puVar20 = (ulong *)(plVar15 + 2);
  if ((ulong *)*plVar15 == puVar20) {
    local_3f0 = *puVar20;
    lStack_3e8 = plVar15[3];
  }
  else {
    local_3f0 = *puVar20;
    local_400 = (ulong *)*plVar15;
  }
  local_3f8 = plVar15[1];
  *plVar15 = (long)puVar20;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  local_480 = &local_470;
  std::__cxx11::string::_M_construct((ulong)&local_480,'\x03');
  uVar24 = 0xf;
  if (local_400 != &local_3f0) {
    uVar24 = local_3f0;
  }
  if (uVar24 < (ulong)(local_478 + local_3f8)) {
    uVar24 = 0xf;
    if (local_480 != &local_470) {
      uVar24 = local_470;
    }
    if (uVar24 < (ulong)(local_478 + local_3f8)) goto LAB_0017797b;
    puVar16 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_480,0,(char *)0x0,(ulong)local_400);
  }
  else {
LAB_0017797b:
    puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_400,(ulong)local_480);
  }
  local_3e0 = &local_3d0;
  puVar20 = puVar16 + 2;
  if ((ulong *)*puVar16 == puVar20) {
    local_3d0 = *puVar20;
    lStack_3c8 = puVar16[3];
  }
  else {
    local_3d0 = *puVar20;
    local_3e0 = (ulong *)*puVar16;
  }
  local_3d8 = puVar16[1];
  *puVar16 = puVar20;
  puVar16[1] = 0;
  *(undefined1 *)puVar20 = 0;
  plVar15 = (long *)std::__cxx11::string::append((char *)&local_3e0);
  local_380 = &local_370;
  puVar20 = (ulong *)(plVar15 + 2);
  if ((ulong *)*plVar15 == puVar20) {
    local_370 = *puVar20;
    lStack_368 = plVar15[3];
  }
  else {
    local_370 = *puVar20;
    local_380 = (ulong *)*plVar15;
  }
  local_378 = plVar15[1];
  *plVar15 = (long)puVar20;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  local_360 = &local_350;
  std::__cxx11::string::_M_construct((ulong)&local_360,'\x03');
  uVar24 = 0xf;
  if (local_380 != &local_370) {
    uVar24 = local_370;
  }
  if (uVar24 < (ulong)(local_358 + local_378)) {
    uVar24 = 0xf;
    if (local_360 != &local_350) {
      uVar24 = local_350;
    }
    if (uVar24 < (ulong)(local_358 + local_378)) goto LAB_00177ad4;
    puVar16 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_360,0,(char *)0x0,(ulong)local_380);
  }
  else {
LAB_00177ad4:
    puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_380,(ulong)local_360);
  }
  local_560 = &local_550;
  puVar20 = puVar16 + 2;
  if ((ulong *)*puVar16 == puVar20) {
    local_550 = *puVar20;
    lStack_548 = puVar16[3];
  }
  else {
    local_550 = *puVar20;
    local_560 = (ulong *)*puVar16;
  }
  local_558 = puVar16[1];
  *puVar16 = puVar20;
  puVar16[1] = 0;
  *(undefined1 *)puVar20 = 0;
  plVar15 = (long *)std::__cxx11::string::append((char *)&local_560);
  local_4e0 = &local_4d0;
  puVar20 = (ulong *)(plVar15 + 2);
  if ((ulong *)*plVar15 == puVar20) {
    local_4d0 = *puVar20;
    lStack_4c8 = plVar15[3];
  }
  else {
    local_4d0 = *puVar20;
    local_4e0 = (ulong *)*plVar15;
  }
  local_4d8 = plVar15[1];
  *plVar15 = (long)puVar20;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  local_6c0 = &local_6b0;
  std::__cxx11::string::_M_construct((ulong)&local_6c0,'\x03');
  uVar24 = 0xf;
  if (local_4e0 != &local_4d0) {
    uVar24 = local_4d0;
  }
  if (uVar24 < (ulong)(local_6b8 + local_4d8)) {
    uVar24 = 0xf;
    if (local_6c0 != &local_6b0) {
      uVar24 = local_6b0;
    }
    if (uVar24 < (ulong)(local_6b8 + local_4d8)) goto LAB_00177c2d;
    puVar16 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_6c0,0,(char *)0x0,(ulong)local_4e0);
  }
  else {
LAB_00177c2d:
    puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_4e0,(ulong)local_6c0);
  }
  local_440 = &local_430;
  puVar20 = puVar16 + 2;
  if ((ulong *)*puVar16 == puVar20) {
    local_430 = *puVar20;
    lStack_428 = puVar16[3];
  }
  else {
    local_430 = *puVar20;
    local_440 = (ulong *)*puVar16;
  }
  local_438 = puVar16[1];
  *puVar16 = puVar20;
  puVar16[1] = 0;
  *(undefined1 *)puVar20 = 0;
  plVar15 = (long *)std::__cxx11::string::append((char *)&local_440);
  local_5a0 = &local_590;
  puVar20 = (ulong *)(plVar15 + 2);
  if ((ulong *)*plVar15 == puVar20) {
    local_590 = *puVar20;
    lStack_588 = plVar15[3];
  }
  else {
    local_590 = *puVar20;
    local_5a0 = (ulong *)*plVar15;
  }
  local_598 = plVar15[1];
  *plVar15 = (long)puVar20;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  local_500 = &local_4f0;
  std::__cxx11::string::_M_construct((ulong)&local_500,'\x03');
  uVar24 = 0xf;
  if (local_5a0 != &local_590) {
    uVar24 = local_590;
  }
  if (uVar24 < (ulong)(local_4f8 + local_598)) {
    uVar24 = 0xf;
    if (local_500 != &local_4f0) {
      uVar24 = local_4f0;
    }
    if (uVar24 < (ulong)(local_4f8 + local_598)) goto LAB_00177d96;
    puVar16 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_500,0,(char *)0x0,(ulong)local_5a0);
  }
  else {
LAB_00177d96:
    puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_5a0,(ulong)local_500);
  }
  local_420 = &local_410;
  puVar20 = puVar16 + 2;
  if ((ulong *)*puVar16 == puVar20) {
    local_410 = *puVar20;
    lStack_408 = puVar16[3];
  }
  else {
    local_410 = *puVar20;
    local_420 = (ulong *)*puVar16;
  }
  local_418 = puVar16[1];
  *puVar16 = puVar20;
  puVar16[1] = 0;
  *(undefined1 *)puVar20 = 0;
  plVar15 = (long *)std::__cxx11::string::append((char *)&local_420);
  local_580 = &local_570;
  puVar20 = (ulong *)(plVar15 + 2);
  if ((ulong *)*plVar15 == puVar20) {
    local_570 = *puVar20;
    lStack_568 = plVar15[3];
  }
  else {
    local_570 = *puVar20;
    local_580 = (ulong *)*plVar15;
  }
  local_578 = plVar15[1];
  *plVar15 = (long)puVar20;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  plVar15 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_580,(ulong)local_5c0._M_dataplus._M_p);
  local_660 = &local_650;
  puVar20 = (ulong *)(plVar15 + 2);
  if ((ulong *)*plVar15 == puVar20) {
    local_650 = *puVar20;
    lStack_648 = plVar15[3];
  }
  else {
    local_650 = *puVar20;
    local_660 = (ulong *)*plVar15;
  }
  local_658 = plVar15[1];
  *plVar15 = (long)puVar20;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  local_4c0 = &local_4b0;
  std::__cxx11::string::_M_construct((ulong)&local_4c0,'\x06');
  uVar24 = 0xf;
  if (local_660 != &local_650) {
    uVar24 = local_650;
  }
  if (uVar24 < (ulong)(local_4b8 + local_658)) {
    uVar24 = 0xf;
    if (local_4c0 != &local_4b0) {
      uVar24 = local_4b0;
    }
    if (uVar24 < (ulong)(local_4b8 + local_658)) goto LAB_00177f6d;
    puVar16 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_4c0,0,(char *)0x0,(ulong)local_660);
  }
  else {
LAB_00177f6d:
    puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_660,(ulong)local_4c0);
  }
  local_680 = &local_670;
  puVar20 = puVar16 + 2;
  if ((ulong *)*puVar16 == puVar20) {
    local_670 = *puVar20;
    lStack_668 = puVar16[3];
  }
  else {
    local_670 = *puVar20;
    local_680 = (ulong *)*puVar16;
  }
  local_678 = puVar16[1];
  *puVar16 = puVar20;
  puVar16[1] = 0;
  *(undefined1 *)puVar20 = 0;
  plVar15 = (long *)std::__cxx11::string::append((char *)&local_680);
  local_6a0 = &local_690;
  puVar20 = (ulong *)(plVar15 + 2);
  if ((ulong *)*plVar15 == puVar20) {
    local_690 = *puVar20;
    lStack_688 = plVar15[3];
  }
  else {
    local_690 = *puVar20;
    local_6a0 = (ulong *)*plVar15;
  }
  local_698 = plVar15[1];
  *plVar15 = (long)puVar20;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  plVar15 = (long *)std::__cxx11::string::_M_append((char *)&local_6a0,(ulong)local_780);
  local_740._M_dataplus._M_p = (pointer)&local_740.field_2;
  puVar20 = (ulong *)(plVar15 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar15 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar20) {
    local_740.field_2._M_allocated_capacity = *puVar20;
    local_740.field_2._8_8_ = plVar15[3];
  }
  else {
    local_740.field_2._M_allocated_capacity = *puVar20;
    local_740._M_dataplus._M_p = (pointer)*plVar15;
  }
  local_740._M_string_length = plVar15[1];
  *plVar15 = (long)puVar20;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  local_4a0 = &local_490;
  std::__cxx11::string::_M_construct((ulong)&local_4a0,'\x03');
  uVar26 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_740._M_dataplus._M_p != &local_740.field_2) {
    uVar26 = local_740.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar26 < local_498 + local_740._M_string_length) {
    uVar24 = 0xf;
    if (local_4a0 != &local_490) {
      uVar24 = local_490;
    }
    if (uVar24 < local_498 + local_740._M_string_length) goto LAB_00178144;
    puVar16 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_4a0,0,(char *)0x0,(ulong)local_740._M_dataplus._M_p);
  }
  else {
LAB_00178144:
    puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_740,(ulong)local_4a0);
  }
  local_6e0 = &local_6d0;
  puVar20 = puVar16 + 2;
  if ((ulong *)*puVar16 == puVar20) {
    local_6d0 = *puVar20;
    lStack_6c8 = puVar16[3];
  }
  else {
    local_6d0 = *puVar20;
    local_6e0 = (ulong *)*puVar16;
  }
  local_6d8 = puVar16[1];
  *puVar16 = puVar20;
  puVar16[1] = 0;
  *(undefined1 *)puVar20 = 0;
  plVar15 = (long *)std::__cxx11::string::append((char *)&local_6e0);
  local_700 = &local_6f0;
  puVar20 = (ulong *)(plVar15 + 2);
  if ((ulong *)*plVar15 == puVar20) {
    local_6f0 = *puVar20;
    lStack_6e8 = plVar15[3];
  }
  else {
    local_6f0 = *puVar20;
    local_700 = (ulong *)*plVar15;
  }
  local_6f8 = plVar15[1];
  *plVar15 = (long)puVar20;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  local_620 = &local_610;
  std::__cxx11::string::_M_construct((ulong)&local_620,'\x03');
  uVar24 = 0xf;
  if (local_700 != &local_6f0) {
    uVar24 = local_6f0;
  }
  if (uVar24 < (ulong)(local_618 + local_6f8)) {
    uVar24 = 0xf;
    if (local_620 != &local_610) {
      uVar24 = local_610;
    }
    if (uVar24 < (ulong)(local_618 + local_6f8)) goto LAB_001782ad;
    puVar16 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_620,0,(char *)0x0,(ulong)local_700);
  }
  else {
LAB_001782ad:
    puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_700,(ulong)local_620);
  }
  local_720 = &local_710;
  puVar20 = puVar16 + 2;
  if ((ulong *)*puVar16 == puVar20) {
    local_710 = *puVar20;
    lStack_708 = puVar16[3];
  }
  else {
    local_710 = *puVar20;
    local_720 = (ulong *)*puVar16;
  }
  local_718 = puVar16[1];
  *puVar16 = puVar20;
  puVar16[1] = 0;
  *(undefined1 *)puVar20 = 0;
  plVar15 = (long *)std::__cxx11::string::append((char *)&local_720);
  local_760 = &local_750;
  puVar20 = (ulong *)(plVar15 + 2);
  if ((ulong *)*plVar15 == puVar20) {
    local_750 = *puVar20;
    lStack_748 = plVar15[3];
  }
  else {
    local_750 = *puVar20;
    local_760 = (ulong *)*plVar15;
  }
  local_758 = plVar15[1];
  *plVar15 = (long)puVar20;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  local_640 = &local_630;
  std::__cxx11::string::_M_construct((ulong)&local_640,'\x03');
  uVar24 = 0xf;
  if (local_760 != &local_750) {
    uVar24 = local_750;
  }
  if (uVar24 < (ulong)(local_638 + local_758)) {
    uVar24 = 0xf;
    if (local_640 != &local_630) {
      uVar24 = local_630;
    }
    if (uVar24 < (ulong)(local_638 + local_758)) goto LAB_00178416;
    puVar16 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_640,0,(char *)0x0,(ulong)local_760);
  }
  else {
LAB_00178416:
    puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_760,(ulong)local_640);
  }
  local_800 = &local_7f0;
  puVar20 = puVar16 + 2;
  if ((ulong *)*puVar16 == puVar20) {
    local_7f0 = *puVar20;
    lStack_7e8 = puVar16[3];
  }
  else {
    local_7f0 = *puVar20;
    local_800 = (ulong *)*puVar16;
  }
  local_7f8 = puVar16[1];
  *puVar16 = puVar20;
  puVar16[1] = 0;
  *(undefined1 *)puVar20 = 0;
  plVar15 = (long *)std::__cxx11::string::append((char *)&local_800);
  local_7c0 = &local_7b0;
  puVar20 = (ulong *)(plVar15 + 2);
  if ((ulong *)*plVar15 == puVar20) {
    local_7b0 = *puVar20;
    lStack_7a8 = plVar15[3];
  }
  else {
    local_7b0 = *puVar20;
    local_7c0 = (ulong *)*plVar15;
  }
  local_7b8 = plVar15[1];
  *plVar15 = (long)puVar20;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  plVar15 = (long *)std::__cxx11::string::_M_append((char *)&local_7c0,(ulong)local_600);
  local_820 = &local_810;
  puVar20 = (ulong *)(plVar15 + 2);
  if ((ulong *)*plVar15 == puVar20) {
    local_810 = *puVar20;
    lStack_808 = plVar15[3];
  }
  else {
    local_810 = *puVar20;
    local_820 = (ulong *)*plVar15;
  }
  local_818 = plVar15[1];
  *plVar15 = (long)puVar20;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_320,'\x03');
  uVar24 = 0xf;
  if (local_820 != &local_810) {
    uVar24 = local_810;
  }
  if (uVar24 < local_320._M_string_length + local_818) {
    uVar26 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      uVar26 = local_320.field_2._M_allocated_capacity;
    }
    if (local_320._M_string_length + local_818 <= (ulong)uVar26) {
      puVar16 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_320,0,(char *)0x0,(ulong)local_820);
      goto LAB_001785e5;
    }
  }
  puVar16 = (undefined8 *)
            std::__cxx11::string::_M_append((char *)&local_820,(ulong)local_320._M_dataplus._M_p);
LAB_001785e5:
  local_840 = &local_830;
  puVar20 = puVar16 + 2;
  if ((ulong *)*puVar16 == puVar20) {
    local_830 = *puVar20;
    lStack_828 = puVar16[3];
  }
  else {
    local_830 = *puVar20;
    local_840 = (ulong *)*puVar16;
  }
  local_838 = puVar16[1];
  *puVar16 = puVar20;
  puVar16[1] = 0;
  *(undefined1 *)puVar20 = 0;
  plVar15 = (long *)std::__cxx11::string::append((char *)&local_840);
  (psVar11->_M_dataplus)._M_p = (pointer)&psVar11->field_2;
  psVar19 = (size_type *)(plVar15 + 2);
  if ((size_type *)*plVar15 == psVar19) {
    lVar6 = plVar15[3];
    (psVar11->field_2)._M_allocated_capacity = *psVar19;
    *(long *)((long)&psVar11->field_2 + 8) = lVar6;
  }
  else {
    (psVar11->_M_dataplus)._M_p = (pointer)*plVar15;
    (psVar11->field_2)._M_allocated_capacity = *psVar19;
  }
  psVar11->_M_string_length = plVar15[1];
  *plVar15 = (long)psVar19;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  if (local_840 != &local_830) {
    operator_delete(local_840);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    operator_delete(local_320._M_dataplus._M_p);
  }
  if (local_820 != &local_810) {
    operator_delete(local_820);
  }
  if (local_7c0 != &local_7b0) {
    operator_delete(local_7c0);
  }
  if (local_800 != &local_7f0) {
    operator_delete(local_800);
  }
  if (local_640 != &local_630) {
    operator_delete(local_640);
  }
  if (local_760 != &local_750) {
    operator_delete(local_760);
  }
  if (local_720 != &local_710) {
    operator_delete(local_720);
  }
  if (local_620 != &local_610) {
    operator_delete(local_620);
  }
  if (local_700 != &local_6f0) {
    operator_delete(local_700);
  }
  if (local_6e0 != &local_6d0) {
    operator_delete(local_6e0);
  }
  if (local_4a0 != &local_490) {
    operator_delete(local_4a0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_740._M_dataplus._M_p != &local_740.field_2) {
    operator_delete(local_740._M_dataplus._M_p);
  }
  if (local_6a0 != &local_690) {
    operator_delete(local_6a0);
  }
  if (local_680 != &local_670) {
    operator_delete(local_680);
  }
  if (local_4c0 != &local_4b0) {
    operator_delete(local_4c0);
  }
  if (local_660 != &local_650) {
    operator_delete(local_660);
  }
  if (local_580 != &local_570) {
    operator_delete(local_580);
  }
  if (local_420 != &local_410) {
    operator_delete(local_420);
  }
  if (local_500 != &local_4f0) {
    operator_delete(local_500);
  }
  if (local_5a0 != &local_590) {
    operator_delete(local_5a0);
  }
  if (local_440 != &local_430) {
    operator_delete(local_440);
  }
  if (local_6c0 != &local_6b0) {
    operator_delete(local_6c0);
  }
  if (local_4e0 != &local_4d0) {
    operator_delete(local_4e0);
  }
  if (local_560 != &local_550) {
    operator_delete(local_560);
  }
  if (local_360 != &local_350) {
    operator_delete(local_360);
  }
  if (local_380 != &local_370) {
    operator_delete(local_380);
  }
  if (local_3e0 != &local_3d0) {
    operator_delete(local_3e0);
  }
  if (local_480 != &local_470) {
    operator_delete(local_480);
  }
  if (local_400 != &local_3f0) {
    operator_delete(local_400);
  }
  if (local_3a0 != &local_390) {
    operator_delete(local_3a0);
  }
  if (local_460 != &local_450) {
    operator_delete(local_460);
  }
  if (local_7a0 != &local_790) {
    operator_delete(local_7a0);
  }
  if (local_780 != &local_770) {
    operator_delete(local_780);
  }
  if (local_600 != &local_5f0) {
    operator_delete(local_600);
  }
  if (local_520 != &local_510) {
    operator_delete(local_520);
  }
  if (local_540 != &local_530) {
    operator_delete(local_540);
  }
  if (local_7e0 != &local_7d0) {
    operator_delete(local_7e0);
  }
  if (local_860 != &local_850) {
    operator_delete(local_860);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
    operator_delete(local_5c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
    operator_delete(local_5e0._M_dataplus._M_p);
  }
  if (local_48.super__Vector_base<Query_*,_std::allocator<Query_*>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<Query_*,_std::allocator<Query_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  operator_delete(__s);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&local_80);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&local_d8);
  return psVar11;
}

Assistant:

std::string RegressionTree::genVarianceComputation()
{
    std::vector<std::vector<std::string>> variancePerView(_compiler->numberOfViews());
    //TODO: rename this to thresholdPerView
    std::vector<std::vector<std::string>> functionPerView(_compiler->numberOfViews());
    std::vector<size_t> firstThreshold(NUM_OF_VARIABLES);
    std::vector<Query*> complementQueryPerView(_compiler->numberOfViews());
    
    for (QueryThresholdPair& qtPair : queryToThreshold)
    {
        if (_categoricalFeatures[qtPair.varID])
        {
            // Find the view that corresponds to the query
            Query* query = qtPair.query;
            size_t& viewID = query->_aggregates[0]->_incoming[0].first;
            size_t& viewID2 = query->_aggregates[1]->_incoming[0].first;
            size_t& viewID3 = query->_aggregates[2]->_incoming[0].first;

            Query* complement = qtPair.complementQuery;
            const size_t& comp_viewID = complement->_aggregates[0]->_incoming[0].first;

            if (viewID != viewID2 || viewID != viewID3)
                std::cout << "THERE IS AN ERROR IN genVarianceComputation" << std::endl;
        
            const size_t& count = query->_aggregates[0]->_incoming[0].second;
            const size_t& linear = query->_aggregates[1]->_incoming[0].second;
            const size_t& quad = query->_aggregates[2]->_incoming[0].second;

            const size_t& comp_count = complement->_aggregates[0]->_incoming[0].second;
            // const size_t& comp_linear=complement->_aggregates[1]->_incoming[0].second;
            // const size_t& comp_quad = complement->_aggregates[2]->_incoming[0].second;
        
            std::string viewTup = "V"+std::to_string(viewID)+"tuple";
        
            // variancePerView[viewID].push_back(
            //     "("+viewTup+".aggregates["+std::to_string(count)+"] > 0 ? "+
            //     viewTup+".aggregates["+std::to_string(quad)+"] - ("+
            //     viewTup+".aggregates["+std::to_string(linear)+"] * "+
            //     viewTup+".aggregates["+std::to_string(linear)+"]) / "+
            //     viewTup+".aggregates["+std::to_string(count)+"] : 999);\n"
            //     );
            
            variancePerView[viewID].push_back(
                viewTup+".aggregates["+std::to_string(quad)+"] - ("+
                viewTup+".aggregates["+std::to_string(linear)+"] * "+
                viewTup+".aggregates["+std::to_string(linear)+"]) / "+
                viewTup+".aggregates["+std::to_string(count)+"] + "+
                "difference[2] - (difference[1] * difference[1]) / difference[0];\n"
                );

            complementQueryPerView[viewID] = complement;
            
            Attribute* att = _td->getAttribute(qtPair.varID);

            // functionPerView[viewID].push_back(
            //     "\"Variable: "+std::to_string(qtPair.varID)+" "+
            //     "Threshold: \"+std::to_string(tuple."+att->_name+")+\" "+
            //     "Operator: = \";\n");

            // TODO:TODO:TODO:TODO:TODO:TODO: WHY DOES THIS SAY AGGREGATES[QUAD] !?!?!
            functionPerView[viewID].push_back(
                ".set("+std::to_string(qtPair.varID)+",tuple."+att->_name+",1,"+
                "&tuple.aggregates["+std::to_string(count)+"],"+
                "&V"+std::to_string(comp_viewID)+"[0].aggregates["+
                std::to_string(comp_count)+"]"+");\n");
        }
        else
        {   // Continuous variable
            
            // Find the view that corresponds to the query
            Query* query = qtPair.query;
            size_t& viewID = query->_aggregates[0]->_incoming[0].first;
            size_t& viewID2 = query->_aggregates[1]->_incoming[0].first;
            size_t& viewID3 = query->_aggregates[2]->_incoming[0].first;

            size_t& cviewID = query->_aggregates[3]->_incoming[0].first;
            size_t& cviewID2 = query->_aggregates[4]->_incoming[0].first;
            size_t& cviewID3 = query->_aggregates[5]->_incoming[0].first;

            if (viewID != viewID2 || viewID != viewID3 ||
                cviewID != viewID || cviewID2 != viewID || cviewID3 != viewID  )
                std::cout << "THERE IS AN ERROR IN genVarianceComputation" << std::endl;
        
            const size_t& count = query->_aggregates[0]->_incoming[0].second;
            const size_t& linear = query->_aggregates[1]->_incoming[0].second;
            const size_t& quad = query->_aggregates[2]->_incoming[0].second;

            const size_t& compcount = query->_aggregates[3]->_incoming[0].second;
            const size_t& complinear = query->_aggregates[4]->_incoming[0].second;
            const size_t& compquad = query->_aggregates[5]->_incoming[0].second;
        
            std::string viewTup = "V"+std::to_string(viewID)+"tuple";
            
            variancePerView[viewID].push_back(
                "(("+viewTup+".aggregates["+std::to_string(count)+"] > 0  && "+
                viewTup+".aggregates["+std::to_string(compcount)+"] > 0) ? "+
                viewTup+".aggregates["+std::to_string(quad)+"] - ("+
                viewTup+".aggregates["+std::to_string(linear)+"] * "+
                viewTup+".aggregates["+std::to_string(linear)+"]) / "+
                viewTup+".aggregates["+std::to_string(count)+"] + "+
                viewTup+".aggregates["+std::to_string(compquad)+"] - ("+
                viewTup+".aggregates["+std::to_string(complinear)+"] * "+
                viewTup+".aggregates["+std::to_string(complinear)+"]) / "+
                viewTup+".aggregates["+std::to_string(compcount)+"] : 1.79769e+308);\n"
                );
           
            // functionPerView[viewID].push_back(
            //     "\"Variable: "+std::to_string(qtPair.varID)+" "+
            //     "Threshold: "+std::to_string(qtPair.function->_parameter[0])+" "+
            //     "Operator: < \";\n");
            functionPerView[viewID].push_back(".set("+std::to_string(qtPair.varID)+","+
                std::to_string(qtPair.function->_parameter[0])+",0,"+
                "&V"+std::to_string(viewID)+"[0].aggregates["+std::to_string(count)+"],"+
                "&V"+std::to_string(cviewID)+"[0].aggregates["+
                std::to_string(compcount)+"]"+");\n");
        }
        
    }

    std::string numOfThresholds = "numberOfThresholds = ";
    size_t numOfContThresholds = 0;

    for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
    {
        if (!_features.test(var))
            continue;
        
        if (!_categoricalFeatures.test(var))
        {
            firstThreshold[var] = numOfContThresholds;
            numOfContThresholds += _thresholds[var].size();
        }
        else
        {
            size_t& viewID = _varToQueryMap[var]->_aggregates[0]->_incoming[0].first;   
            numOfThresholds += "V"+std::to_string(viewID)+".size() + ";
        }
    }
    numOfThresholds += std::to_string(numOfContThresholds)+";\n";

    std::string initVariance = offset(2)+numOfThresholds +
        offset(2)+"variance = new double[numberOfThresholds];\n";
    
    std::string contVariance = "", categVariance = "";
    std::string contFunctionIndex = "", categFunctionIndex = "";
    
    size_t varianceCount = 0;
    for (size_t viewID = 0; viewID < _compiler->numberOfViews(); ++viewID)
    {
        if (!variancePerView[viewID].empty())
        {
            std::string viewString = "V"+std::to_string(viewID);
            
            if (_compiler->getView(viewID)->_fVars.any())
            {
                // categVariance += offset(2)+"for ("+viewString+"_tuple& "+
                //     viewString+"tuple : "+viewString+")\n";
                // for (size_t j = 0; j < variancePerView[viewID].size(); ++j)
                // {
                //     categVariance += offset(3)+
                //         "variance[categIdx++] = "+variancePerView[viewID][j];
                    
                //     categFunctionIndex += 
                //         offset(2)+"for (V"+std::to_string(viewID)+"_tuple& tuple : "+
                //         "V"+std::to_string(viewID)+")\n"+offset(3)+
                //         "thresholdMap[categIdx++] = "+functionPerView[viewID][j];
                // }
                
                if (variancePerView[viewID].size() > 1)
                {
                    ERROR("THIS IS ODD, EXCEPCTED SIZE IS 1;\n");
                    exit(1);
                }

                Query* complement = complementQueryPerView[viewID];
                const size_t& comp_viewID =
                    complement->_aggregates[0]->_incoming[0].first;
                const size_t& comp_count =
                    complement->_aggregates[0]->_incoming[0].second;
                const size_t& comp_linear =
                    complement->_aggregates[1]->_incoming[0].second;
                const size_t& comp_quad =
                    complement->_aggregates[2]->_incoming[0].second;

                if (comp_count != comp_linear-1 || comp_count != comp_quad-2 ||
                    comp_linear != comp_quad-1)
                {    
                    ERROR("We should have expected the aggregates to be contiguous!\n");
                    exit(1);
                }

                // std::cout << "complement: " << comp_viewID << "  " << viewID << "\n";
                // std::cout << complement->_fVars << std::endl;
                // std::cout << _compiler->getView(viewID)->_fVars << std::endl;
                
                categVariance += offset(2)+"compaggs = &V"+std::to_string(comp_viewID)+
                    "[0].aggregates["+std::to_string(comp_count)+"];\n"+
                    offset(2)+"for ("+viewString+"_tuple& "+viewString+"tuple : "+
                    viewString+")\n"+offset(2)+"{\n"+
                    offset(3)+"if("+viewString+"tuple.aggregates[0] == 0 || "+
                    viewString+"tuple.aggregates[0] == compaggs[0])\n"+
                    offset(3)+"{\n"+
                    offset(4)+"variance[categIdx++] = 1.79769e+308;\n"+
                    offset(4)+"continue;\n"+
                    offset(3)+"}\n"+
                    offset(3)+"for (size_t i=0; i < 3; ++i)\n"+
                    offset(4)+"difference[i] = compaggs[i] - "+
                    viewString+"tuple.aggregates[i];\n"+
                    offset(3)+"variance[categIdx++] = "+variancePerView[viewID][0]+
                    offset(2)+"}\n";
                
                // categFunctionIndex +=offset(2)+"for (V"+std::to_string(viewID)+
                //     "_tuple& tuple : V"+std::to_string(viewID)+")\n"+offset(3)+
                //     "thresholdMap[categIdx++] = "+functionPerView[viewID][0];
                categFunctionIndex +=offset(2)+"for (V"+std::to_string(viewID)+
                    "_tuple& tuple : V"+std::to_string(viewID)+")\n"+offset(3)+
                    "thresholdMap[categIdx++]"+functionPerView[viewID][0];
                
                // for (size_t j = 0; j < variancePerView[viewID].size(); ++j)
                // {
                //     categVariance += "variance[categIdx++] = "+
                //         variancePerView[viewID][0];
                //     categFunctionIndex += 
                //         offset(2)+"for (V"+std::to_string(viewID)+"_tuple& tuple : "+
                //         "V"+std::to_string(viewID)+")\n"+offset(3)+
                //         "thresholdMap[categIdx++] = "+functionPerView[viewID][j];
                // }
            }
            else
            {
                contVariance += offset(2)+viewString+"_tuple& "+
                    viewString+"tuple = "+viewString+"[0];\n";
                                
                for (size_t j = 0; j < variancePerView[viewID].size(); ++j)
                {
                    contVariance += offset(2)+
                        "variance["+std::to_string(varianceCount)+"] = "+
                        variancePerView[viewID][j];

                    // contFunctionIndex += offset(2)+
                    //     "thresholdMap["+std::to_string(varianceCount)+"] = "+
                    //     functionPerView[viewID][j];
                    contFunctionIndex += offset(2)+
                        "thresholdMap["+std::to_string(varianceCount)+"]"+
                        functionPerView[viewID][j];
                    
                    ++varianceCount;
                }
            }
        }
    }

    std::string computeVariance = contVariance;
    
    if (!categVariance.empty())
    {    
        computeVariance += offset(2)+"size_t categIdx = "+
            std::to_string(numOfContThresholds)+";\n"+
            offset(2)+"double difference[3], *compaggs;\n"+
            categVariance;
    }
    
    computeVariance += "\n"+offset(2)+"double min_variance = variance[0];\n"+
        offset(2)+"size_t threshold = 0;\n\n"+
        offset(2)+"for (size_t t=1; t < numberOfThresholds; ++t)\n"+offset(2)+"{\n"+
        offset(3)+"if (variance[t] < min_variance)\n"+offset(3)+"{\n"+
        offset(4)+"min_variance = variance[t];\n"+offset(4)+"threshold = t;\n"+
        offset(3)+"}\n"+offset(2)+"}\n"+
        offset(2)+"std::cout << \"The minimum variance is: \" << min_variance <<"+
        "\" for variable \" << thresholdMap[threshold].varID << \" and threshold:"+
        " \" << thresholdMap[threshold].threshold << std::endl;\n"+
        offset(2)+"std::ofstream ofs(\"bestsplit.out\",std::ofstream::out);\n"+
        offset(2)+"ofs << std::fixed << min_variance << \"\\t\" << "+
        "thresholdMap[threshold].varID << \"\\t\" << "+
        "thresholdMap[threshold].threshold  << \"\\t\" << "+
        "thresholdMap[threshold].categorical  << \"\\t\" << "+
        "thresholdMap[threshold].aggregates[0]  << \"\\t\" << "+
        "thresholdMap[threshold].compAggregates[0] << \"\\t\" << "+
        "thresholdMap[threshold].aggregates[1]/thresholdMap[threshold].aggregates[0] << \"\\t\" << "+
        "thresholdMap[threshold].compAggregates[1]/thresholdMap[threshold].compAggregates[0] << std::endl;\n"+
        offset(2)+"ofs.close();\n";

    std::string functionIndex = contFunctionIndex;

    if (!categFunctionIndex.empty())
    {
        functionIndex += offset(2)+"size_t categIdx = "+
            std::to_string(numOfContThresholds)+";\n"+categFunctionIndex;
    }

    std::string thresholdStruct = offset(1)+"struct Threshold\n"+offset(1)+"{\n"+
        offset(2)+"size_t varID;\n"+offset(2)+"double threshold;\n"+
        offset(2)+"bool categorical;\n"+offset(2)+"double* aggregates;\n"+
        offset(2)+"double* compAggregates;\n"+offset(2)+
        "Threshold() : varID(0), threshold(0), categorical(false), "+
        "aggregates(nullptr), compAggregates(nullptr) {}\n"+
        offset(2)+"void set(size_t var, double t, bool c, double* agg, double *cagg)\n"+
        offset(2)+"{\n"+offset(3)+"varID = var;\n"+offset(3)+"threshold = t;\n"+
        offset(3)+"categorical = c;\n"+offset(3)+"aggregates = agg;\n"+
        offset(3)+"compAggregates = cagg;\n"+
        offset(2)+"}\n"+offset(1)+"};\n\n";
    
    return thresholdStruct+
        offset(1)+"size_t numberOfThresholds;\n"+
        offset(1)+"double* variance = nullptr;\n"+
        offset(1)+"Threshold* thresholdMap = nullptr;\n\n"+
        offset(1)+"void initCostArray()\n"+
        offset(1)+"{\n"+initVariance+
        // offset(2)+"thresholdMap = new std::string[numberOfThresholds];\n"+
        offset(2)+"thresholdMap = new Threshold[numberOfThresholds];\n"+
        functionIndex+offset(1)+"}\n\n"+
        offset(1)+"void computeCost()\n"+
        offset(1)+"{\n"+computeVariance+offset(1)+"}\n";    
}